

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# deconvolution_x86_fma.cpp
# Opt level: O3

int __thiscall
ncnn::Deconvolution_x86_fma::forward
          (Deconvolution_x86_fma *this,Mat *bottom_blob,Mat *top_blob,Option *opt)

{
  long *plVar1;
  undefined4 uVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  undefined4 uVar5;
  undefined4 uVar6;
  undefined1 auVar7 [32];
  int iVar14;
  int iVar15;
  uint uVar16;
  undefined4 uVar17;
  _func_int **pp_Var18;
  int *piVar19;
  size_t sVar20;
  size_t sVar21;
  size_t sVar22;
  size_t sVar23;
  Layer *pLVar24;
  _func_int **pp_Var25;
  _func_int **pp_Var26;
  _func_int *p_Var27;
  float fVar28;
  float fVar29;
  undefined1 auVar30 [32];
  undefined1 auVar31 [32];
  undefined1 auVar32 [32];
  undefined1 auVar33 [32];
  undefined1 auVar34 [32];
  undefined1 auVar35 [32];
  undefined1 auVar36 [32];
  undefined1 auVar37 [32];
  undefined1 auVar38 [32];
  undefined1 auVar39 [32];
  undefined1 auVar40 [32];
  undefined1 auVar41 [32];
  undefined1 auVar42 [16];
  undefined4 uVar43;
  undefined4 uVar44;
  Allocator AVar45;
  Allocator AVar46;
  Allocator AVar47;
  Allocator AVar48;
  Mat *pMVar49;
  uint uVar50;
  int iVar51;
  int iVar52;
  int iVar53;
  int iVar54;
  uint uVar55;
  int iVar56;
  int iVar57;
  Allocator *pAVar58;
  long lVar59;
  ulong uVar60;
  _func_int *p_Var61;
  uint uVar62;
  int iVar63;
  ulong uVar64;
  int y_1;
  int iVar65;
  int iVar66;
  int w_2;
  ulong uVar67;
  float *pfVar68;
  undefined1 (*pauVar69) [16];
  int iVar70;
  ulong uVar71;
  Allocator *pAVar72;
  void *pvVar73;
  void *pvVar74;
  int i;
  int iVar75;
  int iVar76;
  int iVar77;
  uint uVar78;
  long lVar79;
  ulong uVar80;
  int y_3;
  long lVar81;
  long lVar82;
  int y_6;
  int y_4;
  ulong uVar83;
  int iVar84;
  float *pfVar85;
  void *pvVar86;
  void *pvVar87;
  float fVar88;
  float fVar89;
  undefined1 auVar90 [16];
  undefined1 auVar91 [16];
  undefined1 auVar92 [16];
  undefined1 auVar93 [16];
  undefined1 auVar94 [16];
  undefined1 auVar95 [16];
  undefined1 auVar96 [16];
  undefined1 auVar97 [16];
  undefined1 auVar98 [16];
  undefined1 auVar99 [16];
  undefined1 auVar100 [16];
  undefined1 auVar101 [16];
  undefined1 auVar102 [16];
  undefined1 auVar103 [16];
  undefined1 auVar104 [16];
  undefined1 auVar105 [16];
  undefined1 auVar106 [16];
  undefined1 auVar107 [16];
  undefined1 auVar108 [16];
  undefined1 auVar109 [16];
  undefined1 auVar110 [16];
  undefined1 auVar111 [32];
  undefined1 auVar112 [32];
  undefined1 auVar113 [32];
  undefined1 auVar114 [32];
  undefined1 auVar115 [32];
  undefined1 auVar116 [32];
  undefined1 auVar117 [32];
  undefined1 auVar118 [32];
  undefined1 auVar119 [32];
  undefined1 auVar120 [32];
  undefined1 auVar121 [32];
  undefined1 auVar122 [32];
  undefined1 auVar123 [32];
  undefined1 auVar124 [32];
  undefined1 auVar125 [32];
  undefined1 auVar126 [32];
  undefined1 auVar127 [32];
  undefined1 auVar128 [32];
  undefined1 auVar129 [32];
  undefined1 auVar130 [32];
  undefined1 auVar131 [32];
  undefined1 auVar132 [32];
  undefined1 auVar133 [16];
  undefined1 auVar134 [16];
  undefined1 auVar135 [16];
  undefined1 auVar136 [16];
  undefined1 auVar137 [16];
  undefined1 auVar138 [16];
  undefined1 auVar139 [16];
  undefined1 auVar140 [16];
  undefined1 auVar141 [16];
  undefined1 auVar142 [16];
  undefined1 auVar143 [16];
  undefined1 auVar144 [16];
  undefined1 auVar145 [16];
  undefined1 auVar146 [16];
  undefined1 auVar147 [16];
  undefined1 auVar148 [16];
  undefined1 auVar149 [16];
  undefined1 auVar150 [16];
  undefined1 auVar151 [16];
  undefined1 auVar152 [16];
  undefined1 auVar153 [16];
  undefined1 auVar154 [16];
  undefined1 auVar155 [16];
  undefined1 auVar156 [16];
  undefined1 auVar157 [16];
  undefined1 auVar158 [32];
  undefined1 auVar159 [32];
  undefined1 auVar161 [32];
  undefined1 auVar162 [32];
  undefined1 auVar164 [32];
  undefined1 auVar165 [32];
  undefined1 auVar167 [32];
  undefined1 auVar168 [32];
  undefined1 auVar169 [32];
  undefined1 auVar170 [32];
  undefined1 auVar172 [32];
  undefined1 auVar173 [32];
  undefined1 auVar163 [32];
  float fVar176;
  undefined1 auVar174 [64];
  undefined1 auVar175 [64];
  undefined1 auVar177 [16];
  undefined1 auVar178 [16];
  undefined1 auVar179 [16];
  undefined1 auVar180 [16];
  undefined1 auVar181 [16];
  undefined1 auVar182 [16];
  undefined1 auVar183 [16];
  undefined1 auVar184 [16];
  undefined1 auVar185 [16];
  undefined1 auVar186 [16];
  undefined1 auVar187 [16];
  undefined1 auVar188 [16];
  undefined1 auVar189 [16];
  undefined1 auVar190 [16];
  undefined1 auVar191 [16];
  undefined1 auVar192 [16];
  undefined1 auVar193 [16];
  undefined1 auVar194 [16];
  undefined1 auVar195 [16];
  undefined1 auVar196 [16];
  undefined1 auVar197 [16];
  undefined1 auVar198 [16];
  undefined1 auVar199 [16];
  undefined1 auVar200 [16];
  undefined1 auVar201 [16];
  undefined1 auVar202 [16];
  undefined1 auVar203 [16];
  undefined1 auVar204 [16];
  undefined1 auVar205 [16];
  undefined1 auVar206 [16];
  undefined1 auVar207 [16];
  undefined1 auVar208 [16];
  undefined1 auVar209 [16];
  undefined1 auVar210 [16];
  undefined1 auVar211 [16];
  undefined1 auVar212 [16];
  undefined1 auVar213 [16];
  undefined1 auVar214 [16];
  undefined1 auVar215 [16];
  undefined1 auVar216 [28];
  undefined1 auVar217 [32];
  undefined1 auVar218 [32];
  undefined1 auVar219 [32];
  undefined1 auVar220 [32];
  undefined1 auVar221 [32];
  undefined1 auVar222 [32];
  undefined1 auVar223 [32];
  undefined1 auVar224 [32];
  undefined1 auVar225 [32];
  undefined1 auVar226 [32];
  undefined1 auVar227 [32];
  undefined1 auVar228 [32];
  undefined1 auVar229 [32];
  undefined1 auVar230 [32];
  undefined1 auVar231 [32];
  undefined1 auVar232 [32];
  undefined1 auVar233 [32];
  undefined1 auVar234 [32];
  undefined1 auVar235 [32];
  undefined1 auVar236 [32];
  undefined1 auVar237 [32];
  undefined1 auVar238 [32];
  undefined1 auVar239 [32];
  undefined1 auVar240 [32];
  undefined1 auVar241 [32];
  undefined1 auVar242 [32];
  undefined1 auVar243 [32];
  undefined1 auVar244 [32];
  undefined1 auVar246 [32];
  undefined1 auVar247 [32];
  undefined1 auVar248 [32];
  undefined1 auVar249 [32];
  float fVar250;
  float fVar251;
  undefined1 auVar252 [16];
  undefined1 auVar253 [16];
  undefined1 auVar254 [16];
  undefined1 auVar255 [16];
  undefined1 auVar257 [16];
  undefined1 auVar258 [32];
  undefined1 auVar259 [32];
  undefined1 auVar260 [32];
  undefined1 auVar261 [32];
  undefined1 auVar262 [32];
  undefined1 auVar263 [32];
  undefined1 auVar264 [32];
  undefined1 auVar265 [32];
  undefined1 auVar266 [32];
  undefined1 auVar267 [32];
  undefined1 auVar268 [32];
  undefined1 auVar269 [32];
  undefined1 auVar270 [32];
  undefined1 auVar271 [32];
  undefined1 auVar272 [32];
  undefined1 auVar273 [32];
  undefined1 auVar274 [32];
  undefined1 auVar275 [32];
  undefined1 auVar276 [32];
  undefined1 auVar277 [32];
  undefined1 auVar279 [32];
  undefined1 auVar280 [32];
  undefined1 auVar281 [32];
  undefined1 auVar282 [32];
  undefined1 auVar283 [32];
  undefined1 auVar284 [32];
  undefined1 auVar285 [32];
  undefined1 auVar256 [16];
  undefined1 auVar286 [32];
  undefined1 auVar287 [16];
  undefined1 auVar288 [16];
  undefined1 auVar289 [16];
  undefined1 auVar290 [16];
  undefined1 auVar291 [16];
  undefined1 auVar292 [16];
  undefined1 auVar293 [16];
  undefined1 auVar294 [16];
  undefined1 auVar295 [16];
  undefined1 auVar296 [16];
  undefined1 auVar297 [16];
  undefined1 auVar298 [16];
  undefined1 auVar299 [16];
  undefined1 auVar300 [16];
  undefined1 auVar301 [16];
  undefined1 auVar302 [16];
  undefined1 auVar303 [16];
  undefined1 auVar304 [16];
  undefined1 auVar305 [16];
  undefined1 auVar306 [16];
  undefined1 auVar307 [16];
  undefined1 auVar308 [16];
  undefined1 auVar309 [16];
  undefined1 auVar310 [16];
  undefined1 auVar311 [16];
  undefined1 auVar312 [16];
  undefined1 auVar313 [16];
  undefined1 auVar314 [16];
  undefined1 auVar315 [16];
  undefined1 auVar316 [16];
  undefined1 auVar317 [16];
  undefined1 auVar318 [16];
  undefined1 auVar319 [16];
  undefined1 auVar320 [16];
  undefined1 auVar321 [16];
  undefined1 auVar322 [16];
  undefined1 auVar323 [16];
  undefined1 auVar324 [16];
  undefined1 auVar325 [16];
  undefined1 auVar326 [16];
  undefined1 auVar327 [16];
  undefined1 auVar328 [16];
  undefined1 auVar329 [16];
  undefined1 auVar330 [16];
  undefined1 auVar331 [16];
  undefined1 auVar332 [16];
  undefined1 auVar333 [16];
  undefined1 auVar334 [16];
  undefined1 auVar335 [16];
  undefined1 auVar336 [16];
  undefined1 auVar337 [16];
  undefined1 auVar338 [16];
  undefined1 auVar339 [16];
  undefined1 auVar340 [16];
  undefined1 auVar341 [32];
  undefined1 auVar342 [32];
  undefined1 auVar343 [32];
  undefined1 auVar344 [32];
  undefined1 auVar345 [32];
  undefined1 auVar346 [32];
  undefined1 auVar347 [32];
  undefined1 auVar348 [16];
  undefined1 auVar349 [16];
  undefined1 auVar350 [16];
  undefined1 auVar351 [16];
  undefined1 auVar352 [16];
  undefined1 auVar353 [16];
  undefined1 auVar354 [16];
  undefined1 auVar355 [16];
  undefined1 auVar356 [32];
  undefined1 auVar357 [32];
  undefined1 auVar358 [32];
  undefined1 in_ZMM5 [64];
  __m128 one;
  undefined1 auVar359 [16];
  undefined1 auVar360 [16];
  undefined1 auVar361 [16];
  undefined1 auVar362 [32];
  undefined1 auVar363 [32];
  undefined1 auVar364 [64];
  undefined1 auVar365 [16];
  undefined1 auVar366 [16];
  undefined1 auVar367 [16];
  undefined1 auVar368 [16];
  undefined1 auVar369 [16];
  undefined1 auVar370 [32];
  undefined1 auVar371 [32];
  undefined1 auVar372 [32];
  undefined1 auVar373 [32];
  undefined1 auVar374 [16];
  undefined1 auVar375 [16];
  undefined1 auVar376 [16];
  undefined1 auVar377 [16];
  undefined1 auVar378 [16];
  undefined1 auVar379 [16];
  undefined1 auVar380 [16];
  undefined1 auVar381 [16];
  undefined1 auVar382 [16];
  undefined1 auVar383 [16];
  undefined1 auVar384 [16];
  undefined1 auVar385 [16];
  undefined1 auVar386 [16];
  undefined1 auVar387 [16];
  undefined1 auVar388 [16];
  undefined1 auVar389 [16];
  undefined1 auVar390 [16];
  undefined1 auVar391 [16];
  undefined1 auVar392 [16];
  undefined1 auVar393 [16];
  undefined1 auVar394 [16];
  undefined1 auVar395 [32];
  undefined1 auVar396 [32];
  undefined1 auVar397 [32];
  undefined1 auVar398 [32];
  undefined1 auVar399 [32];
  undefined1 auVar400 [32];
  undefined1 auVar401 [32];
  undefined1 auVar402 [32];
  undefined1 auVar403 [32];
  undefined1 auVar404 [32];
  undefined1 auVar405 [32];
  undefined1 auVar406 [32];
  undefined1 auVar407 [32];
  undefined1 auVar408 [32];
  undefined1 auVar409 [32];
  undefined1 auVar410 [32];
  undefined1 auVar411 [32];
  undefined1 auVar412 [32];
  undefined1 auVar413 [32];
  undefined1 auVar414 [32];
  undefined1 auVar415 [32];
  undefined1 auVar416 [64];
  undefined1 auVar417 [16];
  undefined1 auVar418 [16];
  undefined1 auVar419 [16];
  undefined1 auVar420 [16];
  undefined1 auVar421 [16];
  undefined1 auVar422 [16];
  undefined1 auVar423 [16];
  undefined1 auVar424 [32];
  undefined1 auVar425 [32];
  undefined1 auVar426 [64];
  undefined1 auVar427 [16];
  undefined1 auVar428 [16];
  undefined1 auVar429 [16];
  undefined1 auVar430 [16];
  undefined1 auVar431 [16];
  undefined1 auVar432 [16];
  undefined1 auVar433 [16];
  undefined1 auVar434 [16];
  undefined1 auVar435 [16];
  undefined1 auVar436 [16];
  undefined1 auVar437 [16];
  undefined1 auVar438 [16];
  undefined1 auVar439 [16];
  undefined1 auVar440 [16];
  undefined1 auVar441 [32];
  undefined1 auVar442 [32];
  undefined1 auVar443 [32];
  undefined1 auVar444 [32];
  undefined1 auVar445 [32];
  undefined1 auVar446 [32];
  undefined1 auVar447 [32];
  undefined1 auVar448 [32];
  undefined1 auVar449 [32];
  undefined1 auVar450 [32];
  undefined1 auVar451 [16];
  undefined1 auVar452 [16];
  undefined1 auVar453 [16];
  undefined1 auVar454 [16];
  undefined1 auVar455 [16];
  undefined1 auVar456 [16];
  undefined1 auVar457 [16];
  undefined1 auVar458 [16];
  undefined1 auVar459 [32];
  undefined1 auVar460 [32];
  undefined1 auVar461 [32];
  undefined1 auVar462 [32];
  undefined1 auVar463 [32];
  undefined1 auVar464 [32];
  undefined1 auVar465 [32];
  undefined1 auVar466 [32];
  undefined1 auVar467 [32];
  undefined1 auVar468 [32];
  undefined1 auVar469 [32];
  undefined1 auVar470 [32];
  undefined1 auVar471 [32];
  undefined1 auVar472 [16];
  undefined1 auVar473 [16];
  undefined1 auVar474 [16];
  undefined1 auVar475 [16];
  undefined1 auVar476 [16];
  undefined1 auVar477 [32];
  undefined1 auVar478 [32];
  undefined1 auVar479 [32];
  undefined1 auVar480 [16];
  undefined1 auVar482 [32];
  undefined1 auVar483 [32];
  undefined1 auVar484 [32];
  undefined1 auVar481 [16];
  undefined1 auVar485 [64];
  undefined1 auVar486 [16];
  undefined1 auVar487 [16];
  undefined1 auVar488 [32];
  undefined1 auVar489 [32];
  undefined1 auVar490 [32];
  undefined1 auVar491 [64];
  undefined1 auVar492 [64];
  undefined1 auVar493 [16];
  undefined1 auVar494 [16];
  undefined1 auVar495 [16];
  undefined1 auVar496 [16];
  undefined1 auVar497 [16];
  undefined1 auVar498 [16];
  undefined1 auVar499 [16];
  undefined1 auVar500 [16];
  undefined1 auVar501 [16];
  undefined1 auVar502 [16];
  undefined1 auVar503 [16];
  undefined1 auVar504 [16];
  float fVar518;
  undefined1 auVar505 [16];
  undefined1 auVar506 [16];
  undefined1 auVar507 [16];
  undefined1 auVar508 [32];
  undefined1 auVar509 [32];
  undefined1 auVar510 [32];
  undefined1 auVar511 [32];
  undefined1 auVar512 [32];
  undefined1 auVar513 [32];
  undefined1 auVar514 [32];
  undefined1 auVar515 [32];
  undefined1 auVar516 [32];
  undefined1 auVar517 [64];
  int outh_2;
  int h_2;
  int size;
  int h;
  int outh;
  int outw;
  Option opt_b;
  ulong local_278;
  Allocator *local_270;
  void *local_258;
  int local_250;
  long local_238;
  Allocator *local_230;
  ulong local_220;
  Mat local_1a8;
  _func_int **local_158;
  ulong local_150;
  ulong local_148;
  Option *local_140;
  long local_138;
  Mat *local_130;
  int local_124;
  Allocator *local_120;
  long *local_118;
  undefined4 uStack_110;
  int iStack_10c;
  long local_108;
  undefined4 uStack_100;
  long *local_f8;
  undefined4 uStack_f0;
  int iStack_ec;
  undefined1 auStack_e8 [12];
  undefined8 local_d8;
  void *local_c8;
  int *piStack_c0;
  size_t local_b8;
  int local_b0;
  Allocator *local_a8;
  undefined4 local_a0;
  int iStack_9c;
  undefined4 uStack_98;
  undefined4 uStack_94;
  int local_90;
  size_t local_88;
  undefined8 local_78;
  Allocator *pAStack_70;
  undefined1 auStack_68 [16];
  undefined8 local_58;
  undefined8 uStack_50;
  undefined8 uStack_48;
  undefined8 uStack_40;
  undefined8 uVar8;
  undefined4 uVar9;
  undefined1 uVar10;
  undefined1 uVar11;
  undefined1 uVar12;
  undefined1 uVar13;
  undefined1 auVar160 [32];
  undefined1 auVar166 [32];
  undefined1 auVar171 [32];
  undefined1 auVar245 [32];
  undefined1 auVar278 [32];
  
  auVar252 = in_ZMM5._0_16_;
  iVar14 = bottom_blob->w;
  iVar15 = bottom_blob->h;
  uVar64 = bottom_blob->elemsize;
  local_150 = (ulong)bottom_blob->elempack;
  p_Var61 = this->_vptr_Deconvolution_x86_fma[-3];
  uVar50 = *(uint *)(&this->field_0xd0 + (long)p_Var61);
  lVar79 = 1;
  if (opt->use_packing_layout == true) {
    lVar79 = 8;
    if ((uVar50 & 7) != 0) {
      lVar79 = (ulong)((uVar50 & 3) == 0) * 3 + 1;
    }
  }
  iVar66 = *(int *)(&this->field_0xd4 + (long)p_Var61);
  iVar63 = *(int *)(&this->field_0xdc + (long)p_Var61);
  iVar65 = *(int *)(&this->field_0xe4 + (long)p_Var61);
  iVar76 = (*(int *)(&this->field_0xd8 + (long)p_Var61) + -1) *
           *(int *)(&this->field_0xe0 + (long)p_Var61);
  iVar84 = *(int *)(&this->field_0xe8 + (long)p_Var61);
  iVar75 = *(int *)(&this->field_0xfc + (long)p_Var61);
  iVar77 = *(int *)(&this->field_0x100 + (long)p_Var61);
  uVar55 = (uint)lVar79;
  uVar50 = (int)uVar50 / (int)uVar55;
  local_1a8.cstep = 0;
  local_1a8.data = (Allocator *)0x0;
  local_1a8.refcount._0_4_ = 0;
  local_1a8.refcount._4_4_ = 0;
  local_1a8.elemsize = SUB168(ZEXT816(0) << 0x40,4);
  local_1a8.elempack = 0;
  local_1a8.h = 0;
  p_Var61 = this->_vptr_Deconvolution_x86_fma[-3];
  lVar82 = 0x10;
  local_1a8.allocator = (Allocator *)local_1a8.data;
  local_1a8.dims = (int)local_1a8.refcount;
  local_1a8.w = local_1a8.refcount._4_4_;
  local_1a8.d = (int)local_1a8.refcount;
  local_1a8.c = local_1a8.elempack;
  if (((((*(int *)(&this->field_0xec + (long)p_Var61) < 1) &&
        (*(int *)(&this->field_0xf0 + (long)p_Var61) < 1)) &&
       (*(int *)(&this->field_0xf4 + (long)p_Var61) < 1)) &&
      (*(int *)(&this->field_0xf8 + (long)p_Var61) < 1)) &&
     (((*(int *)(&this->field_0x104 + (long)p_Var61) < 1 ||
       (*(int *)(&this->field_0x108 + (long)p_Var61) < 1)) && (lVar82 = 8, &local_1a8 != top_blob)))
     ) {
    piVar19 = top_blob->refcount;
    if (piVar19 != (int *)0x0) {
      LOCK();
      *piVar19 = *piVar19 + 1;
      UNLOCK();
    }
    local_1a8.data = top_blob->data;
    local_1a8.refcount._0_4_ = (int)top_blob->refcount;
    local_1a8.refcount._4_4_ = (uint)((ulong)top_blob->refcount >> 0x20);
    local_1a8.elemsize = top_blob->elemsize;
    local_1a8.elempack = top_blob->elempack;
    local_1a8.allocator = top_blob->allocator;
    uVar3 = top_blob->dims;
    uVar4 = top_blob->w;
    uVar5 = top_blob->h;
    uVar6 = top_blob->d;
    local_1a8.c = top_blob->c;
    local_1a8.cstep = top_blob->cstep;
    local_1a8.dims = uVar3;
    local_1a8.w = uVar4;
    local_1a8.h = uVar5;
    local_1a8.d = uVar6;
  }
  iVar63 = (iVar66 + -1) * iVar63;
  local_148 = CONCAT44(local_148._4_4_,iVar63);
  iVar65 = (iVar14 + -1) * iVar65 + iVar63 + iVar75 + 1;
  uVar67 = (ulong)uVar50;
  local_140 = opt;
  local_130 = top_blob;
  Mat::create(&local_1a8,iVar65,iVar77 + (iVar15 + -1) * iVar84 + iVar76 + 1,uVar50,
              (uVar64 / local_150) * lVar79,uVar55,*(Allocator **)(&opt->lightmode + lVar82));
  iVar63 = local_1a8.h;
  iVar66 = local_1a8.w;
  pvVar87 = local_1a8.data;
  iVar84 = -100;
  if (((Allocator *)local_1a8.data == (Allocator *)0x0) ||
     (local_1a8.cstep * (long)local_1a8.c == 0)) goto LAB_0028520c;
  pp_Var18 = this->_vptr_Deconvolution_x86_fma;
  p_Var61 = pp_Var18[-3];
  uVar16 = *(uint *)(&this->field_0xd4 + (long)p_Var61);
  uVar62 = *(uint *)(&this->field_0xd8 + (long)p_Var61);
  iVar84 = uVar62 * uVar16;
  if (local_140->use_sgemm_convolution == true) {
    piVar19 = bottom_blob->refcount;
    local_c8 = bottom_blob->data;
    piStack_c0 = bottom_blob->refcount;
    local_b8 = bottom_blob->elemsize;
    local_b0 = bottom_blob->elempack;
    local_a8 = bottom_blob->allocator;
    iVar66 = bottom_blob->h;
    iVar63 = bottom_blob->w;
    uVar43 = bottom_blob->dims;
    uVar44 = bottom_blob->d;
    local_90 = bottom_blob->c;
    local_88 = bottom_blob->cstep;
    if (piVar19 != (int *)0x0) {
      LOCK();
      *piVar19 = *piVar19 + 1;
      UNLOCK();
      iVar63 = bottom_blob->w;
      iVar66 = bottom_blob->h;
    }
    _local_a0 = CONCAT44(iVar66 * iVar63,uVar43);
    _uStack_98 = CONCAT44(uVar44,1);
    local_d8 = 0;
    local_118 = (long *)0x0;
    uStack_110 = 0;
    iStack_10c = 0;
    local_108 = 0;
    uStack_100 = 0;
    auStack_e8 = SUB1612(ZEXT816(0),0);
    auVar7[0] = local_140->lightmode;
    auVar7._1_3_ = *(undefined3 *)&local_140->field_0x1;
    auVar7._4_4_ = local_140->num_threads;
    auVar7._8_8_ = local_140->blob_allocator;
    uVar8 = local_140->workspace_allocator;
    uVar9 = local_140->openmp_blocktime;
    uVar10 = local_140->use_winograd_convolution;
    uVar11 = local_140->use_sgemm_convolution;
    uVar12 = local_140->use_int8_inference;
    uVar13 = local_140->use_vulkan_compute;
    auVar7[0x1f] = uVar13;
    auVar7[0x1e] = uVar12;
    auVar7[0x1d] = uVar11;
    auVar7[0x1c] = uVar10;
    auVar7._24_4_ = uVar9;
    auVar7._16_8_ = uVar8;
    local_58._0_1_ = local_140->use_bf16_storage;
    local_58._1_1_ = local_140->use_fp16_packed;
    local_58._2_1_ = local_140->use_fp16_storage;
    local_58._3_1_ = local_140->use_fp16_arithmetic;
    local_58._4_1_ = local_140->use_int8_packed;
    local_58._5_1_ = local_140->use_int8_storage;
    local_58._6_1_ = local_140->use_int8_arithmetic;
    local_58._7_1_ = local_140->use_packing_layout;
    uStack_50._0_1_ = local_140->use_shader_pack8;
    uStack_50._1_1_ = local_140->use_subgroup_basic;
    uStack_50._2_1_ = local_140->use_subgroup_vote;
    uStack_50._3_1_ = local_140->use_subgroup_ballot;
    uStack_50._4_1_ = local_140->use_subgroup_shuffle;
    uStack_50._5_1_ = local_140->use_image_storage;
    uStack_50._6_1_ = local_140->use_tensor_storage;
    uStack_50._7_1_ = local_140->use_reserved_0;
    uStack_48._0_4_ = local_140->flush_denormals;
    uStack_48._4_1_ = local_140->use_local_pool_allocator;
    uStack_48._5_1_ = local_140->use_shader_local_memory;
    uStack_48._6_1_ = local_140->use_cooperative_matrix;
    uStack_48._7_1_ = local_140->use_winograd23_convolution;
    uStack_40._0_1_ = local_140->use_winograd43_convolution;
    uStack_40._1_1_ = local_140->use_winograd63_convolution;
    uStack_40._2_1_ = local_140->use_a53_a55_optimized_kernel;
    uStack_40._3_1_ = local_140->use_reserved_7;
    uStack_40._4_1_ = local_140->use_reserved_8;
    uStack_40._5_1_ = local_140->use_reserved_9;
    uStack_40._6_1_ = local_140->use_reserved_10;
    uStack_40._7_1_ = local_140->use_reserved_11;
    local_78 = auVar7._0_8_;
    pAStack_70 = local_1a8.allocator;
    auStack_68 = auVar7._16_16_;
    local_f8 = local_118;
    uStack_f0 = uStack_110;
    iStack_ec = iStack_10c;
    (*this->gemm->_vptr_Layer[7])();
    auVar488 = _DAT_00556460;
    auVar169 = _DAT_00556440;
    pp_Var18 = this->_vptr_Deconvolution_x86_fma;
    p_Var61 = pp_Var18[-3];
    iVar66 = (iVar65 * *(int *)(&this->field_0xe8 + (long)p_Var61) -
             *(int *)(&this->field_0xe4 + (long)p_Var61) * iVar14) * uVar55;
    if (uVar55 == 1) {
      if (0 < (int)uVar50) {
        lVar79 = (long)local_1a8.h * (long)local_1a8.w;
        uVar64 = 0;
        iVar63 = (int)((local_1a8.elemsize * lVar79 + 0xf & 0xfffffffffffffff0) / local_1a8.elemsize
                      );
        if (local_1a8.dims == 4) {
          iVar63 = (int)lVar79;
        }
        uVar55 = iVar63 * local_1a8.d;
        pp_Var18 = this->_vptr_Deconvolution_x86_fma;
        p_Var61 = pp_Var18[-3];
        auVar98._8_8_ = 0;
        auVar98._0_8_ = (ulong)uVar55 - 1;
        auVar427 = vpshufd_avx(auVar98,0x44);
        uVar83 = auVar427._0_8_;
        auVar306._0_8_ = uVar83 ^ 0x8000000000000000;
        auVar306._8_4_ = auVar427._8_4_;
        uVar50 = auVar427._12_4_;
        auVar306._12_4_ = uVar50 ^ 0x80000000;
        auVar252 = vpcmpeqd_avx(auVar252,auVar252);
        pAVar72 = (Allocator *)local_1a8.data;
        do {
          auVar427 = ZEXT816(0) << 0x40;
          if ((*(long *)(&this->field_0x1a8 + (long)p_Var61) != 0) &&
             ((long)*(int *)(&this->field_0x1e0 + (long)p_Var61) *
              *(long *)(&this->field_0x1e8 + (long)p_Var61) != 0)) {
            auVar427 = ZEXT416(*(uint *)(*(long *)(&this->field_0x1a8 + (long)p_Var61) + uVar64 * 4)
                              );
          }
          if (0 < (int)uVar55) {
            auVar427 = vshufps_avx(auVar427,auVar427,0);
            auVar363._16_16_ = auVar427;
            auVar363._0_16_ = auVar427;
            uVar71 = 0;
            do {
              auVar367._8_8_ = 0;
              auVar367._0_8_ = uVar71;
              auVar427 = vpshufd_avx(auVar367,0x44);
              auVar372._16_16_ = auVar427;
              auVar372._0_16_ = auVar427;
              auVar163 = vorps_avx(auVar372,auVar169);
              auVar165 = vorps_avx(auVar372,auVar488);
              auVar419._0_8_ = auVar165._16_8_ ^ 0x8000000000000000;
              auVar419._8_4_ = auVar165._24_4_;
              auVar419._12_4_ = auVar165._28_4_ ^ 0x80000000;
              auVar427 = vpcmpgtq_avx(auVar419,auVar306);
              auVar432._0_8_ = uVar83 ^ 0x8000000000000000;
              auVar432._8_4_ = auVar306._8_4_;
              auVar432._12_4_ = uVar50 ^ 0x80000000;
              auVar368._0_8_ = auVar165._0_8_ ^ 0x8000000000000000;
              auVar368._8_4_ = auVar165._8_4_;
              auVar368._12_4_ = auVar165._12_4_ ^ 0x80000000;
              auVar377 = vpcmpgtq_avx(auVar368,auVar432);
              auVar427 = vpackssdw_avx(auVar377,auVar427);
              auVar420._0_8_ = auVar163._16_8_ ^ 0x8000000000000000;
              auVar420._8_4_ = auVar163._24_4_;
              auVar420._12_4_ = auVar163._28_4_ ^ 0x80000000;
              auVar377 = vpcmpgtq_avx(auVar420,auVar306);
              auVar433._0_8_ = uVar83 ^ 0x8000000000000000;
              auVar433._8_4_ = auVar306._8_4_;
              auVar433._12_4_ = uVar50 ^ 0x80000000;
              auVar384._0_8_ = auVar163._0_8_ ^ 0x8000000000000000;
              auVar384._8_4_ = auVar163._8_4_;
              auVar384._12_4_ = auVar163._12_4_ ^ 0x80000000;
              auVar149 = vpcmpgtq_avx(auVar384,auVar433);
              auVar377 = vpackssdw_avx(auVar149,auVar377);
              auVar427 = vpackssdw_avx(auVar377 ^ auVar252,auVar427 ^ auVar252);
              auVar377 = vpmovsxwd_avx(auVar427);
              auVar427 = vpunpckhwd_avx(auVar427,auVar427);
              auVar373._16_16_ = auVar427;
              auVar373._0_16_ = auVar377;
              auVar163 = vmaskmovps_avx(auVar373,auVar363);
              *(undefined1 (*) [32])((long)&pAVar72->_vptr_Allocator + uVar71 * 4) = auVar163;
              uVar71 = uVar71 + 8;
            } while ((uVar55 + 7 & 0xfffffff8) != uVar71);
            p_Var61 = pp_Var18[-3];
          }
          if (0 < *(int *)(&this->field_0xd8 + (long)p_Var61)) {
            pfVar85 = (float *)(uVar64 * (long)iVar84 * iStack_ec * local_108 + (long)local_118);
            iVar63 = 0;
            do {
              if (0 < *(int *)(&this->field_0xd4 + (long)p_Var61)) {
                iVar65 = 0;
                do {
                  if (0 < iVar15) {
                    pfVar68 = (float *)((long)(_func_int ***)local_1a8.data +
                                       (long)iVar65 *
                                       (long)*(int *)(&this->field_0xdc + (long)p_Var61) * 4 +
                                       (long)iVar63 *
                                       (long)*(int *)(&this->field_0xe0 + (long)p_Var61) *
                                       local_1a8.elemsize * (long)local_1a8.w +
                                       local_1a8.cstep * local_1a8.elemsize * uVar64);
                    iVar75 = 0;
                    do {
                      iVar77 = iVar14;
                      if (0 < iVar14) {
                        do {
                          *pfVar68 = *pfVar68 + *pfVar85;
                          p_Var61 = pp_Var18[-3];
                          pfVar68 = pfVar68 + *(int *)(&this->field_0xe4 + (long)p_Var61);
                          pfVar85 = pfVar85 + 1;
                          iVar77 = iVar77 + -1;
                        } while (iVar77 != 0);
                      }
                      pfVar68 = pfVar68 + iVar66;
                      iVar75 = iVar75 + 1;
                    } while (iVar75 != iVar15);
                  }
                  iVar65 = iVar65 + 1;
                } while (iVar65 < *(int *)(&this->field_0xd4 + (long)p_Var61));
              }
              iVar63 = iVar63 + 1;
            } while (iVar63 < *(int *)(&this->field_0xd8 + (long)p_Var61));
          }
          uVar64 = uVar64 + 1;
          pAVar72 = (Allocator *)
                    ((long)&pAVar72->_vptr_Allocator + local_1a8.cstep * local_1a8.elemsize);
        } while (uVar64 != uVar67);
      }
    }
    else if (uVar55 == 4) {
      if (0 < (int)uVar50) {
        pp_Var18 = this->_vptr_Deconvolution_x86_fma;
        p_Var61 = pp_Var18[-3];
        uVar64 = 0;
        do {
          sVar20 = local_1a8.elemsize;
          pfVar85 = (float *)((long)iStack_ec * uVar64 * (long)iVar84 * local_108 + (long)local_118)
          ;
          lVar79 = (long)local_1a8.w;
          pAVar72 = (Allocator *)
                    ((long)(_func_int ***)local_1a8.data +
                    local_1a8.cstep * uVar64 * local_1a8.elemsize);
          uVar71 = local_1a8.h * lVar79;
          uVar83 = (local_1a8.elemsize * uVar71 + 0xf & 0xfffffffffffffff0) / local_1a8.elemsize;
          if (local_1a8.dims == 4) {
            uVar83 = uVar71;
          }
          if ((*(long *)(&this->field_0x1a8 + (long)p_Var61) == 0) ||
             ((long)*(int *)(&this->field_0x1e0 + (long)p_Var61) *
              *(long *)(&this->field_0x1e8 + (long)p_Var61) == 0)) {
            uVar50 = local_1a8.d * (int)uVar83;
            if (0 < (int)uVar50) {
              memset(pAVar72,0,(ulong)uVar50 << 4);
            }
          }
          else {
            iVar63 = local_1a8.d * (int)uVar83;
            if (0 < iVar63) {
              auVar252 = *(undefined1 (*) [16])
                          (*(long *)(&this->field_0x1a8 + (long)p_Var61) + uVar64 * 0x10);
              pAVar58 = pAVar72;
              do {
                *(undefined1 (*) [16])pAVar58 = auVar252;
                pAVar58 = pAVar58 + 2;
                iVar63 = iVar63 + -1;
              } while (iVar63 != 0);
            }
          }
          p_Var61 = pp_Var18[-3];
          if (0 < *(int *)(&this->field_0xd8 + (long)p_Var61)) {
            iVar63 = 0;
            do {
              if (0 < *(int *)(&this->field_0xd4 + (long)p_Var61)) {
                iVar65 = 0;
                do {
                  if (0 < iVar15) {
                    pauVar69 = (undefined1 (*) [16])
                               ((long)&pAVar72->_vptr_Allocator +
                               (long)(*(int *)(&this->field_0xdc + (long)p_Var61) * iVar65 * 4) * 4
                               + (long)iVar63 * (long)*(int *)(&this->field_0xe0 + (long)p_Var61) *
                                 sVar20 * lVar79);
                    iVar75 = 0;
                    do {
                      iVar77 = iVar14;
                      if (0 < iVar14) {
                        do {
                          auVar99._0_4_ = *pfVar85 + *(float *)*pauVar69;
                          auVar99._4_4_ = pfVar85[1] + *(float *)(*pauVar69 + 4);
                          auVar99._8_4_ = pfVar85[2] + *(float *)(*pauVar69 + 8);
                          auVar99._12_4_ = pfVar85[3] + *(float *)(*pauVar69 + 0xc);
                          *pauVar69 = auVar99;
                          p_Var61 = pp_Var18[-3];
                          pauVar69 = pauVar69 + *(int *)(&this->field_0xe4 + (long)p_Var61);
                          pfVar85 = pfVar85 + 4;
                          iVar77 = iVar77 + -1;
                        } while (iVar77 != 0);
                      }
                      pauVar69 = (undefined1 (*) [16])(*pauVar69 + (long)iVar66 * 4);
                      iVar75 = iVar75 + 1;
                    } while (iVar75 != iVar15);
                  }
                  iVar65 = iVar65 + 1;
                } while (iVar65 < *(int *)(&this->field_0xd4 + (long)p_Var61));
              }
              iVar63 = iVar63 + 1;
            } while (iVar63 < *(int *)(&this->field_0xd8 + (long)p_Var61));
          }
          uVar64 = uVar64 + 1;
        } while (uVar64 != uVar67);
      }
    }
    else if ((uVar55 == 8) && (0 < (int)uVar50)) {
      uVar64 = 0;
      do {
        sVar20 = local_1a8.elemsize;
        pfVar85 = (float *)((long)iStack_ec * uVar64 * (long)iVar84 * local_108 + (long)local_118);
        lVar79 = (long)local_1a8.w;
        pAVar72 = (Allocator *)
                  ((long)(_func_int ***)local_1a8.data +
                  local_1a8.cstep * uVar64 * local_1a8.elemsize);
        uVar71 = local_1a8.h * lVar79;
        uVar83 = (local_1a8.elemsize * uVar71 + 0xf & 0xfffffffffffffff0) / local_1a8.elemsize;
        if (local_1a8.dims == 4) {
          uVar83 = uVar71;
        }
        if ((*(long *)(&this->field_0x1a8 + (long)p_Var61) == 0) ||
           ((long)*(int *)(&this->field_0x1e0 + (long)p_Var61) *
            *(long *)(&this->field_0x1e8 + (long)p_Var61) == 0)) {
          uVar50 = local_1a8.d * (int)uVar83;
          if (0 < (int)uVar50) {
            memset(pAVar72,0,(ulong)uVar50 << 5);
          }
        }
        else {
          iVar63 = local_1a8.d * (int)uVar83;
          if (0 < iVar63) {
            plVar1 = (long *)(*(long *)(&this->field_0x1a8 + (long)p_Var61) + uVar64 * 0x20);
            AVar45._vptr_Allocator = (_func_int **)*plVar1;
            AVar46._vptr_Allocator = (_func_int **)plVar1[1];
            AVar47._vptr_Allocator = (_func_int **)plVar1[2];
            AVar48._vptr_Allocator = (_func_int **)plVar1[3];
            pAVar58 = pAVar72;
            do {
              pAVar58->_vptr_Allocator = AVar45._vptr_Allocator;
              pAVar58[1]._vptr_Allocator = AVar46._vptr_Allocator;
              pAVar58[2]._vptr_Allocator = AVar47._vptr_Allocator;
              pAVar58[3]._vptr_Allocator = AVar48._vptr_Allocator;
              pAVar58 = pAVar58 + 4;
              iVar63 = iVar63 + -1;
            } while (iVar63 != 0);
          }
        }
        p_Var61 = pp_Var18[-3];
        if (0 < *(int *)(&this->field_0xd8 + (long)p_Var61)) {
          iVar63 = 0;
          do {
            if (0 < *(int *)(&this->field_0xd4 + (long)p_Var61)) {
              iVar65 = 0;
              do {
                if (0 < iVar15) {
                  pfVar68 = (float *)((long)&pAVar72->_vptr_Allocator +
                                     (long)(*(int *)(&this->field_0xdc + (long)p_Var61) * iVar65 * 8
                                           ) * 4 +
                                     (long)*(int *)(&this->field_0xe0 + (long)p_Var61) *
                                     (long)iVar63 * sVar20 * lVar79);
                  iVar75 = 0;
                  do {
                    iVar77 = iVar14;
                    if (0 < iVar14) {
                      do {
                        fVar89 = pfVar85[1];
                        fVar88 = pfVar85[2];
                        fVar518 = pfVar85[3];
                        fVar250 = pfVar85[4];
                        fVar251 = pfVar85[5];
                        fVar28 = pfVar85[6];
                        fVar176 = pfVar85[7];
                        *pfVar68 = *pfVar85 + *pfVar68;
                        pfVar68[1] = fVar89 + pfVar68[1];
                        pfVar68[2] = fVar88 + pfVar68[2];
                        pfVar68[3] = fVar518 + pfVar68[3];
                        pfVar68[4] = fVar250 + pfVar68[4];
                        pfVar68[5] = fVar251 + pfVar68[5];
                        pfVar68[6] = fVar28 + pfVar68[6];
                        pfVar68[7] = fVar176 + pfVar68[7];
                        p_Var61 = pp_Var18[-3];
                        pfVar68 = pfVar68 + (long)*(int *)(&this->field_0xe4 + (long)p_Var61) * 8;
                        pfVar85 = pfVar85 + 8;
                        iVar77 = iVar77 + -1;
                      } while (iVar77 != 0);
                    }
                    pfVar68 = pfVar68 + iVar66;
                    iVar75 = iVar75 + 1;
                  } while (iVar75 != iVar15);
                }
                iVar65 = iVar65 + 1;
              } while (iVar65 < *(int *)(&this->field_0xd4 + (long)p_Var61));
            }
            iVar63 = iVar63 + 1;
          } while (iVar63 < *(int *)(&this->field_0xd8 + (long)p_Var61));
        }
        uVar64 = uVar64 + 1;
      } while (uVar64 != uVar67);
    }
    pLVar24 = this->activation;
    if (pLVar24 != (Layer *)0x0) {
      (*pLVar24->_vptr_Layer[9])(pLVar24,&local_1a8,local_140);
    }
    piVar19 = (int *)CONCAT44(iStack_10c,uStack_110);
    if (piVar19 != (int *)0x0) {
      LOCK();
      *piVar19 = *piVar19 + -1;
      UNLOCK();
      if (*piVar19 == 0) {
        if (local_f8 == (long *)0x0) {
          if (local_118 != (long *)0x0) {
            free(local_118);
          }
        }
        else {
          (**(code **)(*local_f8 + 0x18))();
        }
      }
    }
    if (piStack_c0 != (int *)0x0) {
      LOCK();
      *piStack_c0 = *piStack_c0 + -1;
      UNLOCK();
      if (*piStack_c0 == 0) {
        if (local_a8 == (Allocator *)0x0) {
          if (local_c8 != (void *)0x0) {
            free(local_c8);
          }
        }
        else {
          (*local_a8->_vptr_Allocator[3])();
        }
      }
    }
  }
  else {
    local_158 = pp_Var18;
    local_124 = iVar84;
    if (((uint)local_150 == 8) && (uVar55 == 8)) {
      if (local_1a8.c < 1) goto LAB_002851c2;
      iVar14 = *(int *)(&this->field_0xdc + (long)p_Var61);
      iVar15 = *(int *)(&this->field_0xe0 + (long)p_Var61);
      iVar65 = *(int *)(&this->field_0xe4 + (long)p_Var61);
      iVar84 = *(int *)(&this->field_0xe8 + (long)p_Var61);
      uVar17 = *(undefined4 *)(&this->field_0x114 + (long)p_Var61);
      lVar79 = *(long *)(&this->field_0x1a8 + (long)p_Var61);
      local_278 = 0;
      auVar416 = ZEXT1664(ZEXT816(0) << 0x40);
      auVar426 = ZEXT3264(CONCAT428(0x3f000000,
                                    CONCAT424(0x3f000000,
                                              CONCAT420(0x3f000000,
                                                        CONCAT416(0x3f000000,
                                                                  CONCAT412(0x3f000000,
                                                                            CONCAT48(0x3f000000,
                                                                                                                                                                          
                                                  0x3f0000003f000000)))))));
      auVar364 = ZEXT3264(CONCAT428(0x3f800000,
                                    CONCAT424(0x3f800000,
                                              CONCAT420(0x3f800000,
                                                        CONCAT416(0x3f800000,
                                                                  CONCAT412(0x3f800000,
                                                                            CONCAT48(0x3f800000,
                                                                                                                                                                          
                                                  0x3f8000003f800000)))))));
      auVar488._8_4_ = 0x3d2aa9c1;
      auVar488._0_8_ = 0x3d2aa9c13d2aa9c1;
      auVar488._12_4_ = 0x3d2aa9c1;
      auVar488._16_4_ = 0x3d2aa9c1;
      auVar488._20_4_ = 0x3d2aa9c1;
      auVar488._24_4_ = 0x3d2aa9c1;
      auVar488._28_4_ = 0x3d2aa9c1;
      auVar169._8_4_ = 0xbf800000;
      auVar169._0_8_ = 0xbf800000bf800000;
      auVar169._12_4_ = 0xbf800000;
      auVar169._16_4_ = 0xbf800000;
      auVar169._20_4_ = 0xbf800000;
      auVar169._24_4_ = 0xbf800000;
      auVar169._28_4_ = 0xbf800000;
      do {
        if (0 < local_1a8.h) {
          iVar75 = bottom_blob->w;
          iVar77 = bottom_blob->h;
          pAVar72 = (Allocator *)
                    ((long)(_func_int ***)local_1a8.data +
                    local_1a8.cstep * local_278 * local_1a8.elemsize);
          uVar50 = bottom_blob->c;
          iVar70 = 0;
          do {
            if (0 < local_1a8.w) {
              uVar78 = 0;
              iVar53 = (1 - uVar16) * iVar14;
              do {
                if (lVar79 == 0) {
                  auVar174 = ZEXT1664(ZEXT816(0) << 0x40);
                }
                else {
                  auVar174 = ZEXT3264(*(undefined1 (*) [32])(lVar79 + local_278 * 0x20));
                }
                if (0 < (int)uVar50) {
                  pvVar86 = (void *)((this->weight_data_tm).cstep * local_278 *
                                     (this->weight_data_tm).elemsize +
                                    (long)(this->weight_data_tm).data);
                  pvVar74 = bottom_blob->data;
                  uVar64 = 0;
                  do {
                    if (0 < (int)uVar62) {
                      uVar83 = 0;
                      uVar67 = 0;
                      do {
                        iVar51 = (((int)uVar67 - uVar62) + 1) * iVar15 + iVar70;
                        if ((((-1 < iVar51) && (iVar52 = iVar51 / iVar84, iVar51 % iVar84 == 0)) &&
                            (0 < (int)uVar16)) && (iVar52 < iVar77)) {
                          lVar82 = (long)iVar52 * (long)bottom_blob->w * bottom_blob->elemsize +
                                   bottom_blob->cstep * bottom_blob->elemsize * uVar64;
                          uVar71 = uVar83;
                          uVar80 = (ulong)uVar16;
                          iVar51 = iVar53;
                          do {
                            if (((-1 < iVar51) && (iVar52 = iVar51 / iVar65, iVar51 % iVar65 == 0))
                               && (iVar52 < iVar75)) {
                              lVar59 = (long)(iVar52 << 3);
                              uVar2 = *(undefined4 *)((long)pvVar74 + lVar59 * 4 + lVar82);
                              auVar163._4_4_ = uVar2;
                              auVar163._0_4_ = uVar2;
                              auVar163._8_4_ = uVar2;
                              auVar163._12_4_ = uVar2;
                              auVar163._16_4_ = uVar2;
                              auVar163._20_4_ = uVar2;
                              auVar163._24_4_ = uVar2;
                              auVar163._28_4_ = uVar2;
                              uVar2 = *(undefined4 *)((long)pvVar74 + lVar59 * 4 + lVar82 + 4);
                              auVar165._4_4_ = uVar2;
                              auVar165._0_4_ = uVar2;
                              auVar165._8_4_ = uVar2;
                              auVar165._12_4_ = uVar2;
                              auVar165._16_4_ = uVar2;
                              auVar165._20_4_ = uVar2;
                              auVar165._24_4_ = uVar2;
                              auVar165._28_4_ = uVar2;
                              uVar2 = *(undefined4 *)((long)pvVar74 + lVar59 * 4 + lVar82 + 8);
                              auVar159._4_4_ = uVar2;
                              auVar159._0_4_ = uVar2;
                              auVar159._8_4_ = uVar2;
                              auVar159._12_4_ = uVar2;
                              auVar159._16_4_ = uVar2;
                              auVar159._20_4_ = uVar2;
                              auVar159._24_4_ = uVar2;
                              auVar159._28_4_ = uVar2;
                              uVar2 = *(undefined4 *)((long)pvVar74 + lVar59 * 4 + lVar82 + 0xc);
                              auVar241._4_4_ = uVar2;
                              auVar241._0_4_ = uVar2;
                              auVar241._8_4_ = uVar2;
                              auVar241._12_4_ = uVar2;
                              auVar241._16_4_ = uVar2;
                              auVar241._20_4_ = uVar2;
                              auVar241._24_4_ = uVar2;
                              auVar241._28_4_ = uVar2;
                              uVar2 = *(undefined4 *)((long)pvVar74 + lVar59 * 4 + lVar82 + 0x10);
                              auVar230._4_4_ = uVar2;
                              auVar230._0_4_ = uVar2;
                              auVar230._8_4_ = uVar2;
                              auVar230._12_4_ = uVar2;
                              auVar230._16_4_ = uVar2;
                              auVar230._20_4_ = uVar2;
                              auVar230._24_4_ = uVar2;
                              auVar230._28_4_ = uVar2;
                              uVar2 = *(undefined4 *)((long)pvVar74 + lVar59 * 4 + lVar82 + 0x14);
                              auVar508._4_4_ = uVar2;
                              auVar508._0_4_ = uVar2;
                              auVar508._8_4_ = uVar2;
                              auVar508._12_4_ = uVar2;
                              auVar508._16_4_ = uVar2;
                              auVar508._20_4_ = uVar2;
                              auVar508._24_4_ = uVar2;
                              auVar508._28_4_ = uVar2;
                              uVar2 = *(undefined4 *)((long)pvVar74 + lVar59 * 4 + lVar82 + 0x18);
                              auVar477._4_4_ = uVar2;
                              auVar477._0_4_ = uVar2;
                              auVar477._8_4_ = uVar2;
                              auVar477._12_4_ = uVar2;
                              auVar477._16_4_ = uVar2;
                              auVar477._20_4_ = uVar2;
                              auVar477._24_4_ = uVar2;
                              auVar477._28_4_ = uVar2;
                              uVar2 = *(undefined4 *)((long)pvVar74 + lVar59 * 4 + lVar82 + 0x1c);
                              auVar482._4_4_ = uVar2;
                              auVar482._0_4_ = uVar2;
                              auVar482._8_4_ = uVar2;
                              auVar482._12_4_ = uVar2;
                              auVar482._16_4_ = uVar2;
                              auVar482._20_4_ = uVar2;
                              auVar482._24_4_ = uVar2;
                              auVar482._28_4_ = uVar2;
                              uVar60 = uVar71 & 0xffffffff;
                              auVar252 = vfmadd231ps_fma(auVar174._0_32_,auVar163,
                                                         *(undefined1 (*) [32])
                                                          ((long)pvVar86 + uVar60 * 4));
                              auVar252 = vfmadd231ps_fma(ZEXT1632(auVar252),auVar165,
                                                         *(undefined1 (*) [32])
                                                          ((long)pvVar86 + uVar60 * 4 + 0x20));
                              auVar252 = vfmadd231ps_fma(ZEXT1632(auVar252),auVar159,
                                                         *(undefined1 (*) [32])
                                                          ((long)pvVar86 + uVar60 * 4 + 0x40));
                              auVar252 = vfmadd231ps_fma(ZEXT1632(auVar252),auVar241,
                                                         *(undefined1 (*) [32])
                                                          ((long)pvVar86 + uVar60 * 4 + 0x60));
                              auVar252 = vfmadd231ps_fma(ZEXT1632(auVar252),auVar230,
                                                         *(undefined1 (*) [32])
                                                          ((long)pvVar86 + uVar60 * 4 + 0x80));
                              auVar252 = vfmadd231ps_fma(ZEXT1632(auVar252),auVar508,
                                                         *(undefined1 (*) [32])
                                                          ((long)pvVar86 + uVar60 * 4 + 0xa0));
                              auVar252 = vfmadd231ps_fma(ZEXT1632(auVar252),auVar477,
                                                         *(undefined1 (*) [32])
                                                          ((long)pvVar86 + uVar60 * 4 + 0xc0));
                              auVar252 = vfmadd231ps_fma(ZEXT1632(auVar252),auVar482,
                                                         *(undefined1 (*) [32])
                                                          ((long)pvVar86 + uVar60 * 4 + 0xe0));
                              auVar174 = ZEXT1664(auVar252);
                            }
                            uVar71 = uVar71 + 0x40;
                            iVar51 = iVar51 + iVar14;
                            uVar80 = uVar80 - 1;
                          } while (uVar80 != 0);
                        }
                        uVar67 = uVar67 + 1;
                        uVar83 = uVar83 + (ulong)uVar16 * 0x40;
                      } while (uVar67 != uVar62);
                    }
                    pvVar86 = (void *)((long)pvVar86 + (long)(int)(uVar16 * uVar62 * 0x40) * 4);
                    uVar64 = uVar64 + 1;
                  } while (uVar64 != uVar50);
                }
                auVar163 = auVar174._0_32_;
                auVar159 = auVar416._0_32_;
                auVar165 = auVar364._0_32_;
                auVar241 = auVar426._0_32_;
                fVar89 = auVar364._0_4_;
                fVar88 = auVar364._4_4_;
                fVar518 = auVar364._8_4_;
                fVar250 = auVar364._12_4_;
                fVar251 = auVar364._16_4_;
                fVar28 = auVar364._20_4_;
                fVar176 = auVar364._24_4_;
                fVar29 = auVar364._28_4_;
                auVar491._28_36_ = auVar174._28_36_;
                switch(uVar17) {
                case 1:
                  auVar163 = vmaxps_avx(auVar159,auVar163);
                  break;
                case 2:
                  auVar165 = vmaxps_avx(auVar159,auVar163);
                  auVar163 = vminps_avx(auVar159,auVar163);
                  uVar2 = **(undefined4 **)(&this->field_0x118 + (long)p_Var61);
                  auVar162._4_4_ = uVar2;
                  auVar162._0_4_ = uVar2;
                  auVar162._8_4_ = uVar2;
                  auVar162._12_4_ = uVar2;
                  auVar162._16_4_ = uVar2;
                  auVar162._20_4_ = uVar2;
                  auVar162._24_4_ = uVar2;
                  auVar162._28_4_ = uVar2;
                  auVar252 = vfmadd213ps_fma(auVar162,auVar163,auVar165);
                  auVar163 = ZEXT1632(auVar252);
                  break;
                case 3:
                  uVar2 = **(undefined4 **)(&this->field_0x118 + (long)p_Var61);
                  auVar223._4_4_ = uVar2;
                  auVar223._0_4_ = uVar2;
                  auVar223._8_4_ = uVar2;
                  auVar223._12_4_ = uVar2;
                  auVar223._16_4_ = uVar2;
                  auVar223._20_4_ = uVar2;
                  auVar223._24_4_ = uVar2;
                  auVar223._28_4_ = uVar2;
                  uVar2 = (*(undefined4 **)(&this->field_0x118 + (long)p_Var61))[1];
                  auVar511._4_4_ = uVar2;
                  auVar511._0_4_ = uVar2;
                  auVar511._8_4_ = uVar2;
                  auVar511._12_4_ = uVar2;
                  auVar511._16_4_ = uVar2;
                  auVar511._20_4_ = uVar2;
                  auVar511._24_4_ = uVar2;
                  auVar511._28_4_ = uVar2;
                  auVar163 = vmaxps_avx(auVar163,auVar223);
                  auVar163 = vminps_avx(auVar511,auVar163);
                  break;
                case 4:
                  auVar158._0_8_ = auVar174._0_8_ ^ 0x8000000080000000;
                  auVar158._8_4_ = -auVar174._8_4_;
                  auVar158._12_4_ = -auVar174._12_4_;
                  auVar158._16_4_ = -auVar174._16_4_;
                  auVar158._20_4_ = -auVar174._20_4_;
                  auVar158._24_4_ = -auVar174._24_4_;
                  auVar158._28_4_ = auVar174._28_4_ ^ 0x80000000;
                  auVar224._8_4_ = 0x42b0c0a5;
                  auVar224._0_8_ = 0x42b0c0a542b0c0a5;
                  auVar224._12_4_ = 0x42b0c0a5;
                  auVar224._16_4_ = 0x42b0c0a5;
                  auVar224._20_4_ = 0x42b0c0a5;
                  auVar224._24_4_ = 0x42b0c0a5;
                  auVar224._28_4_ = 0x42b0c0a5;
                  auVar163 = vminps_avx(auVar158,auVar224);
                  auVar225._8_4_ = 0xc2b0c0a5;
                  auVar225._0_8_ = 0xc2b0c0a5c2b0c0a5;
                  auVar225._12_4_ = 0xc2b0c0a5;
                  auVar225._16_4_ = 0xc2b0c0a5;
                  auVar225._20_4_ = 0xc2b0c0a5;
                  auVar225._24_4_ = 0xc2b0c0a5;
                  auVar225._28_4_ = 0xc2b0c0a5;
                  auVar159 = vmaxps_avx(auVar163,auVar225);
                  auVar226._8_4_ = 0x3fb8aa3b;
                  auVar226._0_8_ = 0x3fb8aa3b3fb8aa3b;
                  auVar226._12_4_ = 0x3fb8aa3b;
                  auVar226._16_4_ = 0x3fb8aa3b;
                  auVar226._20_4_ = 0x3fb8aa3b;
                  auVar226._24_4_ = 0x3fb8aa3b;
                  auVar226._28_4_ = 0x3fb8aa3b;
                  auVar252 = vfmadd213ps_fma(auVar226,auVar159,auVar241);
                  auVar230 = vroundps_avx(ZEXT1632(auVar252),1);
                  auVar163 = vcmpps_avx(ZEXT1632(auVar252),auVar230,1);
                  auVar163 = vandps_avx(auVar163,auVar165);
                  auVar163 = vsubps_avx(auVar230,auVar163);
                  auVar111._8_4_ = 0x3f318000;
                  auVar111._0_8_ = 0x3f3180003f318000;
                  auVar111._12_4_ = 0x3f318000;
                  auVar111._16_4_ = 0x3f318000;
                  auVar111._20_4_ = 0x3f318000;
                  auVar111._24_4_ = 0x3f318000;
                  auVar111._28_4_ = 0x3f318000;
                  auVar252 = vfmsub231ps_fma(auVar159,auVar163,auVar111);
                  auVar266._8_4_ = 0x395e8083;
                  auVar266._0_8_ = 0x395e8083395e8083;
                  auVar266._12_4_ = 0x395e8083;
                  auVar266._16_4_ = 0x395e8083;
                  auVar266._20_4_ = 0x395e8083;
                  auVar266._24_4_ = 0x395e8083;
                  auVar266._28_4_ = 0x395e8083;
                  auVar427 = vfmsub231ps_fma(ZEXT1632(auVar252),auVar163,auVar266);
                  auVar159 = ZEXT1632(auVar427);
                  auVar33._28_4_ = auVar230._28_4_;
                  auVar33._0_28_ =
                       ZEXT1628(CONCAT412(auVar427._12_4_ * auVar427._12_4_,
                                          CONCAT48(auVar427._8_4_ * auVar427._8_4_,
                                                   CONCAT44(auVar427._4_4_ * auVar427._4_4_,
                                                            auVar427._0_4_ * auVar427._0_4_))));
                  auVar445._8_4_ = 0x39506967;
                  auVar445._0_8_ = 0x3950696739506967;
                  auVar445._12_4_ = 0x39506967;
                  auVar445._16_4_ = 0x39506967;
                  auVar445._20_4_ = 0x39506967;
                  auVar445._24_4_ = 0x39506967;
                  auVar445._28_4_ = 0x39506967;
                  auVar267._8_4_ = 0x3ab743ce;
                  auVar267._0_8_ = 0x3ab743ce3ab743ce;
                  auVar267._12_4_ = 0x3ab743ce;
                  auVar267._16_4_ = 0x3ab743ce;
                  auVar267._20_4_ = 0x3ab743ce;
                  auVar267._24_4_ = 0x3ab743ce;
                  auVar267._28_4_ = 0x3ab743ce;
                  auVar252 = vfmadd213ps_fma(auVar445,auVar159,auVar267);
                  auVar112._8_4_ = 0x3c088908;
                  auVar112._0_8_ = 0x3c0889083c088908;
                  auVar112._12_4_ = 0x3c088908;
                  auVar112._16_4_ = 0x3c088908;
                  auVar112._20_4_ = 0x3c088908;
                  auVar112._24_4_ = 0x3c088908;
                  auVar112._28_4_ = 0x3c088908;
                  auVar252 = vfmadd213ps_fma(ZEXT1632(auVar252),auVar159,auVar112);
                  auVar113._8_4_ = 0x3d2aa9c1;
                  auVar113._0_8_ = 0x3d2aa9c13d2aa9c1;
                  auVar113._12_4_ = 0x3d2aa9c1;
                  auVar113._16_4_ = 0x3d2aa9c1;
                  auVar113._20_4_ = 0x3d2aa9c1;
                  auVar113._24_4_ = 0x3d2aa9c1;
                  auVar113._28_4_ = 0x3d2aa9c1;
                  auVar252 = vfmadd213ps_fma(ZEXT1632(auVar252),auVar159,auVar113);
                  auVar114._8_4_ = 0x3e2aaaaa;
                  auVar114._0_8_ = 0x3e2aaaaa3e2aaaaa;
                  auVar114._12_4_ = 0x3e2aaaaa;
                  auVar114._16_4_ = 0x3e2aaaaa;
                  auVar114._20_4_ = 0x3e2aaaaa;
                  auVar114._24_4_ = 0x3e2aaaaa;
                  auVar114._28_4_ = 0x3e2aaaaa;
                  auVar159 = ZEXT1632(auVar427);
                  auVar252 = vfmadd213ps_fma(ZEXT1632(auVar252),auVar159,auVar114);
                  auVar252 = vfmadd213ps_fma(ZEXT1632(auVar252),auVar159,auVar241);
                  auVar377 = vfmadd213ps_fma(ZEXT1632(auVar252),auVar33,auVar159);
                  auVar133._0_4_ = (int)auVar163._0_4_;
                  auVar133._4_4_ = (int)auVar163._4_4_;
                  auVar133._8_4_ = (int)auVar163._8_4_;
                  auVar133._12_4_ = (int)auVar163._12_4_;
                  auVar160._16_4_ = (int)auVar163._16_4_;
                  auVar160._0_16_ = auVar133;
                  auVar160._20_4_ = (int)auVar163._20_4_;
                  auVar160._24_4_ = (int)auVar163._24_4_;
                  auVar160._28_4_ = (int)auVar163._28_4_;
                  auVar427 = vpslld_avx(auVar133,0x17);
                  auVar252 = vpslld_avx(auVar160._16_16_,0x17);
                  auVar90._8_4_ = 0x3f800000;
                  auVar90._0_8_ = 0x3f8000003f800000;
                  auVar90._12_4_ = 0x3f800000;
                  auVar252 = vpaddd_avx(auVar252,auVar90);
                  auVar427 = vpaddd_avx(auVar427,auVar90);
                  auVar161._16_16_ = auVar252;
                  auVar161._0_16_ = auVar427;
                  auVar227._0_4_ = auVar377._0_4_ + fVar89;
                  auVar227._4_4_ = auVar377._4_4_ + fVar88;
                  auVar227._8_4_ = auVar377._8_4_ + fVar518;
                  auVar227._12_4_ = auVar377._12_4_ + fVar250;
                  auVar227._16_4_ = fVar251 + 0.0;
                  auVar227._20_4_ = fVar28 + 0.0;
                  auVar227._24_4_ = fVar176 + 0.0;
                  auVar227._28_4_ = fVar29 + 0.0;
                  auVar252 = vfmadd213ps_fma(auVar161,auVar227,auVar165);
                  auVar163 = vrcpps_avx(ZEXT1632(auVar252));
                  auVar252 = vfmsub213ps_fma(ZEXT1632(auVar252),auVar163,auVar165);
                  auVar252 = vfnmadd132ps_fma(ZEXT1632(auVar252),auVar163,auVar163);
                  auVar163 = ZEXT1632(auVar252);
                  break;
                case 5:
                  auVar478._8_4_ = 0x42b0c0a5;
                  auVar478._0_8_ = 0x42b0c0a542b0c0a5;
                  auVar478._12_4_ = 0x42b0c0a5;
                  auVar478._16_4_ = 0x42b0c0a5;
                  auVar478._20_4_ = 0x42b0c0a5;
                  auVar478._24_4_ = 0x42b0c0a5;
                  auVar478._28_4_ = 0x42b0c0a5;
                  auVar163 = vminps_avx(auVar478,auVar163);
                  auVar483._8_4_ = 0xc2b0c0a5;
                  auVar483._0_8_ = 0xc2b0c0a5c2b0c0a5;
                  auVar483._12_4_ = 0xc2b0c0a5;
                  auVar483._16_4_ = 0xc2b0c0a5;
                  auVar483._20_4_ = 0xc2b0c0a5;
                  auVar483._24_4_ = 0xc2b0c0a5;
                  auVar483._28_4_ = 0xc2b0c0a5;
                  auVar159 = vmaxps_avx(auVar483,auVar163);
                  auVar441._8_4_ = 0x3fb8aa3b;
                  auVar441._0_8_ = 0x3fb8aa3b3fb8aa3b;
                  auVar441._12_4_ = 0x3fb8aa3b;
                  auVar441._16_4_ = 0x3fb8aa3b;
                  auVar441._20_4_ = 0x3fb8aa3b;
                  auVar441._24_4_ = 0x3fb8aa3b;
                  auVar441._28_4_ = 0x3fb8aa3b;
                  auVar252 = vfmadd213ps_fma(auVar441,auVar159,auVar241);
                  auVar230 = vroundps_avx(ZEXT1632(auVar252),1);
                  auVar163 = vcmpps_avx(ZEXT1632(auVar252),auVar230,1);
                  auVar163 = vandps_avx(auVar163,auVar165);
                  auVar163 = vsubps_avx(auVar230,auVar163);
                  auVar395._8_4_ = 0x3f318000;
                  auVar395._0_8_ = 0x3f3180003f318000;
                  auVar395._12_4_ = 0x3f318000;
                  auVar395._16_4_ = 0x3f318000;
                  auVar395._20_4_ = 0x3f318000;
                  auVar395._24_4_ = 0x3f318000;
                  auVar395._28_4_ = 0x3f318000;
                  auVar252 = vfmsub231ps_fma(auVar159,auVar163,auVar395);
                  auVar479._8_4_ = 0xb95e8083;
                  auVar479._0_8_ = 0xb95e8083b95e8083;
                  auVar479._12_4_ = 0xb95e8083;
                  auVar479._16_4_ = 0xb95e8083;
                  auVar479._20_4_ = 0xb95e8083;
                  auVar479._24_4_ = 0xb95e8083;
                  auVar479._28_4_ = 0xb95e8083;
                  auVar427 = vfnmsub231ps_fma(ZEXT1632(auVar252),auVar163,auVar479);
                  auVar159 = ZEXT1632(auVar427);
                  auVar30._28_4_ = auVar230._28_4_;
                  auVar30._0_28_ =
                       ZEXT1628(CONCAT412(auVar427._12_4_ * auVar427._12_4_,
                                          CONCAT48(auVar427._8_4_ * auVar427._8_4_,
                                                   CONCAT44(auVar427._4_4_ * auVar427._4_4_,
                                                            auVar427._0_4_ * auVar427._0_4_))));
                  auVar258._8_4_ = 0x39506967;
                  auVar258._0_8_ = 0x3950696739506967;
                  auVar258._12_4_ = 0x39506967;
                  auVar258._16_4_ = 0x39506967;
                  auVar258._20_4_ = 0x39506967;
                  auVar258._24_4_ = 0x39506967;
                  auVar258._28_4_ = 0x39506967;
                  auVar424._8_4_ = 0x3ab743ce;
                  auVar424._0_8_ = 0x3ab743ce3ab743ce;
                  auVar424._12_4_ = 0x3ab743ce;
                  auVar424._16_4_ = 0x3ab743ce;
                  auVar424._20_4_ = 0x3ab743ce;
                  auVar424._24_4_ = 0x3ab743ce;
                  auVar424._28_4_ = 0x3ab743ce;
                  auVar252 = vfmadd213ps_fma(auVar258,auVar159,auVar424);
                  auVar484._8_4_ = 0x3c088908;
                  auVar484._0_8_ = 0x3c0889083c088908;
                  auVar484._12_4_ = 0x3c088908;
                  auVar484._16_4_ = 0x3c088908;
                  auVar484._20_4_ = 0x3c088908;
                  auVar484._24_4_ = 0x3c088908;
                  auVar484._28_4_ = 0x3c088908;
                  auVar252 = vfmadd213ps_fma(ZEXT1632(auVar252),auVar159,auVar484);
                  auVar252 = vfmadd213ps_fma(ZEXT1632(auVar252),auVar159,auVar488);
                  auVar425._8_4_ = 0x3e2aaaaa;
                  auVar425._0_8_ = 0x3e2aaaaa3e2aaaaa;
                  auVar425._12_4_ = 0x3e2aaaaa;
                  auVar425._16_4_ = 0x3e2aaaaa;
                  auVar425._20_4_ = 0x3e2aaaaa;
                  auVar425._24_4_ = 0x3e2aaaaa;
                  auVar425._28_4_ = 0x3e2aaaaa;
                  auVar159 = ZEXT1632(auVar427);
                  auVar252 = vfmadd213ps_fma(ZEXT1632(auVar252),auVar159,auVar425);
                  auVar252 = vfmadd213ps_fma(ZEXT1632(auVar252),auVar159,auVar241);
                  auVar252 = vfmadd213ps_fma(ZEXT1632(auVar252),auVar30,auVar159);
                  auVar217._0_4_ = auVar252._0_4_ + fVar89;
                  auVar217._4_4_ = auVar252._4_4_ + fVar88;
                  auVar217._8_4_ = auVar252._8_4_ + fVar518;
                  auVar217._12_4_ = auVar252._12_4_ + fVar250;
                  auVar217._16_4_ = fVar251 + 0.0;
                  auVar217._20_4_ = fVar28 + 0.0;
                  auVar217._24_4_ = fVar176 + 0.0;
                  auVar217._28_4_ = fVar29 + 0.0;
                  auVar427._0_4_ = (int)auVar163._0_4_;
                  auVar427._4_4_ = (int)auVar163._4_4_;
                  auVar427._8_4_ = (int)auVar163._8_4_;
                  auVar427._12_4_ = (int)auVar163._12_4_;
                  auVar259._16_4_ = (int)auVar163._16_4_;
                  auVar259._0_16_ = auVar427;
                  auVar259._20_4_ = (int)auVar163._20_4_;
                  auVar259._24_4_ = (int)auVar163._24_4_;
                  auVar259._28_4_ = (int)auVar163._28_4_;
                  auVar427 = vpslld_avx(auVar427,0x17);
                  auVar252 = vpslld_avx(auVar259._16_16_,0x17);
                  auVar149._8_4_ = 0x3f800000;
                  auVar149._0_8_ = 0x3f8000003f800000;
                  auVar149._12_4_ = 0x3f800000;
                  auVar252 = vpaddd_avx(auVar252,auVar149);
                  auVar427 = vpaddd_avx(auVar427,auVar149);
                  auVar509._16_16_ = auVar252;
                  auVar509._0_16_ = auVar427;
                  auVar377 = vfmadd213ps_fma(auVar509,auVar217,auVar165);
                  auVar218._8_4_ = 0x800000;
                  auVar218._0_8_ = 0x80000000800000;
                  auVar218._12_4_ = 0x800000;
                  auVar218._16_4_ = 0x800000;
                  auVar218._20_4_ = 0x800000;
                  auVar218._24_4_ = 0x800000;
                  auVar218._28_4_ = 0x800000;
                  auVar163 = vmaxps_avx(ZEXT1632(auVar377),auVar218);
                  auVar427 = vpsrld_avx(auVar163._0_16_,0x17);
                  auVar252 = vpsrld_avx(auVar163._16_16_,0x17);
                  auVar356._8_4_ = 0x807fffff;
                  auVar356._0_8_ = 0x807fffff807fffff;
                  auVar356._12_4_ = 0x807fffff;
                  auVar356._16_4_ = 0x807fffff;
                  auVar356._20_4_ = 0x807fffff;
                  auVar356._24_4_ = 0x807fffff;
                  auVar356._28_4_ = 0x807fffff;
                  auVar163 = vandps_avx(auVar163,auVar356);
                  auVar230 = vorps_avx(auVar163,auVar241);
                  auVar357._8_4_ = 0x3f3504f3;
                  auVar357._0_8_ = 0x3f3504f33f3504f3;
                  auVar357._12_4_ = 0x3f3504f3;
                  auVar357._16_4_ = 0x3f3504f3;
                  auVar357._20_4_ = 0x3f3504f3;
                  auVar357._24_4_ = 0x3f3504f3;
                  auVar357._28_4_ = 0x3f3504f3;
                  auVar159 = vcmpps_avx(auVar357,auVar230,2);
                  auVar163 = vandnps_avx(auVar159,auVar230);
                  auVar219._0_4_ = auVar163._0_4_ + auVar230._0_4_ + -1.0;
                  auVar219._4_4_ = auVar163._4_4_ + auVar230._4_4_ + -1.0;
                  auVar219._8_4_ = auVar163._8_4_ + auVar230._8_4_ + -1.0;
                  auVar219._12_4_ = auVar163._12_4_ + auVar230._12_4_ + -1.0;
                  auVar219._16_4_ = auVar163._16_4_ + auVar230._16_4_ + -1.0;
                  auVar219._20_4_ = auVar163._20_4_ + auVar230._20_4_ + -1.0;
                  auVar219._24_4_ = auVar163._24_4_ + auVar230._24_4_ + -1.0;
                  auVar219._28_4_ = auVar163._28_4_ + auVar230._28_4_ + -1.0;
                  auVar252 = vpsubd_avx(auVar252,auVar159._16_16_);
                  auVar451._8_4_ = 0xffffff81;
                  auVar451._0_8_ = 0xffffff81ffffff81;
                  auVar451._12_4_ = 0xffffff81;
                  auVar252 = vpaddd_avx(auVar252,auVar451);
                  auVar427 = vpsubd_avx(auVar427,auVar159._0_16_);
                  auVar427 = vpaddd_avx(auVar451,auVar427);
                  auVar260._16_16_ = auVar252;
                  auVar260._0_16_ = auVar427;
                  auVar31._4_4_ = auVar219._4_4_ * auVar219._4_4_;
                  auVar31._0_4_ = auVar219._0_4_ * auVar219._0_4_;
                  auVar31._8_4_ = auVar219._8_4_ * auVar219._8_4_;
                  auVar31._12_4_ = auVar219._12_4_ * auVar219._12_4_;
                  auVar31._16_4_ = auVar219._16_4_ * auVar219._16_4_;
                  auVar31._20_4_ = auVar219._20_4_ * auVar219._20_4_;
                  auVar31._24_4_ = auVar219._24_4_ * auVar219._24_4_;
                  auVar31._28_4_ = auVar159._28_4_;
                  auVar442._8_4_ = 0x3d9021bb;
                  auVar442._0_8_ = 0x3d9021bb3d9021bb;
                  auVar442._12_4_ = 0x3d9021bb;
                  auVar442._16_4_ = 0x3d9021bb;
                  auVar442._20_4_ = 0x3d9021bb;
                  auVar442._24_4_ = 0x3d9021bb;
                  auVar442._28_4_ = 0x3d9021bb;
                  auVar459._8_4_ = 0xbdebd1b8;
                  auVar459._0_8_ = 0xbdebd1b8bdebd1b8;
                  auVar459._12_4_ = 0xbdebd1b8;
                  auVar459._16_4_ = 0xbdebd1b8;
                  auVar459._20_4_ = 0xbdebd1b8;
                  auVar459._24_4_ = 0xbdebd1b8;
                  auVar459._28_4_ = 0xbdebd1b8;
                  auVar252 = vfmadd213ps_fma(auVar442,auVar219,auVar459);
                  auVar460._8_4_ = 0x3def251a;
                  auVar460._0_8_ = 0x3def251a3def251a;
                  auVar460._12_4_ = 0x3def251a;
                  auVar460._16_4_ = 0x3def251a;
                  auVar460._20_4_ = 0x3def251a;
                  auVar460._24_4_ = 0x3def251a;
                  auVar460._28_4_ = 0x3def251a;
                  auVar252 = vfmadd213ps_fma(ZEXT1632(auVar252),auVar219,auVar460);
                  auVar461._8_4_ = 0xbdfe5d4f;
                  auVar461._0_8_ = 0xbdfe5d4fbdfe5d4f;
                  auVar461._12_4_ = 0xbdfe5d4f;
                  auVar461._16_4_ = 0xbdfe5d4f;
                  auVar461._20_4_ = 0xbdfe5d4f;
                  auVar461._24_4_ = 0xbdfe5d4f;
                  auVar461._28_4_ = 0xbdfe5d4f;
                  auVar252 = vfmadd213ps_fma(ZEXT1632(auVar252),auVar219,auVar461);
                  auVar462._8_4_ = 0x3e11e9bf;
                  auVar462._0_8_ = 0x3e11e9bf3e11e9bf;
                  auVar462._12_4_ = 0x3e11e9bf;
                  auVar462._16_4_ = 0x3e11e9bf;
                  auVar462._20_4_ = 0x3e11e9bf;
                  auVar462._24_4_ = 0x3e11e9bf;
                  auVar462._28_4_ = 0x3e11e9bf;
                  auVar252 = vfmadd213ps_fma(ZEXT1632(auVar252),auVar219,auVar462);
                  auVar463._8_4_ = 0xbe2aae50;
                  auVar463._0_8_ = 0xbe2aae50be2aae50;
                  auVar463._12_4_ = 0xbe2aae50;
                  auVar463._16_4_ = 0xbe2aae50;
                  auVar463._20_4_ = 0xbe2aae50;
                  auVar463._24_4_ = 0xbe2aae50;
                  auVar463._28_4_ = 0xbe2aae50;
                  auVar252 = vfmadd213ps_fma(ZEXT1632(auVar252),auVar219,auVar463);
                  auVar464._8_4_ = 0x3e4cceac;
                  auVar464._0_8_ = 0x3e4cceac3e4cceac;
                  auVar464._12_4_ = 0x3e4cceac;
                  auVar464._16_4_ = 0x3e4cceac;
                  auVar464._20_4_ = 0x3e4cceac;
                  auVar464._24_4_ = 0x3e4cceac;
                  auVar464._28_4_ = 0x3e4cceac;
                  auVar252 = vfmadd213ps_fma(ZEXT1632(auVar252),auVar219,auVar464);
                  auVar465._8_4_ = 0xbe7ffffc;
                  auVar465._0_8_ = 0xbe7ffffcbe7ffffc;
                  auVar465._12_4_ = 0xbe7ffffc;
                  auVar465._16_4_ = 0xbe7ffffc;
                  auVar465._20_4_ = 0xbe7ffffc;
                  auVar465._24_4_ = 0xbe7ffffc;
                  auVar465._28_4_ = 0xbe7ffffc;
                  auVar252 = vfmadd213ps_fma(ZEXT1632(auVar252),auVar219,auVar465);
                  auVar466._8_4_ = 0x3eaaaaaa;
                  auVar466._0_8_ = 0x3eaaaaaa3eaaaaaa;
                  auVar466._12_4_ = 0x3eaaaaaa;
                  auVar466._16_4_ = 0x3eaaaaaa;
                  auVar466._20_4_ = 0x3eaaaaaa;
                  auVar466._24_4_ = 0x3eaaaaaa;
                  auVar466._28_4_ = 0x3eaaaaaa;
                  auVar252 = vfmadd213ps_fma(ZEXT1632(auVar252),auVar219,auVar466);
                  auVar443._0_4_ = auVar219._0_4_ * auVar219._0_4_ * auVar219._0_4_ * auVar252._0_4_
                  ;
                  auVar443._4_4_ = auVar219._4_4_ * auVar219._4_4_ * auVar219._4_4_ * auVar252._4_4_
                  ;
                  auVar443._8_4_ = auVar219._8_4_ * auVar219._8_4_ * auVar219._8_4_ * auVar252._8_4_
                  ;
                  auVar443._12_4_ =
                       auVar219._12_4_ * auVar219._12_4_ * auVar219._12_4_ * auVar252._12_4_;
                  auVar443._16_4_ = auVar219._16_4_ * auVar219._16_4_ * auVar219._16_4_ * 0.0;
                  auVar443._20_4_ = auVar219._20_4_ * auVar219._20_4_ * auVar219._20_4_ * 0.0;
                  auVar443._24_4_ = auVar219._24_4_ * auVar219._24_4_ * auVar219._24_4_ * 0.0;
                  auVar443._28_4_ = 0;
                  auVar159 = vcvtdq2ps_avx(auVar260);
                  auVar252 = vfmadd231ps_fma(auVar443,auVar159,auVar479);
                  auVar252 = vfmsub231ps_fma(ZEXT1632(auVar252),auVar241,auVar31);
                  auVar163 = vcmpps_avx(ZEXT1632(auVar377),_DAT_00558500,2);
                  auVar230 = vsubps_avx(ZEXT1632(auVar252),auVar219);
                  auVar252 = vfmsub231ps_fma(auVar230,auVar395,auVar159);
                  auVar510._8_4_ = 0xc0000000;
                  auVar510._0_8_ = 0xc0000000c0000000;
                  auVar510._12_4_ = 0xc0000000;
                  auVar510._16_4_ = 0xc0000000;
                  auVar510._20_4_ = 0xc0000000;
                  auVar510._24_4_ = 0xc0000000;
                  auVar510._28_4_ = 0xc0000000;
                  auVar220._0_4_ = auVar252._0_4_ * -2.0;
                  auVar220._4_4_ = auVar252._4_4_ * -2.0;
                  auVar220._8_4_ = auVar252._8_4_ * -2.0;
                  auVar220._12_4_ = auVar252._12_4_ * -2.0;
                  auVar220._16_4_ = 0x80000000;
                  auVar220._20_4_ = 0x80000000;
                  auVar220._24_4_ = 0x80000000;
                  auVar220._28_4_ = 0;
                  auVar261._8_4_ = 0x7fffffff;
                  auVar261._0_8_ = 0x7fffffff7fffffff;
                  auVar261._12_4_ = 0x7fffffff;
                  auVar261._16_4_ = 0x7fffffff;
                  auVar261._20_4_ = 0x7fffffff;
                  auVar261._24_4_ = 0x7fffffff;
                  auVar261._28_4_ = 0x7fffffff;
                  auVar163 = vblendvps_avx(auVar220,auVar261,auVar163);
                  auVar262._8_4_ = 0x42b0c0a5;
                  auVar262._0_8_ = 0x42b0c0a542b0c0a5;
                  auVar262._12_4_ = 0x42b0c0a5;
                  auVar262._16_4_ = 0x42b0c0a5;
                  auVar262._20_4_ = 0x42b0c0a5;
                  auVar262._24_4_ = 0x42b0c0a5;
                  auVar262._28_4_ = 0x42b0c0a5;
                  auVar163 = vminps_avx(auVar163,auVar262);
                  auVar263._8_4_ = 0xc2b0c0a5;
                  auVar263._0_8_ = 0xc2b0c0a5c2b0c0a5;
                  auVar263._12_4_ = 0xc2b0c0a5;
                  auVar263._16_4_ = 0xc2b0c0a5;
                  auVar263._20_4_ = 0xc2b0c0a5;
                  auVar263._24_4_ = 0xc2b0c0a5;
                  auVar263._28_4_ = 0xc2b0c0a5;
                  auVar159 = vmaxps_avx(auVar163,auVar263);
                  auVar264._8_4_ = 0x3fb8aa3b;
                  auVar264._0_8_ = 0x3fb8aa3b3fb8aa3b;
                  auVar264._12_4_ = 0x3fb8aa3b;
                  auVar264._16_4_ = 0x3fb8aa3b;
                  auVar264._20_4_ = 0x3fb8aa3b;
                  auVar264._24_4_ = 0x3fb8aa3b;
                  auVar264._28_4_ = 0x3fb8aa3b;
                  auVar252 = vfmadd213ps_fma(auVar264,auVar159,auVar241);
                  auVar230 = vroundps_avx(ZEXT1632(auVar252),1);
                  auVar163 = vcmpps_avx(ZEXT1632(auVar252),auVar230,1);
                  auVar163 = vandps_avx(auVar163,auVar165);
                  auVar163 = vsubps_avx(auVar230,auVar163);
                  auVar252 = vfmsub231ps_fma(auVar159,auVar163,auVar395);
                  auVar427 = vfnmsub231ps_fma(ZEXT1632(auVar252),auVar163,auVar479);
                  auVar159 = ZEXT1632(auVar427);
                  auVar32._28_4_ = auVar230._28_4_;
                  auVar32._0_28_ =
                       ZEXT1628(CONCAT412(auVar427._12_4_ * auVar427._12_4_,
                                          CONCAT48(auVar427._8_4_ * auVar427._8_4_,
                                                   CONCAT44(auVar427._4_4_ * auVar427._4_4_,
                                                            auVar427._0_4_ * auVar427._0_4_))));
                  auVar444._8_4_ = 0x39506967;
                  auVar444._0_8_ = 0x3950696739506967;
                  auVar444._12_4_ = 0x39506967;
                  auVar444._16_4_ = 0x39506967;
                  auVar444._20_4_ = 0x39506967;
                  auVar444._24_4_ = 0x39506967;
                  auVar444._28_4_ = 0x39506967;
                  auVar416 = ZEXT864(0) << 0x20;
                  auVar467._8_4_ = 0x3ab743ce;
                  auVar467._0_8_ = 0x3ab743ce3ab743ce;
                  auVar467._12_4_ = 0x3ab743ce;
                  auVar467._16_4_ = 0x3ab743ce;
                  auVar467._20_4_ = 0x3ab743ce;
                  auVar467._24_4_ = 0x3ab743ce;
                  auVar467._28_4_ = 0x3ab743ce;
                  auVar252 = vfmadd213ps_fma(auVar444,auVar159,auVar467);
                  auVar252 = vfmadd213ps_fma(ZEXT1632(auVar252),auVar159,auVar484);
                  auVar364 = ZEXT3264(auVar165);
                  auVar252 = vfmadd213ps_fma(ZEXT1632(auVar252),auVar159,auVar488);
                  auVar159 = ZEXT1632(auVar427);
                  auVar252 = vfmadd213ps_fma(ZEXT1632(auVar252),auVar159,auVar425);
                  auVar426 = ZEXT3264(auVar241);
                  auVar252 = vfmadd213ps_fma(ZEXT1632(auVar252),auVar159,auVar241);
                  auVar377 = vfmadd213ps_fma(ZEXT1632(auVar252),auVar32,auVar159);
                  auVar252._0_4_ = (int)auVar163._0_4_;
                  auVar252._4_4_ = (int)auVar163._4_4_;
                  auVar252._8_4_ = (int)auVar163._8_4_;
                  auVar252._12_4_ = (int)auVar163._12_4_;
                  auVar221._16_4_ = (int)auVar163._16_4_;
                  auVar221._0_16_ = auVar252;
                  auVar221._20_4_ = (int)auVar163._20_4_;
                  auVar221._24_4_ = (int)auVar163._24_4_;
                  auVar221._28_4_ = (int)auVar163._28_4_;
                  auVar427 = vpslld_avx(auVar252,0x17);
                  auVar252 = vpslld_avx(auVar221._16_16_,0x17);
                  auVar252 = vpaddd_avx(auVar252,auVar149);
                  auVar427 = vpaddd_avx(auVar427,auVar149);
                  auVar222._16_16_ = auVar252;
                  auVar222._0_16_ = auVar427;
                  auVar265._0_4_ = auVar377._0_4_ + fVar89;
                  auVar265._4_4_ = auVar377._4_4_ + fVar88;
                  auVar265._8_4_ = auVar377._8_4_ + fVar518;
                  auVar265._12_4_ = auVar377._12_4_ + fVar250;
                  auVar265._16_4_ = fVar251 + 0.0;
                  auVar265._20_4_ = fVar28 + 0.0;
                  auVar265._24_4_ = fVar176 + 0.0;
                  auVar265._28_4_ = fVar29 + 0.0;
                  auVar252 = vfmadd213ps_fma(auVar222,auVar265,auVar165);
                  auVar163 = vrcpps_avx(ZEXT1632(auVar252));
                  auVar252 = vfmsub213ps_fma(ZEXT1632(auVar252),auVar163,auVar165);
                  auVar252 = vfnmadd132ps_fma(ZEXT1632(auVar252),auVar163,auVar163);
                  auVar252 = vfnmadd213ps_fma(ZEXT1632(auVar252),auVar510,auVar169);
                  auVar216 = ZEXT1628(auVar252);
                  goto LAB_002816f6;
                case 6:
                  uVar2 = **(undefined4 **)(&this->field_0x118 + (long)p_Var61);
                  auVar228._4_4_ = uVar2;
                  auVar228._0_4_ = uVar2;
                  auVar228._8_4_ = uVar2;
                  auVar228._12_4_ = uVar2;
                  auVar228._16_4_ = uVar2;
                  auVar228._20_4_ = uVar2;
                  auVar228._24_4_ = uVar2;
                  auVar228._28_4_ = uVar2;
                  uVar2 = (*(undefined4 **)(&this->field_0x118 + (long)p_Var61))[1];
                  auVar268._4_4_ = uVar2;
                  auVar268._0_4_ = uVar2;
                  auVar268._8_4_ = uVar2;
                  auVar268._12_4_ = uVar2;
                  auVar268._16_4_ = uVar2;
                  auVar268._20_4_ = uVar2;
                  auVar268._24_4_ = uVar2;
                  auVar268._28_4_ = uVar2;
                  auVar252 = vfmadd231ps_fma(auVar268,auVar163,auVar228);
                  auVar163 = vmaxps_avx(auVar159,ZEXT1632(auVar252));
                  auVar163 = vminps_avx(auVar163,auVar165);
                  auVar216 = auVar163._0_28_;
LAB_002816f6:
                  auVar491._0_4_ = auVar216._0_4_ * auVar174._0_4_;
                  auVar491._4_4_ = auVar216._4_4_ * auVar174._4_4_;
                  auVar491._8_4_ = auVar216._8_4_ * auVar174._8_4_;
                  auVar491._12_4_ = auVar216._12_4_ * auVar174._12_4_;
                  auVar491._16_4_ = auVar216._16_4_ * auVar174._16_4_;
                  auVar491._20_4_ = auVar216._20_4_ * auVar174._20_4_;
                  auVar491._24_4_ = auVar216._24_4_ * auVar174._24_4_;
                  auVar163 = auVar491._0_32_;
                }
                *(undefined1 (*) [32])pAVar72 = auVar163;
                pAVar72 = pAVar72 + 4;
                uVar78 = uVar78 + 1;
                iVar53 = iVar53 + 1;
              } while (uVar78 != local_1a8.w);
            }
            iVar70 = iVar70 + 1;
          } while (iVar70 != local_1a8.h);
        }
        local_278 = local_278 + 1;
      } while (local_278 != (long)local_1a8.c);
    }
    if (((uint)local_150 == 4) && (uVar55 == 8)) {
      if ((long)local_1a8.c < 1) goto LAB_002851c2;
      p_Var61 = pp_Var18[-3];
      iVar14 = *(int *)(&this->field_0xdc + (long)p_Var61);
      iVar15 = *(int *)(&this->field_0xe0 + (long)p_Var61);
      iVar65 = *(int *)(&this->field_0xe4 + (long)p_Var61);
      iVar84 = *(int *)(&this->field_0xe8 + (long)p_Var61);
      uVar17 = *(undefined4 *)(&this->field_0x114 + (long)p_Var61);
      lVar79 = *(long *)(&this->field_0x1a8 + (long)p_Var61);
      uVar50 = *(uint *)(&this->field_0xd4 + (long)p_Var61);
      uVar16 = *(uint *)(&this->field_0xd8 + (long)p_Var61);
      local_278 = 0;
      auVar426 = ZEXT3264(CONCAT428(0xc2b0c0a5,
                                    CONCAT424(0xc2b0c0a5,
                                              CONCAT420(0xc2b0c0a5,
                                                        CONCAT416(0xc2b0c0a5,
                                                                  CONCAT412(0xc2b0c0a5,
                                                                            CONCAT48(0xc2b0c0a5,
                                                                                                                                                                          
                                                  0xc2b0c0a5c2b0c0a5)))))));
      auVar364 = ZEXT3264(CONCAT428(0x3f000000,
                                    CONCAT424(0x3f000000,
                                              CONCAT420(0x3f000000,
                                                        CONCAT416(0x3f000000,
                                                                  CONCAT412(0x3f000000,
                                                                            CONCAT48(0x3f000000,
                                                                                                                                                                          
                                                  0x3f0000003f000000)))))));
      auVar174 = ZEXT3264(CONCAT428(0x3fb8aa3b,
                                    CONCAT424(0x3fb8aa3b,
                                              CONCAT420(0x3fb8aa3b,
                                                        CONCAT416(0x3fb8aa3b,
                                                                  CONCAT412(0x3fb8aa3b,
                                                                            CONCAT48(0x3fb8aa3b,
                                                                                                                                                                          
                                                  0x3fb8aa3b3fb8aa3b)))))));
      auVar416 = ZEXT3264(CONCAT428(0x3f800000,
                                    CONCAT424(0x3f800000,
                                              CONCAT420(0x3f800000,
                                                        CONCAT416(0x3f800000,
                                                                  CONCAT412(0x3f800000,
                                                                            CONCAT48(0x3f800000,
                                                                                                                                                                          
                                                  0x3f8000003f800000)))))));
      auVar491 = ZEXT3264(CONCAT428(0x39506967,
                                    CONCAT424(0x39506967,
                                              CONCAT420(0x39506967,
                                                        CONCAT416(0x39506967,
                                                                  CONCAT412(0x39506967,
                                                                            CONCAT48(0x39506967,
                                                                                                                                                                          
                                                  0x3950696739506967)))))));
      do {
        if (0 < local_1a8.h) {
          iVar75 = bottom_blob->w;
          iVar77 = bottom_blob->h;
          pAVar72 = (Allocator *)
                    ((long)(_func_int ***)local_1a8.data +
                    local_1a8.cstep * local_278 * local_1a8.elemsize);
          uVar62 = bottom_blob->c;
          iVar70 = 0;
          do {
            if (0 < local_1a8.w) {
              uVar78 = 0;
              iVar53 = (1 - uVar50) * iVar14;
              do {
                if (lVar79 == 0) {
                  auVar175 = ZEXT1664(ZEXT816(0) << 0x40);
                }
                else {
                  auVar175 = ZEXT3264(*(undefined1 (*) [32])(lVar79 + local_278 * 0x20));
                }
                if (0 < (int)uVar62) {
                  pvVar86 = (void *)((this->weight_data_tm).cstep * local_278 *
                                     (this->weight_data_tm).elemsize +
                                    (long)(this->weight_data_tm).data);
                  pvVar74 = bottom_blob->data;
                  uVar64 = 0;
                  do {
                    if (0 < (int)uVar16) {
                      uVar83 = 0;
                      uVar67 = 0;
                      do {
                        iVar51 = (((int)uVar67 - uVar16) + 1) * iVar15 + iVar70;
                        if ((((-1 < iVar51) && (iVar52 = iVar51 / iVar84, iVar51 % iVar84 == 0)) &&
                            (0 < (int)uVar50)) && (iVar52 < iVar77)) {
                          lVar82 = (long)iVar52 * (long)bottom_blob->w * bottom_blob->elemsize +
                                   bottom_blob->cstep * bottom_blob->elemsize * uVar64;
                          uVar71 = uVar83;
                          uVar80 = (ulong)uVar50;
                          iVar51 = iVar53;
                          do {
                            if (((-1 < iVar51) && (iVar52 = iVar51 / iVar65, iVar51 % iVar65 == 0))
                               && (iVar52 < iVar75)) {
                              lVar59 = (long)(iVar52 << 2);
                              uVar2 = *(undefined4 *)((long)pvVar74 + lVar59 * 4 + lVar82);
                              auVar229._4_4_ = uVar2;
                              auVar229._0_4_ = uVar2;
                              auVar229._8_4_ = uVar2;
                              auVar229._12_4_ = uVar2;
                              auVar229._16_4_ = uVar2;
                              auVar229._20_4_ = uVar2;
                              auVar229._24_4_ = uVar2;
                              auVar229._28_4_ = uVar2;
                              uVar2 = *(undefined4 *)((long)pvVar74 + lVar59 * 4 + lVar82 + 4);
                              auVar269._4_4_ = uVar2;
                              auVar269._0_4_ = uVar2;
                              auVar269._8_4_ = uVar2;
                              auVar269._12_4_ = uVar2;
                              auVar269._16_4_ = uVar2;
                              auVar269._20_4_ = uVar2;
                              auVar269._24_4_ = uVar2;
                              auVar269._28_4_ = uVar2;
                              uVar2 = *(undefined4 *)((long)pvVar74 + lVar59 * 4 + lVar82 + 8);
                              auVar358._4_4_ = uVar2;
                              auVar358._0_4_ = uVar2;
                              auVar358._8_4_ = uVar2;
                              auVar358._12_4_ = uVar2;
                              auVar358._16_4_ = uVar2;
                              auVar358._20_4_ = uVar2;
                              auVar358._24_4_ = uVar2;
                              auVar358._28_4_ = uVar2;
                              uVar2 = *(undefined4 *)((long)pvVar74 + lVar59 * 4 + lVar82 + 0xc);
                              auVar446._4_4_ = uVar2;
                              auVar446._0_4_ = uVar2;
                              auVar446._8_4_ = uVar2;
                              auVar446._12_4_ = uVar2;
                              auVar446._16_4_ = uVar2;
                              auVar446._20_4_ = uVar2;
                              auVar446._24_4_ = uVar2;
                              auVar446._28_4_ = uVar2;
                              uVar60 = uVar71 & 0xffffffff;
                              auVar252 = vfmadd231ps_fma(auVar175._0_32_,auVar229,
                                                         *(undefined1 (*) [32])
                                                          ((long)pvVar86 + uVar60 * 4));
                              auVar252 = vfmadd231ps_fma(ZEXT1632(auVar252),auVar269,
                                                         *(undefined1 (*) [32])
                                                          ((long)pvVar86 + uVar60 * 4 + 0x20));
                              auVar252 = vfmadd231ps_fma(ZEXT1632(auVar252),auVar358,
                                                         *(undefined1 (*) [32])
                                                          ((long)pvVar86 + uVar60 * 4 + 0x40));
                              auVar252 = vfmadd231ps_fma(ZEXT1632(auVar252),auVar446,
                                                         *(undefined1 (*) [32])
                                                          ((long)pvVar86 + uVar60 * 4 + 0x60));
                              auVar175 = ZEXT1664(auVar252);
                            }
                            uVar71 = uVar71 + 0x20;
                            iVar51 = iVar51 + iVar14;
                            uVar80 = uVar80 - 1;
                          } while (uVar80 != 0);
                        }
                        uVar67 = uVar67 + 1;
                        uVar83 = uVar83 + (ulong)uVar50 * 0x20;
                      } while (uVar67 != uVar16);
                    }
                    pvVar86 = (void *)((long)pvVar86 + (long)(int)(uVar50 * uVar16 * 0x20) * 4);
                    uVar64 = uVar64 + 1;
                  } while (uVar64 != uVar62);
                }
                auVar169 = auVar175._0_32_;
                auVar163 = auVar416._0_32_;
                auVar241 = auVar491._0_32_;
                auVar488 = auVar364._0_32_;
                auVar165 = auVar426._0_32_;
                auVar159 = auVar174._0_32_;
                auVar485._28_36_ = auVar175._28_36_;
                fVar89 = auVar416._0_4_;
                fVar88 = auVar416._4_4_;
                fVar518 = auVar416._8_4_;
                fVar250 = auVar416._12_4_;
                fVar251 = auVar416._16_4_;
                fVar28 = auVar416._20_4_;
                fVar176 = auVar416._24_4_;
                fVar29 = auVar416._28_4_;
                switch(uVar17) {
                case 1:
                  auVar169 = vmaxps_avx(auVar169,_DAT_00558500);
                  break;
                case 2:
                  auVar488 = vmaxps_avx(auVar169,ZEXT1632(ZEXT816(0) << 0x40));
                  auVar169 = vminps_avx(auVar169,ZEXT1632(ZEXT816(0) << 0x40));
                  uVar2 = **(undefined4 **)(&this->field_0x118 + (long)p_Var61);
                  auVar168._4_4_ = uVar2;
                  auVar168._0_4_ = uVar2;
                  auVar168._8_4_ = uVar2;
                  auVar168._12_4_ = uVar2;
                  auVar168._16_4_ = uVar2;
                  auVar168._20_4_ = uVar2;
                  auVar168._24_4_ = uVar2;
                  auVar168._28_4_ = uVar2;
                  auVar252 = vfmadd213ps_fma(auVar168,auVar169,auVar488);
                  auVar169 = ZEXT1632(auVar252);
                  break;
                case 3:
                  uVar2 = **(undefined4 **)(&this->field_0x118 + (long)p_Var61);
                  auVar237._4_4_ = uVar2;
                  auVar237._0_4_ = uVar2;
                  auVar237._8_4_ = uVar2;
                  auVar237._12_4_ = uVar2;
                  auVar237._16_4_ = uVar2;
                  auVar237._20_4_ = uVar2;
                  auVar237._24_4_ = uVar2;
                  auVar237._28_4_ = uVar2;
                  uVar2 = (*(undefined4 **)(&this->field_0x118 + (long)p_Var61))[1];
                  auVar513._4_4_ = uVar2;
                  auVar513._0_4_ = uVar2;
                  auVar513._8_4_ = uVar2;
                  auVar513._12_4_ = uVar2;
                  auVar513._16_4_ = uVar2;
                  auVar513._20_4_ = uVar2;
                  auVar513._24_4_ = uVar2;
                  auVar513._28_4_ = uVar2;
                  auVar169 = vmaxps_avx(auVar169,auVar237);
                  auVar169 = vminps_avx(auVar513,auVar169);
                  break;
                case 4:
                  auVar164._0_8_ = auVar175._0_8_ ^ 0x8000000080000000;
                  auVar164._8_4_ = -auVar175._8_4_;
                  auVar164._12_4_ = -auVar175._12_4_;
                  auVar164._16_4_ = -auVar175._16_4_;
                  auVar164._20_4_ = -auVar175._20_4_;
                  auVar164._24_4_ = -auVar175._24_4_;
                  auVar164._28_4_ = auVar175._28_4_ ^ 0x80000000;
                  auVar118._8_4_ = 0x42b0c0a5;
                  auVar118._0_8_ = 0x42b0c0a542b0c0a5;
                  auVar118._12_4_ = 0x42b0c0a5;
                  auVar118._16_4_ = 0x42b0c0a5;
                  auVar118._20_4_ = 0x42b0c0a5;
                  auVar118._24_4_ = 0x42b0c0a5;
                  auVar118._28_4_ = 0x42b0c0a5;
                  auVar169 = vminps_avx(auVar164,auVar118);
                  auVar165 = vmaxps_avx(auVar165,auVar169);
                  auVar252 = vfmadd213ps_fma(auVar159,auVar165,auVar488);
                  auVar159 = vroundps_avx(ZEXT1632(auVar252),1);
                  auVar169 = vcmpps_avx(ZEXT1632(auVar252),auVar159,1);
                  auVar169 = vandps_avx(auVar169,auVar163);
                  auVar169 = vsubps_avx(auVar159,auVar169);
                  auVar119._8_4_ = 0x3f318000;
                  auVar119._0_8_ = 0x3f3180003f318000;
                  auVar119._12_4_ = 0x3f318000;
                  auVar119._16_4_ = 0x3f318000;
                  auVar119._20_4_ = 0x3f318000;
                  auVar119._24_4_ = 0x3f318000;
                  auVar119._28_4_ = 0x3f318000;
                  auVar252 = vfmsub231ps_fma(auVar165,auVar169,auVar119);
                  auVar274._8_4_ = 0x395e8083;
                  auVar274._0_8_ = 0x395e8083395e8083;
                  auVar274._12_4_ = 0x395e8083;
                  auVar274._16_4_ = 0x395e8083;
                  auVar274._20_4_ = 0x395e8083;
                  auVar274._24_4_ = 0x395e8083;
                  auVar274._28_4_ = 0x395e8083;
                  auVar427 = vfmsub231ps_fma(ZEXT1632(auVar252),auVar169,auVar274);
                  auVar165 = ZEXT1632(auVar427);
                  auVar37._28_4_ = auVar159._28_4_;
                  auVar37._0_28_ =
                       ZEXT1628(CONCAT412(auVar427._12_4_ * auVar427._12_4_,
                                          CONCAT48(auVar427._8_4_ * auVar427._8_4_,
                                                   CONCAT44(auVar427._4_4_ * auVar427._4_4_,
                                                            auVar427._0_4_ * auVar427._0_4_))));
                  auVar120._8_4_ = 0x3ab743ce;
                  auVar120._0_8_ = 0x3ab743ce3ab743ce;
                  auVar120._12_4_ = 0x3ab743ce;
                  auVar120._16_4_ = 0x3ab743ce;
                  auVar120._20_4_ = 0x3ab743ce;
                  auVar120._24_4_ = 0x3ab743ce;
                  auVar120._28_4_ = 0x3ab743ce;
                  auVar252 = vfmadd213ps_fma(auVar241,auVar165,auVar120);
                  auVar275._8_4_ = 0x3c088908;
                  auVar275._0_8_ = 0x3c0889083c088908;
                  auVar275._12_4_ = 0x3c088908;
                  auVar275._16_4_ = 0x3c088908;
                  auVar275._20_4_ = 0x3c088908;
                  auVar275._24_4_ = 0x3c088908;
                  auVar275._28_4_ = 0x3c088908;
                  auVar252 = vfmadd213ps_fma(ZEXT1632(auVar252),auVar165,auVar275);
                  auVar276._8_4_ = 0x3d2aa9c1;
                  auVar276._0_8_ = 0x3d2aa9c13d2aa9c1;
                  auVar276._12_4_ = 0x3d2aa9c1;
                  auVar276._16_4_ = 0x3d2aa9c1;
                  auVar276._20_4_ = 0x3d2aa9c1;
                  auVar276._24_4_ = 0x3d2aa9c1;
                  auVar276._28_4_ = 0x3d2aa9c1;
                  auVar252 = vfmadd213ps_fma(ZEXT1632(auVar252),auVar165,auVar276);
                  auVar121._8_4_ = 0x3e2aaaaa;
                  auVar121._0_8_ = 0x3e2aaaaa3e2aaaaa;
                  auVar121._12_4_ = 0x3e2aaaaa;
                  auVar121._16_4_ = 0x3e2aaaaa;
                  auVar121._20_4_ = 0x3e2aaaaa;
                  auVar121._24_4_ = 0x3e2aaaaa;
                  auVar121._28_4_ = 0x3e2aaaaa;
                  auVar165 = ZEXT1632(auVar427);
                  auVar252 = vfmadd213ps_fma(ZEXT1632(auVar252),auVar165,auVar121);
                  auVar252 = vfmadd213ps_fma(ZEXT1632(auVar252),auVar165,auVar488);
                  auVar377 = vfmadd213ps_fma(ZEXT1632(auVar252),auVar37,auVar165);
                  auVar134._0_4_ = (int)auVar169._0_4_;
                  auVar134._4_4_ = (int)auVar169._4_4_;
                  auVar134._8_4_ = (int)auVar169._8_4_;
                  auVar134._12_4_ = (int)auVar169._12_4_;
                  auVar166._16_4_ = (int)auVar169._16_4_;
                  auVar166._0_16_ = auVar134;
                  auVar166._20_4_ = (int)auVar169._20_4_;
                  auVar166._24_4_ = (int)auVar169._24_4_;
                  auVar166._28_4_ = (int)auVar169._28_4_;
                  auVar427 = vpslld_avx(auVar134,0x17);
                  auVar252 = vpslld_avx(auVar166._16_16_,0x17);
                  auVar92._8_4_ = 0x3f800000;
                  auVar92._0_8_ = 0x3f8000003f800000;
                  auVar92._12_4_ = 0x3f800000;
                  auVar252 = vpaddd_avx(auVar252,auVar92);
                  auVar427 = vpaddd_avx(auVar427,auVar92);
                  auVar167._16_16_ = auVar252;
                  auVar167._0_16_ = auVar427;
                  auVar238._0_4_ = auVar377._0_4_ + fVar89;
                  auVar238._4_4_ = auVar377._4_4_ + fVar88;
                  auVar238._8_4_ = auVar377._8_4_ + fVar518;
                  auVar238._12_4_ = auVar377._12_4_ + fVar250;
                  auVar238._16_4_ = fVar251 + 0.0;
                  auVar238._20_4_ = fVar28 + 0.0;
                  auVar238._24_4_ = fVar176 + 0.0;
                  auVar238._28_4_ = fVar29 + 0.0;
                  auVar252 = vfmadd213ps_fma(auVar167,auVar238,auVar163);
                  auVar169 = vrcpps_avx(ZEXT1632(auVar252));
                  auVar252 = vfmsub213ps_fma(ZEXT1632(auVar252),auVar169,auVar163);
                  auVar252 = vfnmadd132ps_fma(ZEXT1632(auVar252),auVar169,auVar169);
                  auVar169 = ZEXT1632(auVar252);
                  break;
                case 5:
                  auVar468._8_4_ = 0x42b0c0a5;
                  auVar468._0_8_ = 0x42b0c0a542b0c0a5;
                  auVar468._12_4_ = 0x42b0c0a5;
                  auVar468._16_4_ = 0x42b0c0a5;
                  auVar468._20_4_ = 0x42b0c0a5;
                  auVar468._24_4_ = 0x42b0c0a5;
                  auVar468._28_4_ = 0x42b0c0a5;
                  auVar169 = vminps_avx(auVar468,auVar169);
                  auVar230 = vmaxps_avx(auVar165,auVar169);
                  auVar252 = vfmadd213ps_fma(auVar159,auVar230,auVar488);
                  auVar477 = vroundps_avx(ZEXT1632(auVar252),1);
                  auVar169 = vcmpps_avx(ZEXT1632(auVar252),auVar477,1);
                  auVar169 = vandps_avx(auVar169,auVar163);
                  auVar169 = vsubps_avx(auVar477,auVar169);
                  auVar370._8_4_ = 0x3f318000;
                  auVar370._0_8_ = 0x3f3180003f318000;
                  auVar370._12_4_ = 0x3f318000;
                  auVar370._16_4_ = 0x3f318000;
                  auVar370._20_4_ = 0x3f318000;
                  auVar370._24_4_ = 0x3f318000;
                  auVar370._28_4_ = 0x3f318000;
                  auVar252 = vfmsub231ps_fma(auVar230,auVar169,auVar370);
                  auVar115._8_4_ = 0xb95e8083;
                  auVar115._0_8_ = 0xb95e8083b95e8083;
                  auVar115._12_4_ = 0xb95e8083;
                  auVar115._16_4_ = 0xb95e8083;
                  auVar115._20_4_ = 0xb95e8083;
                  auVar115._24_4_ = 0xb95e8083;
                  auVar115._28_4_ = 0xb95e8083;
                  auVar427 = vfnmsub231ps_fma(ZEXT1632(auVar252),auVar169,auVar115);
                  auVar230 = ZEXT1632(auVar427);
                  auVar34._28_4_ = auVar477._28_4_;
                  auVar34._0_28_ =
                       ZEXT1628(CONCAT412(auVar427._12_4_ * auVar427._12_4_,
                                          CONCAT48(auVar427._8_4_ * auVar427._8_4_,
                                                   CONCAT44(auVar427._4_4_ * auVar427._4_4_,
                                                            auVar427._0_4_ * auVar427._0_4_))));
                  auVar489._8_4_ = 0x3ab743ce;
                  auVar489._0_8_ = 0x3ab743ce3ab743ce;
                  auVar489._12_4_ = 0x3ab743ce;
                  auVar489._16_4_ = 0x3ab743ce;
                  auVar489._20_4_ = 0x3ab743ce;
                  auVar489._24_4_ = 0x3ab743ce;
                  auVar489._28_4_ = 0x3ab743ce;
                  auVar252 = vfmadd213ps_fma(auVar241,auVar230,auVar489);
                  auVar396._8_4_ = 0x3c088908;
                  auVar396._0_8_ = 0x3c0889083c088908;
                  auVar396._12_4_ = 0x3c088908;
                  auVar396._16_4_ = 0x3c088908;
                  auVar396._20_4_ = 0x3c088908;
                  auVar396._24_4_ = 0x3c088908;
                  auVar396._28_4_ = 0x3c088908;
                  auVar252 = vfmadd213ps_fma(ZEXT1632(auVar252),auVar230,auVar396);
                  auVar341._8_4_ = 0x3d2aa9c1;
                  auVar341._0_8_ = 0x3d2aa9c13d2aa9c1;
                  auVar341._12_4_ = 0x3d2aa9c1;
                  auVar341._16_4_ = 0x3d2aa9c1;
                  auVar341._20_4_ = 0x3d2aa9c1;
                  auVar341._24_4_ = 0x3d2aa9c1;
                  auVar341._28_4_ = 0x3d2aa9c1;
                  auVar252 = vfmadd213ps_fma(ZEXT1632(auVar252),auVar230,auVar341);
                  auVar342._8_4_ = 0x3e2aaaaa;
                  auVar342._0_8_ = 0x3e2aaaaa3e2aaaaa;
                  auVar342._12_4_ = 0x3e2aaaaa;
                  auVar342._16_4_ = 0x3e2aaaaa;
                  auVar342._20_4_ = 0x3e2aaaaa;
                  auVar342._24_4_ = 0x3e2aaaaa;
                  auVar342._28_4_ = 0x3e2aaaaa;
                  auVar230 = ZEXT1632(auVar427);
                  auVar252 = vfmadd213ps_fma(ZEXT1632(auVar252),auVar230,auVar342);
                  auVar252 = vfmadd213ps_fma(ZEXT1632(auVar252),auVar230,auVar488);
                  auVar252 = vfmadd213ps_fma(ZEXT1632(auVar252),auVar34,auVar230);
                  auVar231._0_4_ = auVar252._0_4_ + fVar89;
                  auVar231._4_4_ = auVar252._4_4_ + fVar88;
                  auVar231._8_4_ = auVar252._8_4_ + fVar518;
                  auVar231._12_4_ = auVar252._12_4_ + fVar250;
                  auVar231._16_4_ = fVar251 + 0.0;
                  auVar231._20_4_ = fVar28 + 0.0;
                  auVar231._24_4_ = fVar176 + 0.0;
                  auVar231._28_4_ = fVar29 + 0.0;
                  auVar377._0_4_ = (int)auVar169._0_4_;
                  auVar377._4_4_ = (int)auVar169._4_4_;
                  auVar377._8_4_ = (int)auVar169._8_4_;
                  auVar377._12_4_ = (int)auVar169._12_4_;
                  auVar270._16_4_ = (int)auVar169._16_4_;
                  auVar270._0_16_ = auVar377;
                  auVar270._20_4_ = (int)auVar169._20_4_;
                  auVar270._24_4_ = (int)auVar169._24_4_;
                  auVar270._28_4_ = (int)auVar169._28_4_;
                  auVar427 = vpslld_avx(auVar377,0x17);
                  auVar252 = vpslld_avx(auVar270._16_16_,0x17);
                  auVar374._8_4_ = 0x3f800000;
                  auVar374._0_8_ = 0x3f8000003f800000;
                  auVar374._12_4_ = 0x3f800000;
                  auVar252 = vpaddd_avx(auVar374,auVar252);
                  auVar427 = vpaddd_avx(auVar427,auVar374);
                  auVar512._16_16_ = auVar252;
                  auVar512._0_16_ = auVar427;
                  auVar377 = vfmadd213ps_fma(auVar512,auVar231,auVar163);
                  auVar232._8_4_ = 0x800000;
                  auVar232._0_8_ = 0x80000000800000;
                  auVar232._12_4_ = 0x800000;
                  auVar232._16_4_ = 0x800000;
                  auVar232._20_4_ = 0x800000;
                  auVar232._24_4_ = 0x800000;
                  auVar232._28_4_ = 0x800000;
                  auVar169 = vmaxps_avx(ZEXT1632(auVar377),auVar232);
                  auVar427 = vpsrld_avx(auVar169._0_16_,0x17);
                  auVar252 = vpsrld_avx(auVar169._16_16_,0x17);
                  auVar343._8_4_ = 0x807fffff;
                  auVar343._0_8_ = 0x807fffff807fffff;
                  auVar343._12_4_ = 0x807fffff;
                  auVar343._16_4_ = 0x807fffff;
                  auVar343._20_4_ = 0x807fffff;
                  auVar343._24_4_ = 0x807fffff;
                  auVar343._28_4_ = 0x807fffff;
                  auVar169 = vandps_avx(auVar169,auVar343);
                  auVar477 = vorps_avx(auVar169,auVar488);
                  auVar344._8_4_ = 0x3f3504f3;
                  auVar344._0_8_ = 0x3f3504f33f3504f3;
                  auVar344._12_4_ = 0x3f3504f3;
                  auVar344._16_4_ = 0x3f3504f3;
                  auVar344._20_4_ = 0x3f3504f3;
                  auVar344._24_4_ = 0x3f3504f3;
                  auVar344._28_4_ = 0x3f3504f3;
                  auVar230 = vcmpps_avx(auVar344,auVar477,2);
                  auVar169 = vandnps_avx(auVar230,auVar477);
                  auVar233._0_4_ = auVar169._0_4_ + auVar477._0_4_ + -1.0;
                  auVar233._4_4_ = auVar169._4_4_ + auVar477._4_4_ + -1.0;
                  auVar233._8_4_ = auVar169._8_4_ + auVar477._8_4_ + -1.0;
                  auVar233._12_4_ = auVar169._12_4_ + auVar477._12_4_ + -1.0;
                  auVar233._16_4_ = auVar169._16_4_ + auVar477._16_4_ + -1.0;
                  auVar233._20_4_ = auVar169._20_4_ + auVar477._20_4_ + -1.0;
                  auVar233._24_4_ = auVar169._24_4_ + auVar477._24_4_ + -1.0;
                  auVar233._28_4_ = auVar169._28_4_ + auVar477._28_4_ + -1.0;
                  auVar252 = vpsubd_avx(auVar252,auVar230._16_16_);
                  auVar452._8_4_ = 0xffffff81;
                  auVar452._0_8_ = 0xffffff81ffffff81;
                  auVar452._12_4_ = 0xffffff81;
                  auVar252 = vpaddd_avx(auVar252,auVar452);
                  auVar427 = vpsubd_avx(auVar427,auVar230._0_16_);
                  auVar427 = vpaddd_avx(auVar452,auVar427);
                  auVar271._16_16_ = auVar252;
                  auVar271._0_16_ = auVar427;
                  auVar35._4_4_ = auVar233._4_4_ * auVar233._4_4_;
                  auVar35._0_4_ = auVar233._0_4_ * auVar233._0_4_;
                  auVar35._8_4_ = auVar233._8_4_ * auVar233._8_4_;
                  auVar35._12_4_ = auVar233._12_4_ * auVar233._12_4_;
                  auVar35._16_4_ = auVar233._16_4_ * auVar233._16_4_;
                  auVar35._20_4_ = auVar233._20_4_ * auVar233._20_4_;
                  auVar35._24_4_ = auVar233._24_4_ * auVar233._24_4_;
                  auVar35._28_4_ = auVar230._28_4_;
                  auVar447._8_4_ = 0x3d9021bb;
                  auVar447._0_8_ = 0x3d9021bb3d9021bb;
                  auVar447._12_4_ = 0x3d9021bb;
                  auVar447._16_4_ = 0x3d9021bb;
                  auVar447._20_4_ = 0x3d9021bb;
                  auVar447._24_4_ = 0x3d9021bb;
                  auVar447._28_4_ = 0x3d9021bb;
                  auVar397._8_4_ = 0xbdebd1b8;
                  auVar397._0_8_ = 0xbdebd1b8bdebd1b8;
                  auVar397._12_4_ = 0xbdebd1b8;
                  auVar397._16_4_ = 0xbdebd1b8;
                  auVar397._20_4_ = 0xbdebd1b8;
                  auVar397._24_4_ = 0xbdebd1b8;
                  auVar397._28_4_ = 0xbdebd1b8;
                  auVar252 = vfmadd213ps_fma(auVar447,auVar233,auVar397);
                  auVar398._8_4_ = 0x3def251a;
                  auVar398._0_8_ = 0x3def251a3def251a;
                  auVar398._12_4_ = 0x3def251a;
                  auVar398._16_4_ = 0x3def251a;
                  auVar398._20_4_ = 0x3def251a;
                  auVar398._24_4_ = 0x3def251a;
                  auVar398._28_4_ = 0x3def251a;
                  auVar252 = vfmadd213ps_fma(ZEXT1632(auVar252),auVar233,auVar398);
                  auVar399._8_4_ = 0xbdfe5d4f;
                  auVar399._0_8_ = 0xbdfe5d4fbdfe5d4f;
                  auVar399._12_4_ = 0xbdfe5d4f;
                  auVar399._16_4_ = 0xbdfe5d4f;
                  auVar399._20_4_ = 0xbdfe5d4f;
                  auVar399._24_4_ = 0xbdfe5d4f;
                  auVar399._28_4_ = 0xbdfe5d4f;
                  auVar252 = vfmadd213ps_fma(ZEXT1632(auVar252),auVar233,auVar399);
                  auVar400._8_4_ = 0x3e11e9bf;
                  auVar400._0_8_ = 0x3e11e9bf3e11e9bf;
                  auVar400._12_4_ = 0x3e11e9bf;
                  auVar400._16_4_ = 0x3e11e9bf;
                  auVar400._20_4_ = 0x3e11e9bf;
                  auVar400._24_4_ = 0x3e11e9bf;
                  auVar400._28_4_ = 0x3e11e9bf;
                  auVar252 = vfmadd213ps_fma(ZEXT1632(auVar252),auVar233,auVar400);
                  auVar401._8_4_ = 0xbe2aae50;
                  auVar401._0_8_ = 0xbe2aae50be2aae50;
                  auVar401._12_4_ = 0xbe2aae50;
                  auVar401._16_4_ = 0xbe2aae50;
                  auVar401._20_4_ = 0xbe2aae50;
                  auVar401._24_4_ = 0xbe2aae50;
                  auVar401._28_4_ = 0xbe2aae50;
                  auVar252 = vfmadd213ps_fma(ZEXT1632(auVar252),auVar233,auVar401);
                  auVar402._8_4_ = 0x3e4cceac;
                  auVar402._0_8_ = 0x3e4cceac3e4cceac;
                  auVar402._12_4_ = 0x3e4cceac;
                  auVar402._16_4_ = 0x3e4cceac;
                  auVar402._20_4_ = 0x3e4cceac;
                  auVar402._24_4_ = 0x3e4cceac;
                  auVar402._28_4_ = 0x3e4cceac;
                  auVar252 = vfmadd213ps_fma(ZEXT1632(auVar252),auVar233,auVar402);
                  auVar403._8_4_ = 0xbe7ffffc;
                  auVar403._0_8_ = 0xbe7ffffcbe7ffffc;
                  auVar403._12_4_ = 0xbe7ffffc;
                  auVar403._16_4_ = 0xbe7ffffc;
                  auVar403._20_4_ = 0xbe7ffffc;
                  auVar403._24_4_ = 0xbe7ffffc;
                  auVar403._28_4_ = 0xbe7ffffc;
                  auVar252 = vfmadd213ps_fma(ZEXT1632(auVar252),auVar233,auVar403);
                  auVar404._8_4_ = 0x3eaaaaaa;
                  auVar404._0_8_ = 0x3eaaaaaa3eaaaaaa;
                  auVar404._12_4_ = 0x3eaaaaaa;
                  auVar404._16_4_ = 0x3eaaaaaa;
                  auVar404._20_4_ = 0x3eaaaaaa;
                  auVar404._24_4_ = 0x3eaaaaaa;
                  auVar404._28_4_ = 0x3eaaaaaa;
                  auVar252 = vfmadd213ps_fma(ZEXT1632(auVar252),auVar233,auVar404);
                  auVar448._0_4_ = auVar233._0_4_ * auVar233._0_4_ * auVar233._0_4_ * auVar252._0_4_
                  ;
                  auVar448._4_4_ = auVar233._4_4_ * auVar233._4_4_ * auVar233._4_4_ * auVar252._4_4_
                  ;
                  auVar448._8_4_ = auVar233._8_4_ * auVar233._8_4_ * auVar233._8_4_ * auVar252._8_4_
                  ;
                  auVar448._12_4_ =
                       auVar233._12_4_ * auVar233._12_4_ * auVar233._12_4_ * auVar252._12_4_;
                  auVar448._16_4_ = auVar233._16_4_ * auVar233._16_4_ * auVar233._16_4_ * 0.0;
                  auVar448._20_4_ = auVar233._20_4_ * auVar233._20_4_ * auVar233._20_4_ * 0.0;
                  auVar448._24_4_ = auVar233._24_4_ * auVar233._24_4_ * auVar233._24_4_ * 0.0;
                  auVar448._28_4_ = 0;
                  auVar230 = vcvtdq2ps_avx(auVar271);
                  auVar469._8_4_ = 0xb95e8083;
                  auVar469._0_8_ = 0xb95e8083b95e8083;
                  auVar469._12_4_ = 0xb95e8083;
                  auVar469._16_4_ = 0xb95e8083;
                  auVar469._20_4_ = 0xb95e8083;
                  auVar469._24_4_ = 0xb95e8083;
                  auVar469._28_4_ = 0xb95e8083;
                  auVar252 = vfmadd231ps_fma(auVar448,auVar230,auVar469);
                  auVar252 = vfmsub231ps_fma(ZEXT1632(auVar252),auVar488,auVar35);
                  auVar169 = vcmpps_avx(ZEXT1632(auVar377),ZEXT832(0) << 0x20,2);
                  auVar477 = vsubps_avx(ZEXT1632(auVar252),auVar233);
                  auVar252 = vfmsub231ps_fma(auVar477,auVar370,auVar230);
                  auVar405._8_4_ = 0xc0000000;
                  auVar405._0_8_ = 0xc0000000c0000000;
                  auVar405._12_4_ = 0xc0000000;
                  auVar405._16_4_ = 0xc0000000;
                  auVar405._20_4_ = 0xc0000000;
                  auVar405._24_4_ = 0xc0000000;
                  auVar405._28_4_ = 0xc0000000;
                  auVar234._0_4_ = auVar252._0_4_ * -2.0;
                  auVar234._4_4_ = auVar252._4_4_ * -2.0;
                  auVar234._8_4_ = auVar252._8_4_ * -2.0;
                  auVar234._12_4_ = auVar252._12_4_ * -2.0;
                  auVar234._16_4_ = 0x80000000;
                  auVar234._20_4_ = 0x80000000;
                  auVar234._24_4_ = 0x80000000;
                  auVar234._28_4_ = 0;
                  auVar272._8_4_ = 0x7fffffff;
                  auVar272._0_8_ = 0x7fffffff7fffffff;
                  auVar272._12_4_ = 0x7fffffff;
                  auVar272._16_4_ = 0x7fffffff;
                  auVar272._20_4_ = 0x7fffffff;
                  auVar272._24_4_ = 0x7fffffff;
                  auVar272._28_4_ = 0x7fffffff;
                  auVar169 = vblendvps_avx(auVar234,auVar272,auVar169);
                  auVar169 = vminps_avx(auVar468,auVar169);
                  auVar426 = ZEXT3264(auVar165);
                  auVar165 = vmaxps_avx(auVar165,auVar169);
                  auVar174 = ZEXT3264(auVar159);
                  auVar252 = vfmadd213ps_fma(auVar159,auVar165,auVar488);
                  auVar159 = vroundps_avx(ZEXT1632(auVar252),1);
                  auVar169 = vcmpps_avx(ZEXT1632(auVar252),auVar159,1);
                  auVar169 = vandps_avx(auVar169,auVar163);
                  auVar169 = vsubps_avx(auVar159,auVar169);
                  auVar252 = vfmsub231ps_fma(auVar165,auVar169,auVar370);
                  auVar427 = vfnmsub231ps_fma(ZEXT1632(auVar252),auVar169,auVar469);
                  auVar165 = ZEXT1632(auVar427);
                  auVar36._28_4_ = auVar159._28_4_;
                  auVar36._0_28_ =
                       ZEXT1628(CONCAT412(auVar427._12_4_ * auVar427._12_4_,
                                          CONCAT48(auVar427._8_4_ * auVar427._8_4_,
                                                   CONCAT44(auVar427._4_4_ * auVar427._4_4_,
                                                            auVar427._0_4_ * auVar427._0_4_))));
                  auVar491 = ZEXT3264(auVar241);
                  auVar252 = vfmadd213ps_fma(auVar241,auVar165,auVar489);
                  auVar345._8_4_ = 0x3c088908;
                  auVar345._0_8_ = 0x3c0889083c088908;
                  auVar345._12_4_ = 0x3c088908;
                  auVar345._16_4_ = 0x3c088908;
                  auVar345._20_4_ = 0x3c088908;
                  auVar345._24_4_ = 0x3c088908;
                  auVar345._28_4_ = 0x3c088908;
                  auVar252 = vfmadd213ps_fma(ZEXT1632(auVar252),auVar165,auVar345);
                  auVar346._8_4_ = 0x3d2aa9c1;
                  auVar346._0_8_ = 0x3d2aa9c13d2aa9c1;
                  auVar346._12_4_ = 0x3d2aa9c1;
                  auVar346._16_4_ = 0x3d2aa9c1;
                  auVar346._20_4_ = 0x3d2aa9c1;
                  auVar346._24_4_ = 0x3d2aa9c1;
                  auVar346._28_4_ = 0x3d2aa9c1;
                  auVar252 = vfmadd213ps_fma(ZEXT1632(auVar252),auVar165,auVar346);
                  auVar364 = ZEXT3264(auVar488);
                  auVar416 = ZEXT3264(auVar163);
                  auVar116._8_4_ = 0x3e2aaaaa;
                  auVar116._0_8_ = 0x3e2aaaaa3e2aaaaa;
                  auVar116._12_4_ = 0x3e2aaaaa;
                  auVar116._16_4_ = 0x3e2aaaaa;
                  auVar116._20_4_ = 0x3e2aaaaa;
                  auVar116._24_4_ = 0x3e2aaaaa;
                  auVar116._28_4_ = 0x3e2aaaaa;
                  auVar165 = ZEXT1632(auVar427);
                  auVar252 = vfmadd213ps_fma(ZEXT1632(auVar252),auVar165,auVar116);
                  auVar252 = vfmadd213ps_fma(ZEXT1632(auVar252),auVar165,auVar488);
                  auVar377 = vfmadd213ps_fma(ZEXT1632(auVar252),auVar36,auVar165);
                  auVar392._0_4_ = (int)auVar169._0_4_;
                  auVar392._4_4_ = (int)auVar169._4_4_;
                  auVar392._8_4_ = (int)auVar169._8_4_;
                  auVar392._12_4_ = (int)auVar169._12_4_;
                  auVar235._16_4_ = (int)auVar169._16_4_;
                  auVar235._0_16_ = auVar392;
                  auVar235._20_4_ = (int)auVar169._20_4_;
                  auVar235._24_4_ = (int)auVar169._24_4_;
                  auVar235._28_4_ = (int)auVar169._28_4_;
                  auVar427 = vpslld_avx(auVar392,0x17);
                  auVar252 = vpslld_avx(auVar235._16_16_,0x17);
                  auVar91._8_4_ = 0x3f800000;
                  auVar91._0_8_ = 0x3f8000003f800000;
                  auVar91._12_4_ = 0x3f800000;
                  auVar252 = vpaddd_avx(auVar252,auVar91);
                  auVar427 = vpaddd_avx(auVar427,auVar91);
                  auVar236._16_16_ = auVar252;
                  auVar236._0_16_ = auVar427;
                  auVar273._0_4_ = auVar377._0_4_ + fVar89;
                  auVar273._4_4_ = auVar377._4_4_ + fVar88;
                  auVar273._8_4_ = auVar377._8_4_ + fVar518;
                  auVar273._12_4_ = auVar377._12_4_ + fVar250;
                  auVar273._16_4_ = fVar251 + 0.0;
                  auVar273._20_4_ = fVar28 + 0.0;
                  auVar273._24_4_ = fVar176 + 0.0;
                  auVar273._28_4_ = fVar29 + 0.0;
                  auVar252 = vfmadd213ps_fma(auVar236,auVar273,auVar163);
                  auVar169 = vrcpps_avx(ZEXT1632(auVar252));
                  auVar252 = vfmsub213ps_fma(ZEXT1632(auVar252),auVar169,auVar163);
                  auVar252 = vfnmadd132ps_fma(ZEXT1632(auVar252),auVar169,auVar169);
                  auVar117._8_4_ = 0xbf800000;
                  auVar117._0_8_ = 0xbf800000bf800000;
                  auVar117._12_4_ = 0xbf800000;
                  auVar117._16_4_ = 0xbf800000;
                  auVar117._20_4_ = 0xbf800000;
                  auVar117._24_4_ = 0xbf800000;
                  auVar117._28_4_ = 0xbf800000;
                  auVar252 = vfnmadd213ps_fma(ZEXT1632(auVar252),auVar405,auVar117);
                  auVar216 = ZEXT1628(auVar252);
                  goto LAB_00281f01;
                case 6:
                  uVar2 = **(undefined4 **)(&this->field_0x118 + (long)p_Var61);
                  auVar239._4_4_ = uVar2;
                  auVar239._0_4_ = uVar2;
                  auVar239._8_4_ = uVar2;
                  auVar239._12_4_ = uVar2;
                  auVar239._16_4_ = uVar2;
                  auVar239._20_4_ = uVar2;
                  auVar239._24_4_ = uVar2;
                  auVar239._28_4_ = uVar2;
                  uVar2 = (*(undefined4 **)(&this->field_0x118 + (long)p_Var61))[1];
                  auVar277._4_4_ = uVar2;
                  auVar277._0_4_ = uVar2;
                  auVar277._8_4_ = uVar2;
                  auVar277._12_4_ = uVar2;
                  auVar277._16_4_ = uVar2;
                  auVar277._20_4_ = uVar2;
                  auVar277._24_4_ = uVar2;
                  auVar277._28_4_ = uVar2;
                  auVar252 = vfmadd231ps_fma(auVar277,auVar169,auVar239);
                  auVar169 = vmaxps_avx(ZEXT1632(auVar252),_DAT_00558500);
                  auVar169 = vminps_avx(auVar169,auVar163);
                  auVar216 = auVar169._0_28_;
LAB_00281f01:
                  auVar485._0_4_ = auVar216._0_4_ * auVar175._0_4_;
                  auVar485._4_4_ = auVar216._4_4_ * auVar175._4_4_;
                  auVar485._8_4_ = auVar216._8_4_ * auVar175._8_4_;
                  auVar485._12_4_ = auVar216._12_4_ * auVar175._12_4_;
                  auVar485._16_4_ = auVar216._16_4_ * auVar175._16_4_;
                  auVar485._20_4_ = auVar216._20_4_ * auVar175._20_4_;
                  auVar485._24_4_ = auVar216._24_4_ * auVar175._24_4_;
                  auVar169 = auVar485._0_32_;
                }
                *(undefined1 (*) [32])pAVar72 = auVar169;
                pAVar72 = pAVar72 + 4;
                uVar78 = uVar78 + 1;
                iVar53 = iVar53 + 1;
              } while (uVar78 != local_1a8.w);
            }
            iVar70 = iVar70 + 1;
          } while (iVar70 != local_1a8.h);
        }
        local_278 = local_278 + 1;
      } while (local_278 != (long)local_1a8.c);
    }
    if (((uint)local_150 == 8) && (uVar55 == 4)) {
      if ((long)local_1a8.c < 1) goto LAB_002851c2;
      p_Var61 = pp_Var18[-3];
      iVar14 = *(int *)(&this->field_0xdc + (long)p_Var61);
      iVar15 = *(int *)(&this->field_0xe0 + (long)p_Var61);
      iVar65 = *(int *)(&this->field_0xe4 + (long)p_Var61);
      iVar84 = *(int *)(&this->field_0xe8 + (long)p_Var61);
      uVar17 = *(undefined4 *)(&this->field_0x114 + (long)p_Var61);
      lVar79 = *(long *)(&this->field_0x1a8 + (long)p_Var61);
      uVar50 = *(uint *)(&this->field_0xd4 + (long)p_Var61);
      uVar16 = *(uint *)(&this->field_0xd8 + (long)p_Var61);
      local_278 = 0;
      auVar416 = ZEXT1664(ZEXT816(0) << 0x40);
      auVar348._8_4_ = 0x3f000000;
      auVar348._0_8_ = 0x3f0000003f000000;
      auVar348._12_4_ = 0x3f000000;
      auVar364 = ZEXT1664(CONCAT412(0x3f800000,CONCAT48(0x3f800000,0x3f8000003f800000)));
      auVar486._8_4_ = 0x3ab743ce;
      auVar486._0_8_ = 0x3ab743ce3ab743ce;
      auVar486._12_4_ = 0x3ab743ce;
      do {
        if (0 < local_1a8.h) {
          iVar75 = bottom_blob->w;
          iVar77 = bottom_blob->h;
          pAVar72 = (Allocator *)
                    ((long)(_func_int ***)local_1a8.data +
                    local_1a8.cstep * local_278 * local_1a8.elemsize);
          uVar62 = bottom_blob->c;
          iVar70 = 0;
          do {
            if (0 < local_1a8.w) {
              uVar78 = 0;
              iVar53 = (1 - uVar50) * iVar14;
              do {
                if (lVar79 == 0) {
                  auVar135 = ZEXT816(0) << 0x40;
                }
                else {
                  auVar135 = *(undefined1 (*) [16])(lVar79 + local_278 * 0x10);
                }
                auVar426 = ZEXT1664(auVar135);
                if (0 < (int)uVar62) {
                  pvVar86 = (void *)((this->weight_data_tm).cstep * local_278 *
                                     (this->weight_data_tm).elemsize +
                                    (long)(this->weight_data_tm).data);
                  pvVar74 = bottom_blob->data;
                  uVar64 = 0;
                  do {
                    if (0 < (int)uVar16) {
                      uVar83 = 0;
                      uVar67 = 0;
                      do {
                        iVar51 = (((int)uVar67 - uVar16) + 1) * iVar15 + iVar70;
                        if ((((-1 < iVar51) && (iVar52 = iVar51 / iVar84, iVar51 % iVar84 == 0)) &&
                            (0 < (int)uVar50)) && (iVar52 < iVar77)) {
                          lVar82 = (long)iVar52 * (long)bottom_blob->w * bottom_blob->elemsize +
                                   bottom_blob->cstep * bottom_blob->elemsize * uVar64;
                          uVar71 = uVar83;
                          uVar80 = (ulong)uVar50;
                          iVar51 = iVar53;
                          do {
                            if (((-1 < iVar51) && (iVar52 = iVar51 / iVar65, iVar51 % iVar65 == 0))
                               && (iVar52 < iVar75)) {
                              lVar59 = (long)(iVar52 << 3);
                              uVar2 = *(undefined4 *)((long)pvVar74 + lVar59 * 4 + lVar82);
                              auVar177._4_4_ = uVar2;
                              auVar177._0_4_ = uVar2;
                              auVar177._8_4_ = uVar2;
                              auVar177._12_4_ = uVar2;
                              uVar2 = *(undefined4 *)((long)pvVar74 + lVar59 * 4 + lVar82 + 4);
                              auVar287._4_4_ = uVar2;
                              auVar287._0_4_ = uVar2;
                              auVar287._8_4_ = uVar2;
                              auVar287._12_4_ = uVar2;
                              uVar2 = *(undefined4 *)((long)pvVar74 + lVar59 * 4 + lVar82 + 8);
                              auVar375._4_4_ = uVar2;
                              auVar375._0_4_ = uVar2;
                              auVar375._8_4_ = uVar2;
                              auVar375._12_4_ = uVar2;
                              uVar2 = *(undefined4 *)((long)pvVar74 + lVar59 * 4 + lVar82 + 0xc);
                              auVar417._4_4_ = uVar2;
                              auVar417._0_4_ = uVar2;
                              auVar417._8_4_ = uVar2;
                              auVar417._12_4_ = uVar2;
                              uVar2 = *(undefined4 *)((long)pvVar74 + lVar59 * 4 + lVar82 + 0x10);
                              auVar428._4_4_ = uVar2;
                              auVar428._0_4_ = uVar2;
                              auVar428._8_4_ = uVar2;
                              auVar428._12_4_ = uVar2;
                              uVar2 = *(undefined4 *)((long)pvVar74 + lVar59 * 4 + lVar82 + 0x14);
                              auVar493._4_4_ = uVar2;
                              auVar493._0_4_ = uVar2;
                              auVar493._8_4_ = uVar2;
                              auVar493._12_4_ = uVar2;
                              uVar2 = *(undefined4 *)((long)pvVar74 + lVar59 * 4 + lVar82 + 0x18);
                              auVar453._4_4_ = uVar2;
                              auVar453._0_4_ = uVar2;
                              auVar453._8_4_ = uVar2;
                              auVar453._12_4_ = uVar2;
                              uVar2 = *(undefined4 *)((long)pvVar74 + lVar59 * 4 + lVar82 + 0x1c);
                              auVar472._4_4_ = uVar2;
                              auVar472._0_4_ = uVar2;
                              auVar472._8_4_ = uVar2;
                              auVar472._12_4_ = uVar2;
                              uVar60 = uVar71 & 0xffffffff;
                              auVar252 = vfmadd231ps_fma(auVar426._0_16_,auVar177,
                                                         *(undefined1 (*) [16])
                                                          ((long)pvVar86 + uVar60 * 4));
                              auVar252 = vfmadd231ps_fma(auVar252,auVar287,
                                                         *(undefined1 (*) [16])
                                                          ((long)pvVar86 + uVar60 * 4 + 0x10));
                              auVar252 = vfmadd231ps_fma(auVar252,auVar375,
                                                         *(undefined1 (*) [16])
                                                          ((long)pvVar86 + uVar60 * 4 + 0x20));
                              auVar252 = vfmadd231ps_fma(auVar252,auVar417,
                                                         *(undefined1 (*) [16])
                                                          ((long)pvVar86 + uVar60 * 4 + 0x30));
                              auVar252 = vfmadd231ps_fma(auVar252,auVar428,
                                                         *(undefined1 (*) [16])
                                                          ((long)pvVar86 + uVar60 * 4 + 0x40));
                              auVar252 = vfmadd231ps_fma(auVar252,auVar493,
                                                         *(undefined1 (*) [16])
                                                          ((long)pvVar86 + uVar60 * 4 + 0x50));
                              auVar252 = vfmadd231ps_fma(auVar252,auVar453,
                                                         *(undefined1 (*) [16])
                                                          ((long)pvVar86 + uVar60 * 4 + 0x60));
                              auVar252 = vfmadd231ps_fma(auVar252,auVar472,
                                                         *(undefined1 (*) [16])
                                                          ((long)pvVar86 + uVar60 * 4 + 0x70));
                              auVar426 = ZEXT1664(auVar252);
                            }
                            uVar71 = uVar71 + 0x20;
                            iVar51 = iVar51 + iVar14;
                            uVar80 = uVar80 - 1;
                          } while (uVar80 != 0);
                        }
                        uVar67 = uVar67 + 1;
                        uVar83 = uVar83 + (ulong)uVar50 * 0x20;
                      } while (uVar67 != uVar16);
                    }
                    auVar135 = auVar426._0_16_;
                    pvVar86 = (void *)((long)pvVar86 + (long)(int)(uVar50 * uVar16 * 0x20) * 4);
                    uVar64 = uVar64 + 1;
                  } while (uVar64 != uVar62);
                }
                auVar427 = auVar416._0_16_;
                auVar252 = auVar364._0_16_;
                fVar89 = auVar364._0_4_;
                fVar88 = auVar364._4_4_;
                fVar518 = auVar364._8_4_;
                fVar250 = auVar364._12_4_;
                fVar176 = auVar135._4_4_;
                fVar251 = auVar135._8_4_;
                fVar28 = auVar135._12_4_;
                switch(uVar17) {
                case 1:
                  auVar135 = vmaxps_avx(auVar135,auVar427);
                  break;
                case 2:
                  auVar252 = vmaxps_avx(auVar135,auVar427);
                  auVar427 = vminps_avx(auVar135,auVar427);
                  uVar2 = **(undefined4 **)(&this->field_0x118 + (long)p_Var61);
                  auVar138._4_4_ = uVar2;
                  auVar138._0_4_ = uVar2;
                  auVar138._8_4_ = uVar2;
                  auVar138._12_4_ = uVar2;
                  auVar135 = vfmadd213ps_fma(auVar138,auVar427,auVar252);
                  break;
                case 3:
                  uVar2 = **(undefined4 **)(&this->field_0x118 + (long)p_Var61);
                  auVar381._4_4_ = uVar2;
                  auVar381._0_4_ = uVar2;
                  auVar381._8_4_ = uVar2;
                  auVar381._12_4_ = uVar2;
                  uVar2 = (*(undefined4 **)(&this->field_0x118 + (long)p_Var61))[1];
                  auVar496._4_4_ = uVar2;
                  auVar496._0_4_ = uVar2;
                  auVar496._8_4_ = uVar2;
                  auVar496._12_4_ = uVar2;
                  auVar252 = vmaxps_avx(auVar381,auVar135);
                  auVar135 = vminps_avx(auVar496,auVar252);
                  break;
                case 4:
                  auVar136._0_8_ = auVar135._0_8_ ^ 0x8000000080000000;
                  auVar136._8_4_ = -fVar251;
                  auVar136._12_4_ = -fVar28;
                  auVar183._8_4_ = 0x42b0c0a5;
                  auVar183._0_8_ = 0x42b0c0a542b0c0a5;
                  auVar183._12_4_ = 0x42b0c0a5;
                  auVar427 = vminps_avx(auVar136,auVar183);
                  auVar184._8_4_ = 0xc2b0c0a5;
                  auVar184._0_8_ = 0xc2b0c0a5c2b0c0a5;
                  auVar184._12_4_ = 0xc2b0c0a5;
                  auVar149 = vmaxps_avx(auVar427,auVar184);
                  auVar382._8_4_ = 0x3fb8aa3b;
                  auVar382._0_8_ = 0x3fb8aa3b3fb8aa3b;
                  auVar382._12_4_ = 0x3fb8aa3b;
                  auVar427 = vfmadd213ps_fma(auVar382,auVar149,auVar348);
                  auVar497._0_4_ = (int)auVar427._0_4_;
                  auVar497._4_4_ = (int)auVar427._4_4_;
                  auVar497._8_4_ = (int)auVar427._8_4_;
                  auVar497._12_4_ = (int)auVar427._12_4_;
                  auVar377 = vcvtdq2ps_avx(auVar497);
                  auVar427 = vcmpps_avx(auVar427,auVar377,1);
                  auVar427 = vandps_avx(auVar427,auVar252);
                  auVar427 = vsubps_avx(auVar377,auVar427);
                  auVar94._8_4_ = 0x3f318000;
                  auVar94._0_8_ = 0x3f3180003f318000;
                  auVar94._12_4_ = 0x3f318000;
                  auVar377 = vfmsub231ps_fma(auVar149,auVar427,auVar94);
                  auVar185._8_4_ = 0x395e8083;
                  auVar185._0_8_ = 0x395e8083395e8083;
                  auVar185._12_4_ = 0x395e8083;
                  auVar149 = vfmsub231ps_fma(auVar377,auVar427,auVar185);
                  auVar498._0_4_ = auVar149._0_4_ * auVar149._0_4_;
                  auVar498._4_4_ = auVar149._4_4_ * auVar149._4_4_;
                  auVar498._8_4_ = auVar149._8_4_ * auVar149._8_4_;
                  auVar498._12_4_ = auVar149._12_4_ * auVar149._12_4_;
                  auVar430._8_4_ = 0x39506967;
                  auVar430._0_8_ = 0x3950696739506967;
                  auVar430._12_4_ = 0x39506967;
                  auVar186._8_4_ = 0x3ab743ce;
                  auVar186._0_8_ = 0x3ab743ce3ab743ce;
                  auVar186._12_4_ = 0x3ab743ce;
                  auVar377 = vfmadd213ps_fma(auVar430,auVar149,auVar186);
                  auVar187._8_4_ = 0x3c088908;
                  auVar187._0_8_ = 0x3c0889083c088908;
                  auVar187._12_4_ = 0x3c088908;
                  auVar377 = vfmadd213ps_fma(auVar377,auVar149,auVar187);
                  auVar95._8_4_ = 0x3d2aa9c1;
                  auVar95._0_8_ = 0x3d2aa9c13d2aa9c1;
                  auVar95._12_4_ = 0x3d2aa9c1;
                  auVar377 = vfmadd213ps_fma(auVar377,auVar149,auVar95);
                  auVar96._8_4_ = 0x3e2aaaaa;
                  auVar96._0_8_ = 0x3e2aaaaa3e2aaaaa;
                  auVar96._12_4_ = 0x3e2aaaaa;
                  auVar377 = vfmadd213ps_fma(auVar377,auVar149,auVar96);
                  auVar377 = vfmadd213ps_fma(auVar377,auVar149,auVar348);
                  auVar377 = vfmadd213ps_fma(auVar377,auVar498,auVar149);
                  auVar431._0_4_ = auVar377._0_4_ + fVar89;
                  auVar431._4_4_ = auVar377._4_4_ + fVar88;
                  auVar431._8_4_ = auVar377._8_4_ + fVar518;
                  auVar431._12_4_ = auVar377._12_4_ + fVar250;
                  auVar137._0_4_ = (int)auVar427._0_4_;
                  auVar137._4_4_ = (int)auVar427._4_4_;
                  auVar137._8_4_ = (int)auVar427._8_4_;
                  auVar137._12_4_ = (int)auVar427._12_4_;
                  auVar427 = vpslld_avx(auVar137,0x17);
                  auVar427 = vpaddd_avx(auVar427,auVar252);
                  auVar377 = vfmadd213ps_fma(auVar427,auVar431,auVar252);
                  auVar427 = vrcpps_avx(auVar377);
                  auVar252 = vfmsub213ps_fma(auVar377,auVar427,auVar252);
                  auVar135 = vfnmadd132ps_fma(auVar252,auVar427,auVar427);
                  break;
                case 5:
                  auVar454._8_4_ = 0x42b0c0a5;
                  auVar454._0_8_ = 0x42b0c0a542b0c0a5;
                  auVar454._12_4_ = 0x42b0c0a5;
                  auVar427 = vminps_avx(auVar454,auVar135);
                  auVar473._8_4_ = 0xc2b0c0a5;
                  auVar473._0_8_ = 0xc2b0c0a5c2b0c0a5;
                  auVar473._12_4_ = 0xc2b0c0a5;
                  auVar149 = vmaxps_avx(auVar427,auVar473);
                  auVar480._8_4_ = 0x3fb8aa3b;
                  auVar480._0_8_ = 0x3fb8aa3b3fb8aa3b;
                  auVar480._12_4_ = 0x3fb8aa3b;
                  auVar427 = vfmadd213ps_fma(auVar480,auVar149,auVar348);
                  auVar494._0_4_ = (int)auVar427._0_4_;
                  auVar494._4_4_ = (int)auVar427._4_4_;
                  auVar494._8_4_ = (int)auVar427._8_4_;
                  auVar494._12_4_ = (int)auVar427._12_4_;
                  auVar377 = vcvtdq2ps_avx(auVar494);
                  auVar427 = vcmpps_avx(auVar427,auVar377,1);
                  auVar427 = vandps_avx(auVar427,auVar252);
                  auVar427 = vsubps_avx(auVar377,auVar427);
                  auVar455._8_4_ = 0x3f318000;
                  auVar455._0_8_ = 0x3f3180003f318000;
                  auVar455._12_4_ = 0x3f318000;
                  auVar377 = vfmsub231ps_fma(auVar149,auVar427,auVar455);
                  auVar474._8_4_ = 0xb95e8083;
                  auVar474._0_8_ = 0xb95e8083b95e8083;
                  auVar474._12_4_ = 0xb95e8083;
                  auVar149 = vfnmsub231ps_fma(auVar377,auVar427,auVar474);
                  auVar495._0_4_ = auVar149._0_4_ * auVar149._0_4_;
                  auVar495._4_4_ = auVar149._4_4_ * auVar149._4_4_;
                  auVar495._8_4_ = auVar149._8_4_ * auVar149._8_4_;
                  auVar495._12_4_ = auVar149._12_4_ * auVar149._12_4_;
                  auVar365._8_4_ = 0x39506967;
                  auVar365._0_8_ = 0x3950696739506967;
                  auVar365._12_4_ = 0x39506967;
                  auVar377 = vfmadd213ps_fma(auVar365,auVar149,auVar486);
                  auVar253._8_4_ = 0x3c088908;
                  auVar253._0_8_ = 0x3c0889083c088908;
                  auVar253._12_4_ = 0x3c088908;
                  auVar377 = vfmadd213ps_fma(auVar377,auVar149,auVar253);
                  auVar359._8_4_ = 0x3d2aa9c1;
                  auVar359._0_8_ = 0x3d2aa9c13d2aa9c1;
                  auVar359._12_4_ = 0x3d2aa9c1;
                  auVar377 = vfmadd213ps_fma(auVar377,auVar149,auVar359);
                  auVar254._8_4_ = 0x3e2aaaaa;
                  auVar254._0_8_ = 0x3e2aaaaa3e2aaaaa;
                  auVar254._12_4_ = 0x3e2aaaaa;
                  auVar377 = vfmadd213ps_fma(auVar377,auVar149,auVar254);
                  auVar377 = vfmadd213ps_fma(auVar377,auVar149,auVar348);
                  auVar377 = vfmadd213ps_fma(auVar377,auVar495,auVar149);
                  auVar178._0_4_ = auVar377._0_4_ + fVar89;
                  auVar178._4_4_ = auVar377._4_4_ + fVar88;
                  auVar178._8_4_ = auVar377._8_4_ + fVar518;
                  auVar178._12_4_ = auVar377._12_4_ + fVar250;
                  auVar376._0_4_ = (int)auVar427._0_4_;
                  auVar376._4_4_ = (int)auVar427._4_4_;
                  auVar376._8_4_ = (int)auVar427._8_4_;
                  auVar376._12_4_ = (int)auVar427._12_4_;
                  auVar427 = vpslld_avx(auVar376,0x17);
                  auVar427 = vpaddd_avx(auVar427,auVar252);
                  auVar90 = vfmadd213ps_fma(auVar427,auVar178,auVar252);
                  auVar179._8_4_ = 0x800000;
                  auVar179._0_8_ = 0x80000000800000;
                  auVar179._12_4_ = 0x800000;
                  auVar427 = vmaxps_avx(auVar90,auVar179);
                  auVar377 = vpsrld_avx(auVar427,0x17);
                  auVar288._8_4_ = 0xffffff82;
                  auVar288._0_8_ = 0xffffff82ffffff82;
                  auVar288._12_4_ = 0xffffff82;
                  auVar377 = vpaddd_avx(auVar377,auVar288);
                  auVar289._8_4_ = 0x807fffff;
                  auVar289._0_8_ = 0x807fffff807fffff;
                  auVar289._12_4_ = 0x807fffff;
                  auVar427 = vandps_avx(auVar427,auVar289);
                  auVar451 = vorps_avx(auVar427,auVar348);
                  auVar149 = vcvtdq2ps_avx(auVar377);
                  auVar290._8_4_ = 0x3f3504f3;
                  auVar290._0_8_ = 0x3f3504f33f3504f3;
                  auVar290._12_4_ = 0x3f3504f3;
                  auVar377 = vcmpps_avx(auVar451,auVar290,1);
                  auVar427 = vandps_avx(auVar377,auVar451);
                  auVar180._0_4_ = auVar427._0_4_ + auVar451._0_4_ + -1.0;
                  auVar180._4_4_ = auVar427._4_4_ + auVar451._4_4_ + -1.0;
                  auVar180._8_4_ = auVar427._8_4_ + auVar451._8_4_ + -1.0;
                  auVar180._12_4_ = auVar427._12_4_ + auVar451._12_4_ + -1.0;
                  auVar427 = vandps_avx(auVar377,auVar252);
                  auVar377 = vsubps_avx(auVar149,auVar427);
                  auVar418._0_4_ = auVar180._0_4_ * auVar180._0_4_;
                  auVar418._4_4_ = auVar180._4_4_ * auVar180._4_4_;
                  auVar418._8_4_ = auVar180._8_4_ * auVar180._8_4_;
                  auVar418._12_4_ = auVar180._12_4_ * auVar180._12_4_;
                  auVar429._8_4_ = 0x3d9021bb;
                  auVar429._0_8_ = 0x3d9021bb3d9021bb;
                  auVar429._12_4_ = 0x3d9021bb;
                  auVar291._8_4_ = 0xbdebd1b8;
                  auVar291._0_8_ = 0xbdebd1b8bdebd1b8;
                  auVar291._12_4_ = 0xbdebd1b8;
                  auVar427 = vfmadd213ps_fma(auVar429,auVar180,auVar291);
                  auVar292._8_4_ = 0x3def251a;
                  auVar292._0_8_ = 0x3def251a3def251a;
                  auVar292._12_4_ = 0x3def251a;
                  auVar427 = vfmadd213ps_fma(auVar427,auVar180,auVar292);
                  auVar293._8_4_ = 0xbdfe5d4f;
                  auVar293._0_8_ = 0xbdfe5d4fbdfe5d4f;
                  auVar293._12_4_ = 0xbdfe5d4f;
                  auVar427 = vfmadd213ps_fma(auVar427,auVar180,auVar293);
                  auVar294._8_4_ = 0x3e11e9bf;
                  auVar294._0_8_ = 0x3e11e9bf3e11e9bf;
                  auVar294._12_4_ = 0x3e11e9bf;
                  auVar427 = vfmadd213ps_fma(auVar427,auVar180,auVar294);
                  auVar295._8_4_ = 0xbe2aae50;
                  auVar295._0_8_ = 0xbe2aae50be2aae50;
                  auVar295._12_4_ = 0xbe2aae50;
                  auVar427 = vfmadd213ps_fma(auVar427,auVar180,auVar295);
                  auVar296._8_4_ = 0x3e4cceac;
                  auVar296._0_8_ = 0x3e4cceac3e4cceac;
                  auVar296._12_4_ = 0x3e4cceac;
                  auVar427 = vfmadd213ps_fma(auVar427,auVar180,auVar296);
                  auVar297._8_4_ = 0xbe7ffffc;
                  auVar297._0_8_ = 0xbe7ffffcbe7ffffc;
                  auVar297._12_4_ = 0xbe7ffffc;
                  auVar427 = vfmadd213ps_fma(auVar427,auVar180,auVar297);
                  auVar298._8_4_ = 0x3eaaaaaa;
                  auVar298._0_8_ = 0x3eaaaaaa3eaaaaaa;
                  auVar298._12_4_ = 0x3eaaaaaa;
                  auVar427 = vfmadd213ps_fma(auVar427,auVar180,auVar298);
                  auVar299._0_4_ = auVar427._0_4_ * auVar418._0_4_ * auVar180._0_4_;
                  auVar299._4_4_ = auVar427._4_4_ * auVar418._4_4_ * auVar180._4_4_;
                  auVar299._8_4_ = auVar427._8_4_ * auVar418._8_4_ * auVar180._8_4_;
                  auVar299._12_4_ = auVar427._12_4_ * auVar418._12_4_ * auVar180._12_4_;
                  auVar427 = vfmadd231ps_fma(auVar299,auVar377,auVar474);
                  auVar149 = vfmsub231ps_fma(auVar427,auVar348,auVar418);
                  auVar427 = vcmpps_avx(auVar90,_DAT_005530d0,2);
                  auVar149 = vsubps_avx(auVar149,auVar180);
                  auVar377 = vfnmadd231ps_fma(auVar149,auVar455,auVar377);
                  auVar181._0_4_ = auVar377._0_4_ + auVar377._0_4_;
                  auVar181._4_4_ = auVar377._4_4_ + auVar377._4_4_;
                  auVar181._8_4_ = auVar377._8_4_ + auVar377._8_4_;
                  auVar181._12_4_ = auVar377._12_4_ + auVar377._12_4_;
                  auVar300._8_4_ = 0x7fffffff;
                  auVar300._0_8_ = 0x7fffffff7fffffff;
                  auVar300._12_4_ = 0x7fffffff;
                  auVar427 = vblendvps_avx(auVar181,auVar300,auVar427);
                  auVar301._8_4_ = 0x42b0c0a5;
                  auVar301._0_8_ = 0x42b0c0a542b0c0a5;
                  auVar301._12_4_ = 0x42b0c0a5;
                  auVar427 = vminps_avx(auVar427,auVar301);
                  auVar302._8_4_ = 0xc2b0c0a5;
                  auVar302._0_8_ = 0xc2b0c0a5c2b0c0a5;
                  auVar302._12_4_ = 0xc2b0c0a5;
                  auVar149 = vmaxps_avx(auVar427,auVar302);
                  auVar427 = vfmadd213ps_fma(auVar480,auVar149,auVar348);
                  auVar378._0_4_ = (int)auVar427._0_4_;
                  auVar378._4_4_ = (int)auVar427._4_4_;
                  auVar378._8_4_ = (int)auVar427._8_4_;
                  auVar378._12_4_ = (int)auVar427._12_4_;
                  auVar377 = vcvtdq2ps_avx(auVar378);
                  auVar427 = vcmpps_avx(auVar427,auVar377,1);
                  auVar427 = vandps_avx(auVar427,auVar252);
                  auVar427 = vsubps_avx(auVar377,auVar427);
                  auVar377 = vfmsub231ps_fma(auVar149,auVar427,auVar455);
                  auVar149 = vfnmsub231ps_fma(auVar377,auVar427,auVar474);
                  auVar379._0_4_ = auVar149._0_4_ * auVar149._0_4_;
                  auVar379._4_4_ = auVar149._4_4_ * auVar149._4_4_;
                  auVar379._8_4_ = auVar149._8_4_ * auVar149._8_4_;
                  auVar379._12_4_ = auVar149._12_4_ * auVar149._12_4_;
                  auVar377 = vfmadd213ps_fma(auVar365,auVar149,auVar486);
                  auVar366._8_4_ = 0x3c088908;
                  auVar366._0_8_ = 0x3c0889083c088908;
                  auVar366._12_4_ = 0x3c088908;
                  auVar377 = vfmadd213ps_fma(auVar377,auVar149,auVar366);
                  auVar416 = ZEXT864(0);
                  auVar377 = vfmadd213ps_fma(auVar377,auVar149,auVar359);
                  auVar364 = ZEXT1664(auVar252);
                  auVar377 = vfmadd213ps_fma(auVar377,auVar149,auVar254);
                  auVar377 = vfmadd213ps_fma(auVar377,auVar149,auVar348);
                  auVar377 = vfmadd213ps_fma(auVar377,auVar379,auVar149);
                  auVar182._0_4_ = auVar377._0_4_ + fVar89;
                  auVar182._4_4_ = auVar377._4_4_ + fVar88;
                  auVar182._8_4_ = auVar377._8_4_ + fVar518;
                  auVar182._12_4_ = auVar377._12_4_ + fVar250;
                  auVar303._0_4_ = (int)auVar427._0_4_;
                  auVar303._4_4_ = (int)auVar427._4_4_;
                  auVar303._8_4_ = (int)auVar427._8_4_;
                  auVar303._12_4_ = (int)auVar427._12_4_;
                  auVar427 = vpslld_avx(auVar303,0x17);
                  auVar427 = vpaddd_avx(auVar427,auVar252);
                  auVar427 = vfmadd213ps_fma(auVar427,auVar182,auVar252);
                  auVar252 = vrcpps_avx(auVar427);
                  auVar380._0_4_ = auVar252._0_4_ + auVar252._0_4_;
                  auVar380._4_4_ = auVar252._4_4_ + auVar252._4_4_;
                  auVar380._8_4_ = auVar252._8_4_ + auVar252._8_4_;
                  auVar380._12_4_ = auVar252._12_4_ + auVar252._12_4_;
                  auVar93._8_4_ = 0x40000000;
                  auVar93._0_8_ = 0x4000000040000000;
                  auVar93._12_4_ = 0x40000000;
                  auVar427 = vfmsub213ps_fma(auVar427,auVar380,auVar93);
                  auVar252 = vfnmadd213ps_fma(auVar427,auVar252,auVar380);
                  auVar135 = vfmsub231ps_fma(auVar135,auVar135,auVar252);
                  break;
                case 6:
                  uVar2 = **(undefined4 **)(&this->field_0x118 + (long)p_Var61);
                  auVar188._4_4_ = uVar2;
                  auVar188._0_4_ = uVar2;
                  auVar188._8_4_ = uVar2;
                  auVar188._12_4_ = uVar2;
                  uVar2 = (*(undefined4 **)(&this->field_0x118 + (long)p_Var61))[1];
                  auVar304._4_4_ = uVar2;
                  auVar304._0_4_ = uVar2;
                  auVar304._8_4_ = uVar2;
                  auVar304._12_4_ = uVar2;
                  auVar377 = vfmadd231ps_fma(auVar304,auVar135,auVar188);
                  auVar427 = vmaxps_avx(auVar377,auVar427);
                  auVar252 = vminps_avx(auVar427,auVar252);
                  auVar135._0_4_ = auVar252._0_4_ * auVar135._0_4_;
                  auVar135._4_4_ = auVar252._4_4_ * fVar176;
                  auVar135._8_4_ = auVar252._8_4_ * fVar251;
                  auVar135._12_4_ = auVar252._12_4_ * fVar28;
                }
                *(undefined1 (*) [16])pAVar72 = auVar135;
                pAVar72 = pAVar72 + 2;
                uVar78 = uVar78 + 1;
                iVar53 = iVar53 + 1;
              } while (uVar78 != local_1a8.w);
            }
            iVar70 = iVar70 + 1;
          } while (iVar70 != local_1a8.h);
        }
        local_278 = local_278 + 1;
      } while (local_278 != (long)local_1a8.c);
    }
    if (((uint)local_150 == 1) && (uVar55 == 8)) {
      if ((long)local_1a8.c < 1) goto LAB_002851c2;
      p_Var61 = pp_Var18[-3];
      iVar14 = *(int *)(&this->field_0xdc + (long)p_Var61);
      iVar15 = *(int *)(&this->field_0xe0 + (long)p_Var61);
      iVar65 = *(int *)(&this->field_0xe4 + (long)p_Var61);
      iVar84 = *(int *)(&this->field_0xe8 + (long)p_Var61);
      uVar17 = *(undefined4 *)(&this->field_0x114 + (long)p_Var61);
      lVar79 = *(long *)(&this->field_0x1a8 + (long)p_Var61);
      uVar50 = *(uint *)(&this->field_0xd4 + (long)p_Var61);
      uVar16 = *(uint *)(&this->field_0xd8 + (long)p_Var61);
      local_278 = 0;
      auVar416 = ZEXT3264(CONCAT428(0xc2b0c0a5,
                                    CONCAT424(0xc2b0c0a5,
                                              CONCAT420(0xc2b0c0a5,
                                                        CONCAT416(0xc2b0c0a5,
                                                                  CONCAT412(0xc2b0c0a5,
                                                                            CONCAT48(0xc2b0c0a5,
                                                                                                                                                                          
                                                  0xc2b0c0a5c2b0c0a5)))))));
      auVar362._8_4_ = 0x3f000000;
      auVar362._0_8_ = 0x3f0000003f000000;
      auVar362._12_4_ = 0x3f000000;
      auVar362._16_4_ = 0x3f000000;
      auVar362._20_4_ = 0x3f000000;
      auVar362._24_4_ = 0x3f000000;
      auVar362._28_4_ = 0x3f000000;
      auVar426 = ZEXT3264(CONCAT428(0x3fb8aa3b,
                                    CONCAT424(0x3fb8aa3b,
                                              CONCAT420(0x3fb8aa3b,
                                                        CONCAT416(0x3fb8aa3b,
                                                                  CONCAT412(0x3fb8aa3b,
                                                                            CONCAT48(0x3fb8aa3b,
                                                                                                                                                                          
                                                  0x3fb8aa3b3fb8aa3b)))))));
      auVar364 = ZEXT3264(CONCAT428(0x3f800000,
                                    CONCAT424(0x3f800000,
                                              CONCAT420(0x3f800000,
                                                        CONCAT416(0x3f800000,
                                                                  CONCAT412(0x3f800000,
                                                                            CONCAT48(0x3f800000,
                                                                                                                                                                          
                                                  0x3f8000003f800000)))))));
      auVar174 = ZEXT3264(CONCAT428(0x39506967,
                                    CONCAT424(0x39506967,
                                              CONCAT420(0x39506967,
                                                        CONCAT416(0x39506967,
                                                                  CONCAT412(0x39506967,
                                                                            CONCAT48(0x39506967,
                                                                                                                                                                          
                                                  0x3950696739506967)))))));
      do {
        if (0 < local_1a8.h) {
          iVar75 = bottom_blob->w;
          iVar77 = bottom_blob->h;
          pAVar72 = (Allocator *)
                    ((long)(_func_int ***)local_1a8.data +
                    local_1a8.cstep * local_278 * local_1a8.elemsize);
          uVar62 = bottom_blob->c;
          local_250 = 0;
          do {
            if (0 < local_1a8.w) {
              uVar78 = 0;
              iVar70 = (1 - uVar50) * iVar14;
              do {
                if (lVar79 == 0) {
                  auVar491 = ZEXT1664(ZEXT816(0) << 0x40);
                }
                else {
                  auVar491 = ZEXT3264(*(undefined1 (*) [32])(lVar79 + local_278 * 0x20));
                }
                if (0 < (int)uVar62) {
                  pvVar86 = (void *)((this->weight_data_tm).cstep * local_278 *
                                     (this->weight_data_tm).elemsize +
                                    (long)(this->weight_data_tm).data);
                  uVar64 = 0;
                  do {
                    if (0 < (int)uVar16) {
                      uVar67 = 0;
                      uVar83 = 0;
                      do {
                        iVar53 = (((int)uVar83 - uVar16) + 1) * iVar15 + local_250;
                        if ((((-1 < iVar53) && (iVar51 = iVar53 / iVar84, iVar53 % iVar84 == 0)) &&
                            (iVar51 < iVar77)) && (0 < (int)uVar50)) {
                          uVar71 = uVar67;
                          uVar80 = (ulong)uVar50;
                          iVar53 = iVar70;
                          do {
                            if (((-1 < iVar53) && (iVar52 = iVar53 / iVar65, iVar53 % iVar65 == 0))
                               && (iVar52 < iVar75)) {
                              uVar2 = *(undefined4 *)
                                       ((long)bottom_blob->data +
                                       (long)iVar52 * 4 +
                                       (long)iVar51 * (long)bottom_blob->w * bottom_blob->elemsize +
                                       bottom_blob->cstep * bottom_blob->elemsize * uVar64);
                              auVar240._4_4_ = uVar2;
                              auVar240._0_4_ = uVar2;
                              auVar240._8_4_ = uVar2;
                              auVar240._12_4_ = uVar2;
                              auVar240._16_4_ = uVar2;
                              auVar240._20_4_ = uVar2;
                              auVar240._24_4_ = uVar2;
                              auVar240._28_4_ = uVar2;
                              auVar252 = vfmadd231ps_fma(auVar491._0_32_,auVar240,
                                                         *(undefined1 (*) [32])
                                                          ((long)pvVar86 + (uVar71 & 0xffffffff) * 4
                                                          ));
                              auVar491 = ZEXT1664(auVar252);
                            }
                            uVar71 = uVar71 + 8;
                            iVar53 = iVar53 + iVar14;
                            uVar80 = uVar80 - 1;
                          } while (uVar80 != 0);
                        }
                        uVar83 = uVar83 + 1;
                        uVar67 = uVar67 + (ulong)uVar50 * 8;
                      } while (uVar83 != uVar16);
                    }
                    pvVar86 = (void *)((long)pvVar86 + (long)(int)(uVar50 * uVar16 * 8) * 4);
                    uVar64 = uVar64 + 1;
                  } while (uVar64 != uVar62);
                }
                auVar169 = auVar491._0_32_;
                auVar488 = auVar364._0_32_;
                auVar159 = auVar174._0_32_;
                auVar163 = auVar416._0_32_;
                auVar165 = auVar426._0_32_;
                fVar89 = auVar364._0_4_;
                fVar88 = auVar364._4_4_;
                fVar518 = auVar364._8_4_;
                fVar250 = auVar364._12_4_;
                fVar251 = auVar364._16_4_;
                fVar28 = auVar364._20_4_;
                fVar176 = auVar364._24_4_;
                fVar29 = auVar364._28_4_;
                auVar175._28_36_ = auVar491._28_36_;
                switch(uVar17) {
                case 1:
                  auVar169 = vmaxps_avx(auVar169,_DAT_00558500);
                  break;
                case 2:
                  auVar488 = vmaxps_avx(auVar169,ZEXT1632(ZEXT816(0) << 0x40));
                  auVar169 = vminps_avx(auVar169,ZEXT1632(ZEXT816(0) << 0x40));
                  uVar2 = **(undefined4 **)(&this->field_0x118 + (long)p_Var61);
                  auVar173._4_4_ = uVar2;
                  auVar173._0_4_ = uVar2;
                  auVar173._8_4_ = uVar2;
                  auVar173._12_4_ = uVar2;
                  auVar173._16_4_ = uVar2;
                  auVar173._20_4_ = uVar2;
                  auVar173._24_4_ = uVar2;
                  auVar173._28_4_ = uVar2;
                  auVar252 = vfmadd213ps_fma(auVar173,auVar169,auVar488);
                  auVar169 = ZEXT1632(auVar252);
                  break;
                case 3:
                  uVar2 = **(undefined4 **)(&this->field_0x118 + (long)p_Var61);
                  auVar247._4_4_ = uVar2;
                  auVar247._0_4_ = uVar2;
                  auVar247._8_4_ = uVar2;
                  auVar247._12_4_ = uVar2;
                  auVar247._16_4_ = uVar2;
                  auVar247._20_4_ = uVar2;
                  auVar247._24_4_ = uVar2;
                  auVar247._28_4_ = uVar2;
                  uVar2 = (*(undefined4 **)(&this->field_0x118 + (long)p_Var61))[1];
                  auVar516._4_4_ = uVar2;
                  auVar516._0_4_ = uVar2;
                  auVar516._8_4_ = uVar2;
                  auVar516._12_4_ = uVar2;
                  auVar516._16_4_ = uVar2;
                  auVar516._20_4_ = uVar2;
                  auVar516._24_4_ = uVar2;
                  auVar516._28_4_ = uVar2;
                  auVar169 = vmaxps_avx(auVar169,auVar247);
                  auVar169 = vminps_avx(auVar516,auVar169);
                  break;
                case 4:
                  auVar170._0_8_ = auVar491._0_8_ ^ 0x8000000080000000;
                  auVar170._8_4_ = -auVar491._8_4_;
                  auVar170._12_4_ = -auVar491._12_4_;
                  auVar170._16_4_ = -auVar491._16_4_;
                  auVar170._20_4_ = -auVar491._20_4_;
                  auVar170._24_4_ = -auVar491._24_4_;
                  auVar170._28_4_ = auVar491._28_4_ ^ 0x80000000;
                  auVar130._8_4_ = 0x42b0c0a5;
                  auVar130._0_8_ = 0x42b0c0a542b0c0a5;
                  auVar130._12_4_ = 0x42b0c0a5;
                  auVar130._16_4_ = 0x42b0c0a5;
                  auVar130._20_4_ = 0x42b0c0a5;
                  auVar130._24_4_ = 0x42b0c0a5;
                  auVar130._28_4_ = 0x42b0c0a5;
                  auVar169 = vminps_avx(auVar170,auVar130);
                  auVar163 = vmaxps_avx(auVar163,auVar169);
                  auVar252 = vfmadd213ps_fma(auVar165,auVar163,auVar362);
                  auVar165 = vroundps_avx(ZEXT1632(auVar252),1);
                  auVar169 = vcmpps_avx(ZEXT1632(auVar252),auVar165,1);
                  auVar169 = vandps_avx(auVar169,auVar488);
                  auVar169 = vsubps_avx(auVar165,auVar169);
                  auVar131._8_4_ = 0x3f318000;
                  auVar131._0_8_ = 0x3f3180003f318000;
                  auVar131._12_4_ = 0x3f318000;
                  auVar131._16_4_ = 0x3f318000;
                  auVar131._20_4_ = 0x3f318000;
                  auVar131._24_4_ = 0x3f318000;
                  auVar131._28_4_ = 0x3f318000;
                  auVar252 = vfmsub231ps_fma(auVar163,auVar169,auVar131);
                  auVar282._8_4_ = 0x395e8083;
                  auVar282._0_8_ = 0x395e8083395e8083;
                  auVar282._12_4_ = 0x395e8083;
                  auVar282._16_4_ = 0x395e8083;
                  auVar282._20_4_ = 0x395e8083;
                  auVar282._24_4_ = 0x395e8083;
                  auVar282._28_4_ = 0x395e8083;
                  auVar427 = vfmsub231ps_fma(ZEXT1632(auVar252),auVar169,auVar282);
                  auVar163 = ZEXT1632(auVar427);
                  auVar41._28_4_ = auVar165._28_4_;
                  auVar41._0_28_ =
                       ZEXT1628(CONCAT412(auVar427._12_4_ * auVar427._12_4_,
                                          CONCAT48(auVar427._8_4_ * auVar427._8_4_,
                                                   CONCAT44(auVar427._4_4_ * auVar427._4_4_,
                                                            auVar427._0_4_ * auVar427._0_4_))));
                  auVar132._8_4_ = 0x3ab743ce;
                  auVar132._0_8_ = 0x3ab743ce3ab743ce;
                  auVar132._12_4_ = 0x3ab743ce;
                  auVar132._16_4_ = 0x3ab743ce;
                  auVar132._20_4_ = 0x3ab743ce;
                  auVar132._24_4_ = 0x3ab743ce;
                  auVar132._28_4_ = 0x3ab743ce;
                  auVar252 = vfmadd213ps_fma(auVar159,auVar163,auVar132);
                  auVar283._8_4_ = 0x3c088908;
                  auVar283._0_8_ = 0x3c0889083c088908;
                  auVar283._12_4_ = 0x3c088908;
                  auVar283._16_4_ = 0x3c088908;
                  auVar283._20_4_ = 0x3c088908;
                  auVar283._24_4_ = 0x3c088908;
                  auVar283._28_4_ = 0x3c088908;
                  auVar252 = vfmadd213ps_fma(ZEXT1632(auVar252),auVar163,auVar283);
                  auVar284._8_4_ = 0x3d2aa9c1;
                  auVar284._0_8_ = 0x3d2aa9c13d2aa9c1;
                  auVar284._12_4_ = 0x3d2aa9c1;
                  auVar284._16_4_ = 0x3d2aa9c1;
                  auVar284._20_4_ = 0x3d2aa9c1;
                  auVar284._24_4_ = 0x3d2aa9c1;
                  auVar284._28_4_ = 0x3d2aa9c1;
                  auVar252 = vfmadd213ps_fma(ZEXT1632(auVar252),auVar163,auVar284);
                  auVar285._8_4_ = 0x3e2aaaaa;
                  auVar285._0_8_ = 0x3e2aaaaa3e2aaaaa;
                  auVar285._12_4_ = 0x3e2aaaaa;
                  auVar285._16_4_ = 0x3e2aaaaa;
                  auVar285._20_4_ = 0x3e2aaaaa;
                  auVar285._24_4_ = 0x3e2aaaaa;
                  auVar285._28_4_ = 0x3e2aaaaa;
                  auVar163 = ZEXT1632(auVar427);
                  auVar252 = vfmadd213ps_fma(ZEXT1632(auVar252),auVar163,auVar285);
                  auVar252 = vfmadd213ps_fma(ZEXT1632(auVar252),auVar163,auVar362);
                  auVar377 = vfmadd213ps_fma(ZEXT1632(auVar252),auVar41,auVar163);
                  auVar139._0_4_ = (int)auVar169._0_4_;
                  auVar139._4_4_ = (int)auVar169._4_4_;
                  auVar139._8_4_ = (int)auVar169._8_4_;
                  auVar139._12_4_ = (int)auVar169._12_4_;
                  auVar171._16_4_ = (int)auVar169._16_4_;
                  auVar171._0_16_ = auVar139;
                  auVar171._20_4_ = (int)auVar169._20_4_;
                  auVar171._24_4_ = (int)auVar169._24_4_;
                  auVar171._28_4_ = (int)auVar169._28_4_;
                  auVar427 = vpslld_avx(auVar139,0x17);
                  auVar252 = vpslld_avx(auVar171._16_16_,0x17);
                  auVar256._8_4_ = 0x3f800000;
                  auVar256._0_8_ = 0x3f8000003f800000;
                  auVar256._12_4_ = 0x3f800000;
                  auVar252 = vpaddd_avx(auVar252,auVar256);
                  auVar427 = vpaddd_avx(auVar427,auVar256);
                  auVar172._16_16_ = auVar252;
                  auVar172._0_16_ = auVar427;
                  auVar248._0_4_ = auVar377._0_4_ + fVar89;
                  auVar248._4_4_ = auVar377._4_4_ + fVar88;
                  auVar248._8_4_ = auVar377._8_4_ + fVar518;
                  auVar248._12_4_ = auVar377._12_4_ + fVar250;
                  auVar248._16_4_ = fVar251 + 0.0;
                  auVar248._20_4_ = fVar28 + 0.0;
                  auVar248._24_4_ = fVar176 + 0.0;
                  auVar248._28_4_ = fVar29 + 0.0;
                  auVar252 = vfmadd213ps_fma(auVar172,auVar248,auVar488);
                  auVar169 = vrcpps_avx(ZEXT1632(auVar252));
                  auVar252 = vfmsub213ps_fma(ZEXT1632(auVar252),auVar169,auVar488);
                  auVar252 = vfnmadd132ps_fma(ZEXT1632(auVar252),auVar169,auVar169);
                  auVar169 = ZEXT1632(auVar252);
                  break;
                case 5:
                  auVar470._8_4_ = 0x42b0c0a5;
                  auVar470._0_8_ = 0x42b0c0a542b0c0a5;
                  auVar470._12_4_ = 0x42b0c0a5;
                  auVar470._16_4_ = 0x42b0c0a5;
                  auVar470._20_4_ = 0x42b0c0a5;
                  auVar470._24_4_ = 0x42b0c0a5;
                  auVar470._28_4_ = 0x42b0c0a5;
                  auVar169 = vminps_avx(auVar470,auVar169);
                  auVar241 = vmaxps_avx(auVar163,auVar169);
                  auVar252 = vfmadd213ps_fma(auVar165,auVar241,auVar362);
                  auVar230 = vroundps_avx(ZEXT1632(auVar252),1);
                  auVar169 = vcmpps_avx(ZEXT1632(auVar252),auVar230,1);
                  auVar169 = vandps_avx(auVar169,auVar488);
                  auVar169 = vsubps_avx(auVar230,auVar169);
                  auVar371._8_4_ = 0x3f318000;
                  auVar371._0_8_ = 0x3f3180003f318000;
                  auVar371._12_4_ = 0x3f318000;
                  auVar371._16_4_ = 0x3f318000;
                  auVar371._20_4_ = 0x3f318000;
                  auVar371._24_4_ = 0x3f318000;
                  auVar371._28_4_ = 0x3f318000;
                  auVar252 = vfmsub231ps_fma(auVar241,auVar169,auVar371);
                  auVar122._8_4_ = 0xb95e8083;
                  auVar122._0_8_ = 0xb95e8083b95e8083;
                  auVar122._12_4_ = 0xb95e8083;
                  auVar122._16_4_ = 0xb95e8083;
                  auVar122._20_4_ = 0xb95e8083;
                  auVar122._24_4_ = 0xb95e8083;
                  auVar122._28_4_ = 0xb95e8083;
                  auVar427 = vfnmsub231ps_fma(ZEXT1632(auVar252),auVar169,auVar122);
                  auVar241 = ZEXT1632(auVar427);
                  auVar38._28_4_ = auVar230._28_4_;
                  auVar38._0_28_ =
                       ZEXT1628(CONCAT412(auVar427._12_4_ * auVar427._12_4_,
                                          CONCAT48(auVar427._8_4_ * auVar427._8_4_,
                                                   CONCAT44(auVar427._4_4_ * auVar427._4_4_,
                                                            auVar427._0_4_ * auVar427._0_4_))));
                  auVar490._8_4_ = 0x3ab743ce;
                  auVar490._0_8_ = 0x3ab743ce3ab743ce;
                  auVar490._12_4_ = 0x3ab743ce;
                  auVar490._16_4_ = 0x3ab743ce;
                  auVar490._20_4_ = 0x3ab743ce;
                  auVar490._24_4_ = 0x3ab743ce;
                  auVar490._28_4_ = 0x3ab743ce;
                  auVar252 = vfmadd213ps_fma(auVar159,auVar241,auVar490);
                  auVar406._8_4_ = 0x3c088908;
                  auVar406._0_8_ = 0x3c0889083c088908;
                  auVar406._12_4_ = 0x3c088908;
                  auVar406._16_4_ = 0x3c088908;
                  auVar406._20_4_ = 0x3c088908;
                  auVar406._24_4_ = 0x3c088908;
                  auVar406._28_4_ = 0x3c088908;
                  auVar252 = vfmadd213ps_fma(ZEXT1632(auVar252),auVar241,auVar406);
                  auVar347._8_4_ = 0x3d2aa9c1;
                  auVar347._0_8_ = 0x3d2aa9c13d2aa9c1;
                  auVar347._12_4_ = 0x3d2aa9c1;
                  auVar347._16_4_ = 0x3d2aa9c1;
                  auVar347._20_4_ = 0x3d2aa9c1;
                  auVar347._24_4_ = 0x3d2aa9c1;
                  auVar347._28_4_ = 0x3d2aa9c1;
                  auVar252 = vfmadd213ps_fma(ZEXT1632(auVar252),auVar241,auVar347);
                  auVar123._8_4_ = 0x3e2aaaaa;
                  auVar123._0_8_ = 0x3e2aaaaa3e2aaaaa;
                  auVar123._12_4_ = 0x3e2aaaaa;
                  auVar123._16_4_ = 0x3e2aaaaa;
                  auVar123._20_4_ = 0x3e2aaaaa;
                  auVar123._24_4_ = 0x3e2aaaaa;
                  auVar123._28_4_ = 0x3e2aaaaa;
                  auVar241 = ZEXT1632(auVar427);
                  auVar252 = vfmadd213ps_fma(ZEXT1632(auVar252),auVar241,auVar123);
                  auVar252 = vfmadd213ps_fma(ZEXT1632(auVar252),auVar241,auVar362);
                  auVar252 = vfmadd213ps_fma(ZEXT1632(auVar252),auVar38,auVar241);
                  auVar242._0_4_ = auVar252._0_4_ + fVar89;
                  auVar242._4_4_ = auVar252._4_4_ + fVar88;
                  auVar242._8_4_ = auVar252._8_4_ + fVar518;
                  auVar242._12_4_ = auVar252._12_4_ + fVar250;
                  auVar242._16_4_ = fVar251 + 0.0;
                  auVar242._20_4_ = fVar28 + 0.0;
                  auVar242._24_4_ = fVar176 + 0.0;
                  auVar242._28_4_ = fVar29 + 0.0;
                  auVar255._0_4_ = (int)auVar169._0_4_;
                  auVar255._4_4_ = (int)auVar169._4_4_;
                  auVar255._8_4_ = (int)auVar169._8_4_;
                  auVar255._12_4_ = (int)auVar169._12_4_;
                  auVar278._16_4_ = (int)auVar169._16_4_;
                  auVar278._0_16_ = auVar255;
                  auVar278._20_4_ = (int)auVar169._20_4_;
                  auVar278._24_4_ = (int)auVar169._24_4_;
                  auVar278._28_4_ = (int)auVar169._28_4_;
                  auVar427 = vpslld_avx(auVar255,0x17);
                  auVar252 = vpslld_avx(auVar278._16_16_,0x17);
                  auVar383._8_4_ = 0x3f800000;
                  auVar383._0_8_ = 0x3f8000003f800000;
                  auVar383._12_4_ = 0x3f800000;
                  auVar252 = vpaddd_avx(auVar383,auVar252);
                  auVar427 = vpaddd_avx(auVar427,auVar383);
                  auVar514._16_16_ = auVar252;
                  auVar514._0_16_ = auVar427;
                  auVar377 = vfmadd213ps_fma(auVar514,auVar242,auVar488);
                  auVar124._8_4_ = 0x800000;
                  auVar124._0_8_ = 0x80000000800000;
                  auVar124._12_4_ = 0x800000;
                  auVar124._16_4_ = 0x800000;
                  auVar124._20_4_ = 0x800000;
                  auVar124._24_4_ = 0x800000;
                  auVar124._28_4_ = 0x800000;
                  auVar169 = vmaxps_avx(ZEXT1632(auVar377),auVar124);
                  auVar427 = vpsrld_avx(auVar169._0_16_,0x17);
                  auVar252 = vpsrld_avx(auVar169._16_16_,0x17);
                  auVar125._8_4_ = 0x807fffff;
                  auVar125._0_8_ = 0x807fffff807fffff;
                  auVar125._12_4_ = 0x807fffff;
                  auVar125._16_4_ = 0x807fffff;
                  auVar125._20_4_ = 0x807fffff;
                  auVar125._24_4_ = 0x807fffff;
                  auVar125._28_4_ = 0x807fffff;
                  auVar169 = vandps_avx(auVar169,auVar125);
                  auVar230 = vorps_avx(auVar169,auVar362);
                  auVar126._8_4_ = 0x3f3504f3;
                  auVar126._0_8_ = 0x3f3504f33f3504f3;
                  auVar126._12_4_ = 0x3f3504f3;
                  auVar126._16_4_ = 0x3f3504f3;
                  auVar126._20_4_ = 0x3f3504f3;
                  auVar126._24_4_ = 0x3f3504f3;
                  auVar126._28_4_ = 0x3f3504f3;
                  auVar241 = vcmpps_avx(auVar126,auVar230,2);
                  auVar169 = vandnps_avx(auVar241,auVar230);
                  auVar243._0_4_ = auVar169._0_4_ + auVar230._0_4_ + -1.0;
                  auVar243._4_4_ = auVar169._4_4_ + auVar230._4_4_ + -1.0;
                  auVar243._8_4_ = auVar169._8_4_ + auVar230._8_4_ + -1.0;
                  auVar243._12_4_ = auVar169._12_4_ + auVar230._12_4_ + -1.0;
                  auVar243._16_4_ = auVar169._16_4_ + auVar230._16_4_ + -1.0;
                  auVar243._20_4_ = auVar169._20_4_ + auVar230._20_4_ + -1.0;
                  auVar243._24_4_ = auVar169._24_4_ + auVar230._24_4_ + -1.0;
                  auVar243._28_4_ = auVar169._28_4_ + auVar230._28_4_ + -1.0;
                  auVar252 = vpsubd_avx(auVar252,auVar241._16_16_);
                  auVar456._8_4_ = 0xffffff81;
                  auVar456._0_8_ = 0xffffff81ffffff81;
                  auVar456._12_4_ = 0xffffff81;
                  auVar252 = vpaddd_avx(auVar252,auVar456);
                  auVar427 = vpsubd_avx(auVar427,auVar241._0_16_);
                  auVar427 = vpaddd_avx(auVar456,auVar427);
                  auVar279._16_16_ = auVar252;
                  auVar279._0_16_ = auVar427;
                  auVar39._4_4_ = auVar243._4_4_ * auVar243._4_4_;
                  auVar39._0_4_ = auVar243._0_4_ * auVar243._0_4_;
                  auVar39._8_4_ = auVar243._8_4_ * auVar243._8_4_;
                  auVar39._12_4_ = auVar243._12_4_ * auVar243._12_4_;
                  auVar39._16_4_ = auVar243._16_4_ * auVar243._16_4_;
                  auVar39._20_4_ = auVar243._20_4_ * auVar243._20_4_;
                  auVar39._24_4_ = auVar243._24_4_ * auVar243._24_4_;
                  auVar39._28_4_ = auVar241._28_4_;
                  auVar449._8_4_ = 0x3d9021bb;
                  auVar449._0_8_ = 0x3d9021bb3d9021bb;
                  auVar449._12_4_ = 0x3d9021bb;
                  auVar449._16_4_ = 0x3d9021bb;
                  auVar449._20_4_ = 0x3d9021bb;
                  auVar449._24_4_ = 0x3d9021bb;
                  auVar449._28_4_ = 0x3d9021bb;
                  auVar407._8_4_ = 0xbdebd1b8;
                  auVar407._0_8_ = 0xbdebd1b8bdebd1b8;
                  auVar407._12_4_ = 0xbdebd1b8;
                  auVar407._16_4_ = 0xbdebd1b8;
                  auVar407._20_4_ = 0xbdebd1b8;
                  auVar407._24_4_ = 0xbdebd1b8;
                  auVar407._28_4_ = 0xbdebd1b8;
                  auVar252 = vfmadd213ps_fma(auVar449,auVar243,auVar407);
                  auVar408._8_4_ = 0x3def251a;
                  auVar408._0_8_ = 0x3def251a3def251a;
                  auVar408._12_4_ = 0x3def251a;
                  auVar408._16_4_ = 0x3def251a;
                  auVar408._20_4_ = 0x3def251a;
                  auVar408._24_4_ = 0x3def251a;
                  auVar408._28_4_ = 0x3def251a;
                  auVar252 = vfmadd213ps_fma(ZEXT1632(auVar252),auVar243,auVar408);
                  auVar409._8_4_ = 0xbdfe5d4f;
                  auVar409._0_8_ = 0xbdfe5d4fbdfe5d4f;
                  auVar409._12_4_ = 0xbdfe5d4f;
                  auVar409._16_4_ = 0xbdfe5d4f;
                  auVar409._20_4_ = 0xbdfe5d4f;
                  auVar409._24_4_ = 0xbdfe5d4f;
                  auVar409._28_4_ = 0xbdfe5d4f;
                  auVar252 = vfmadd213ps_fma(ZEXT1632(auVar252),auVar243,auVar409);
                  auVar410._8_4_ = 0x3e11e9bf;
                  auVar410._0_8_ = 0x3e11e9bf3e11e9bf;
                  auVar410._12_4_ = 0x3e11e9bf;
                  auVar410._16_4_ = 0x3e11e9bf;
                  auVar410._20_4_ = 0x3e11e9bf;
                  auVar410._24_4_ = 0x3e11e9bf;
                  auVar410._28_4_ = 0x3e11e9bf;
                  auVar252 = vfmadd213ps_fma(ZEXT1632(auVar252),auVar243,auVar410);
                  auVar411._8_4_ = 0xbe2aae50;
                  auVar411._0_8_ = 0xbe2aae50be2aae50;
                  auVar411._12_4_ = 0xbe2aae50;
                  auVar411._16_4_ = 0xbe2aae50;
                  auVar411._20_4_ = 0xbe2aae50;
                  auVar411._24_4_ = 0xbe2aae50;
                  auVar411._28_4_ = 0xbe2aae50;
                  auVar252 = vfmadd213ps_fma(ZEXT1632(auVar252),auVar243,auVar411);
                  auVar412._8_4_ = 0x3e4cceac;
                  auVar412._0_8_ = 0x3e4cceac3e4cceac;
                  auVar412._12_4_ = 0x3e4cceac;
                  auVar412._16_4_ = 0x3e4cceac;
                  auVar412._20_4_ = 0x3e4cceac;
                  auVar412._24_4_ = 0x3e4cceac;
                  auVar412._28_4_ = 0x3e4cceac;
                  auVar252 = vfmadd213ps_fma(ZEXT1632(auVar252),auVar243,auVar412);
                  auVar413._8_4_ = 0xbe7ffffc;
                  auVar413._0_8_ = 0xbe7ffffcbe7ffffc;
                  auVar413._12_4_ = 0xbe7ffffc;
                  auVar413._16_4_ = 0xbe7ffffc;
                  auVar413._20_4_ = 0xbe7ffffc;
                  auVar413._24_4_ = 0xbe7ffffc;
                  auVar413._28_4_ = 0xbe7ffffc;
                  auVar252 = vfmadd213ps_fma(ZEXT1632(auVar252),auVar243,auVar413);
                  auVar414._8_4_ = 0x3eaaaaaa;
                  auVar414._0_8_ = 0x3eaaaaaa3eaaaaaa;
                  auVar414._12_4_ = 0x3eaaaaaa;
                  auVar414._16_4_ = 0x3eaaaaaa;
                  auVar414._20_4_ = 0x3eaaaaaa;
                  auVar414._24_4_ = 0x3eaaaaaa;
                  auVar414._28_4_ = 0x3eaaaaaa;
                  auVar252 = vfmadd213ps_fma(ZEXT1632(auVar252),auVar243,auVar414);
                  auVar450._0_4_ = auVar243._0_4_ * auVar243._0_4_ * auVar243._0_4_ * auVar252._0_4_
                  ;
                  auVar450._4_4_ = auVar243._4_4_ * auVar243._4_4_ * auVar243._4_4_ * auVar252._4_4_
                  ;
                  auVar450._8_4_ = auVar243._8_4_ * auVar243._8_4_ * auVar243._8_4_ * auVar252._8_4_
                  ;
                  auVar450._12_4_ =
                       auVar243._12_4_ * auVar243._12_4_ * auVar243._12_4_ * auVar252._12_4_;
                  auVar450._16_4_ = auVar243._16_4_ * auVar243._16_4_ * auVar243._16_4_ * 0.0;
                  auVar450._20_4_ = auVar243._20_4_ * auVar243._20_4_ * auVar243._20_4_ * 0.0;
                  auVar450._24_4_ = auVar243._24_4_ * auVar243._24_4_ * auVar243._24_4_ * 0.0;
                  auVar450._28_4_ = 0;
                  auVar241 = vcvtdq2ps_avx(auVar279);
                  auVar471._8_4_ = 0xb95e8083;
                  auVar471._0_8_ = 0xb95e8083b95e8083;
                  auVar471._12_4_ = 0xb95e8083;
                  auVar471._16_4_ = 0xb95e8083;
                  auVar471._20_4_ = 0xb95e8083;
                  auVar471._24_4_ = 0xb95e8083;
                  auVar471._28_4_ = 0xb95e8083;
                  auVar252 = vfmadd231ps_fma(auVar450,auVar241,auVar471);
                  auVar252 = vfmsub231ps_fma(ZEXT1632(auVar252),auVar362,auVar39);
                  auVar169 = vcmpps_avx(ZEXT1632(auVar377),ZEXT832(0) << 0x20,2);
                  auVar230 = vsubps_avx(ZEXT1632(auVar252),auVar243);
                  auVar252 = vfmsub231ps_fma(auVar230,auVar371,auVar241);
                  auVar415._8_4_ = 0xc0000000;
                  auVar415._0_8_ = 0xc0000000c0000000;
                  auVar415._12_4_ = 0xc0000000;
                  auVar415._16_4_ = 0xc0000000;
                  auVar415._20_4_ = 0xc0000000;
                  auVar415._24_4_ = 0xc0000000;
                  auVar415._28_4_ = 0xc0000000;
                  auVar244._0_4_ = auVar252._0_4_ * -2.0;
                  auVar244._4_4_ = auVar252._4_4_ * -2.0;
                  auVar244._8_4_ = auVar252._8_4_ * -2.0;
                  auVar244._12_4_ = auVar252._12_4_ * -2.0;
                  auVar244._16_4_ = 0x80000000;
                  auVar244._20_4_ = 0x80000000;
                  auVar244._24_4_ = 0x80000000;
                  auVar244._28_4_ = 0;
                  auVar280._8_4_ = 0x7fffffff;
                  auVar280._0_8_ = 0x7fffffff7fffffff;
                  auVar280._12_4_ = 0x7fffffff;
                  auVar280._16_4_ = 0x7fffffff;
                  auVar280._20_4_ = 0x7fffffff;
                  auVar280._24_4_ = 0x7fffffff;
                  auVar280._28_4_ = 0x7fffffff;
                  auVar169 = vblendvps_avx(auVar244,auVar280,auVar169);
                  auVar169 = vminps_avx(auVar470,auVar169);
                  auVar416 = ZEXT3264(auVar163);
                  auVar163 = vmaxps_avx(auVar163,auVar169);
                  auVar426 = ZEXT3264(auVar165);
                  auVar252 = vfmadd213ps_fma(auVar165,auVar163,auVar362);
                  auVar165 = vroundps_avx(ZEXT1632(auVar252),1);
                  auVar169 = vcmpps_avx(ZEXT1632(auVar252),auVar165,1);
                  auVar169 = vandps_avx(auVar169,auVar488);
                  auVar169 = vsubps_avx(auVar165,auVar169);
                  auVar252 = vfmsub231ps_fma(auVar163,auVar169,auVar371);
                  auVar427 = vfnmsub231ps_fma(ZEXT1632(auVar252),auVar169,auVar471);
                  auVar163 = ZEXT1632(auVar427);
                  auVar40._28_4_ = auVar165._28_4_;
                  auVar40._0_28_ =
                       ZEXT1628(CONCAT412(auVar427._12_4_ * auVar427._12_4_,
                                          CONCAT48(auVar427._8_4_ * auVar427._8_4_,
                                                   CONCAT44(auVar427._4_4_ * auVar427._4_4_,
                                                            auVar427._0_4_ * auVar427._0_4_))));
                  auVar174 = ZEXT3264(auVar159);
                  auVar252 = vfmadd213ps_fma(auVar159,auVar163,auVar490);
                  auVar515._8_4_ = 0x3c088908;
                  auVar515._0_8_ = 0x3c0889083c088908;
                  auVar515._12_4_ = 0x3c088908;
                  auVar515._16_4_ = 0x3c088908;
                  auVar515._20_4_ = 0x3c088908;
                  auVar515._24_4_ = 0x3c088908;
                  auVar515._28_4_ = 0x3c088908;
                  auVar252 = vfmadd213ps_fma(ZEXT1632(auVar252),auVar163,auVar515);
                  auVar127._8_4_ = 0x3d2aa9c1;
                  auVar127._0_8_ = 0x3d2aa9c13d2aa9c1;
                  auVar127._12_4_ = 0x3d2aa9c1;
                  auVar127._16_4_ = 0x3d2aa9c1;
                  auVar127._20_4_ = 0x3d2aa9c1;
                  auVar127._24_4_ = 0x3d2aa9c1;
                  auVar127._28_4_ = 0x3d2aa9c1;
                  auVar252 = vfmadd213ps_fma(ZEXT1632(auVar252),auVar163,auVar127);
                  auVar128._8_4_ = 0x3e2aaaaa;
                  auVar128._0_8_ = 0x3e2aaaaa3e2aaaaa;
                  auVar128._12_4_ = 0x3e2aaaaa;
                  auVar128._16_4_ = 0x3e2aaaaa;
                  auVar128._20_4_ = 0x3e2aaaaa;
                  auVar128._24_4_ = 0x3e2aaaaa;
                  auVar128._28_4_ = 0x3e2aaaaa;
                  auVar163 = ZEXT1632(auVar427);
                  auVar252 = vfmadd213ps_fma(ZEXT1632(auVar252),auVar163,auVar128);
                  auVar252 = vfmadd213ps_fma(ZEXT1632(auVar252),auVar163,auVar362);
                  auVar377 = vfmadd213ps_fma(ZEXT1632(auVar252),auVar40,auVar163);
                  auVar364 = ZEXT3264(auVar488);
                  auVar189._0_4_ = (int)auVar169._0_4_;
                  auVar189._4_4_ = (int)auVar169._4_4_;
                  auVar189._8_4_ = (int)auVar169._8_4_;
                  auVar189._12_4_ = (int)auVar169._12_4_;
                  auVar245._16_4_ = (int)auVar169._16_4_;
                  auVar245._0_16_ = auVar189;
                  auVar245._20_4_ = (int)auVar169._20_4_;
                  auVar245._24_4_ = (int)auVar169._24_4_;
                  auVar245._28_4_ = (int)auVar169._28_4_;
                  auVar427 = vpslld_avx(auVar189,0x17);
                  auVar252 = vpslld_avx(auVar245._16_16_,0x17);
                  auVar305._8_4_ = 0x3f800000;
                  auVar305._0_8_ = 0x3f8000003f800000;
                  auVar305._12_4_ = 0x3f800000;
                  auVar252 = vpaddd_avx(auVar252,auVar305);
                  auVar427 = vpaddd_avx(auVar427,auVar305);
                  auVar246._16_16_ = auVar252;
                  auVar246._0_16_ = auVar427;
                  auVar281._0_4_ = auVar377._0_4_ + fVar89;
                  auVar281._4_4_ = auVar377._4_4_ + fVar88;
                  auVar281._8_4_ = auVar377._8_4_ + fVar518;
                  auVar281._12_4_ = auVar377._12_4_ + fVar250;
                  auVar281._16_4_ = fVar251 + 0.0;
                  auVar281._20_4_ = fVar28 + 0.0;
                  auVar281._24_4_ = fVar176 + 0.0;
                  auVar281._28_4_ = fVar29 + 0.0;
                  auVar252 = vfmadd213ps_fma(auVar246,auVar281,auVar488);
                  auVar169 = vrcpps_avx(ZEXT1632(auVar252));
                  auVar252 = vfmsub213ps_fma(ZEXT1632(auVar252),auVar169,auVar488);
                  auVar252 = vfnmadd132ps_fma(ZEXT1632(auVar252),auVar169,auVar169);
                  auVar129._8_4_ = 0xbf800000;
                  auVar129._0_8_ = 0xbf800000bf800000;
                  auVar129._12_4_ = 0xbf800000;
                  auVar129._16_4_ = 0xbf800000;
                  auVar129._20_4_ = 0xbf800000;
                  auVar129._24_4_ = 0xbf800000;
                  auVar129._28_4_ = 0xbf800000;
                  auVar252 = vfnmadd213ps_fma(ZEXT1632(auVar252),auVar415,auVar129);
                  auVar216 = ZEXT1628(auVar252);
                  goto LAB_00282e7c;
                case 6:
                  uVar2 = **(undefined4 **)(&this->field_0x118 + (long)p_Var61);
                  auVar249._4_4_ = uVar2;
                  auVar249._0_4_ = uVar2;
                  auVar249._8_4_ = uVar2;
                  auVar249._12_4_ = uVar2;
                  auVar249._16_4_ = uVar2;
                  auVar249._20_4_ = uVar2;
                  auVar249._24_4_ = uVar2;
                  auVar249._28_4_ = uVar2;
                  uVar2 = (*(undefined4 **)(&this->field_0x118 + (long)p_Var61))[1];
                  auVar286._4_4_ = uVar2;
                  auVar286._0_4_ = uVar2;
                  auVar286._8_4_ = uVar2;
                  auVar286._12_4_ = uVar2;
                  auVar286._16_4_ = uVar2;
                  auVar286._20_4_ = uVar2;
                  auVar286._24_4_ = uVar2;
                  auVar286._28_4_ = uVar2;
                  auVar252 = vfmadd231ps_fma(auVar286,auVar169,auVar249);
                  auVar169 = vmaxps_avx(ZEXT1632(auVar252),_DAT_00558500);
                  auVar169 = vminps_avx(auVar169,auVar488);
                  auVar216 = auVar169._0_28_;
LAB_00282e7c:
                  auVar175._0_4_ = auVar216._0_4_ * auVar491._0_4_;
                  auVar175._4_4_ = auVar216._4_4_ * auVar491._4_4_;
                  auVar175._8_4_ = auVar216._8_4_ * auVar491._8_4_;
                  auVar175._12_4_ = auVar216._12_4_ * auVar491._12_4_;
                  auVar175._16_4_ = auVar216._16_4_ * auVar491._16_4_;
                  auVar175._20_4_ = auVar216._20_4_ * auVar491._20_4_;
                  auVar175._24_4_ = auVar216._24_4_ * auVar491._24_4_;
                  auVar169 = auVar175._0_32_;
                }
                *(undefined1 (*) [32])pAVar72 = auVar169;
                pAVar72 = pAVar72 + 4;
                uVar78 = uVar78 + 1;
                iVar70 = iVar70 + 1;
              } while (uVar78 != local_1a8.w);
            }
            local_250 = local_250 + 1;
          } while (local_250 != local_1a8.h);
        }
        local_278 = local_278 + 1;
      } while (local_278 != (long)local_1a8.c);
    }
    if (((uint)local_150 == 8) && (uVar55 == 1)) {
      local_148 = (ulong)local_1a8.c;
      if (0 < (long)local_148) {
        p_Var61 = pp_Var18[-3];
        iVar14 = *(int *)(&this->field_0xdc + (long)p_Var61);
        iVar15 = *(int *)(&this->field_0xe0 + (long)p_Var61);
        iVar65 = *(int *)(&this->field_0xe4 + (long)p_Var61);
        iVar84 = *(int *)(&this->field_0xe8 + (long)p_Var61);
        uVar17 = *(undefined4 *)(&this->field_0x114 + (long)p_Var61);
        lVar79 = *(long *)(&this->field_0x1a8 + (long)p_Var61);
        uVar50 = *(uint *)(&this->field_0xd4 + (long)p_Var61);
        uVar55 = *(uint *)(&this->field_0xd8 + (long)p_Var61);
        lVar82 = local_1a8.elemsize * local_1a8.cstep;
        iVar75 = bottom_blob->w;
        iVar77 = bottom_blob->h;
        uVar16 = bottom_blob->c;
        local_278 = 0;
        do {
          if (0 < iVar63) {
            sVar20 = (this->weight_data_tm).cstep;
            sVar21 = (this->weight_data_tm).elemsize;
            local_230 = (Allocator *)((long)(_func_int ***)pvVar87 + lVar82 * local_278);
            pvVar86 = (this->weight_data_tm).data;
            iVar76 = 0;
            do {
              if (0 < iVar66) {
                iVar53 = bottom_blob->w;
                pvVar74 = bottom_blob->data;
                sVar22 = bottom_blob->elemsize;
                sVar23 = bottom_blob->cstep;
                pfVar85 = *(float **)(&this->field_0x118 + (long)p_Var61);
                uVar62 = 0;
                iVar70 = (1 - uVar50) * iVar14;
                do {
                  if (lVar79 == 0) {
                    fVar89 = 0.0;
                  }
                  else {
                    fVar89 = *(float *)(lVar79 + local_278 * 4);
                  }
                  if ((int)uVar16 < 1) {
                    auVar169 = SUB6432(ZEXT864(0),0);
                  }
                  else {
                    auVar364 = ZEXT864(0);
                    uVar64 = 0;
                    pvVar73 = (void *)(sVar20 * local_278 * sVar21 + (long)pvVar86);
                    do {
                      if (0 < (int)uVar55) {
                        uVar83 = 0;
                        uVar67 = 0;
                        do {
                          iVar51 = (((int)uVar67 - uVar55) + 1) * iVar15 + iVar76;
                          if ((((-1 < iVar51) && (iVar52 = iVar51 / iVar84, iVar51 % iVar84 == 0))
                              && (0 < (int)uVar50)) && (iVar52 < iVar77)) {
                            uVar71 = (ulong)uVar50;
                            uVar80 = uVar83;
                            iVar51 = iVar70;
                            do {
                              if (((-1 < iVar51) && (iVar54 = iVar51 / iVar65, iVar51 % iVar65 == 0)
                                  ) && (iVar54 < iVar75)) {
                                auVar252 = vfmadd231ps_fma(auVar364._0_32_,
                                                           *(undefined1 (*) [32])
                                                            ((long)pvVar74 +
                                                            (long)(iVar54 << 3) * 4 +
                                                            (long)iVar52 * (long)iVar53 * sVar22 +
                                                            sVar23 * sVar22 * uVar64),
                                                           *(undefined1 (*) [32])
                                                            ((long)pvVar73 +
                                                            (uVar80 & 0xffffffff) * 4));
                                auVar364 = ZEXT1664(auVar252);
                              }
                              uVar80 = uVar80 + 8;
                              iVar51 = iVar51 + iVar14;
                              uVar71 = uVar71 - 1;
                            } while (uVar71 != 0);
                          }
                          uVar67 = uVar67 + 1;
                          uVar83 = uVar83 + (ulong)uVar50 * 8;
                        } while (uVar67 != uVar55);
                      }
                      auVar169 = auVar364._0_32_;
                      pvVar73 = (void *)((long)pvVar73 + (long)(int)(uVar50 * uVar55 * 8) * 4);
                      uVar64 = uVar64 + 1;
                    } while (uVar64 != uVar16);
                  }
                  auVar140._0_4_ = auVar169._16_4_ + auVar169._0_4_;
                  auVar140._4_4_ = auVar169._20_4_ + auVar169._4_4_;
                  auVar140._8_4_ = auVar169._24_4_ + auVar169._8_4_;
                  auVar140._12_4_ = auVar169._28_4_ + auVar169._12_4_;
                  auVar252 = vshufpd_avx(auVar140,auVar140,1);
                  auVar141._0_4_ = auVar252._0_4_ + auVar140._0_4_;
                  auVar141._4_4_ = auVar252._4_4_ + auVar140._4_4_;
                  auVar141._8_4_ = auVar252._8_4_ + auVar140._8_4_;
                  auVar141._12_4_ = auVar252._12_4_ + auVar140._12_4_;
                  auVar252 = vmovshdup_avx(auVar141);
                  fVar89 = auVar252._0_4_ + fVar89 + auVar141._0_4_;
                  auVar252 = ZEXT416((uint)fVar89);
                  fVar88 = fVar89;
                  switch(uVar17) {
                  case 1:
                    auVar252 = vmaxss_avx(auVar252,ZEXT416(0));
                    fVar88 = auVar252._0_4_;
                    break;
                  case 2:
                    auVar97._0_12_ = ZEXT812(0);
                    auVar97._12_4_ = 0;
                    auVar252 = vcmpss_avx(auVar97,auVar252,1);
                    auVar191._8_4_ = 0x3f800000;
                    auVar191._0_8_ = 0x3f8000003f800000;
                    auVar191._12_4_ = 0x3f800000;
                    auVar252 = vblendvps_avx(ZEXT416((uint)*pfVar85),auVar191,auVar252);
                    fVar88 = auVar252._0_4_ * fVar89;
                    break;
                  case 3:
                    auVar252 = vmaxss_avx(auVar252,ZEXT416((uint)*pfVar85));
                    fVar88 = auVar252._0_4_;
                    if (pfVar85[1] < auVar252._0_4_) {
                      fVar88 = pfVar85[1];
                    }
                    break;
                  case 4:
                    auVar252 = vminss_avx(auVar252,ZEXT416(0x42b0c0a5));
                    auVar142._0_8_ = auVar252._0_8_ ^ 0x8000000080000000;
                    auVar142._8_4_ = auVar252._8_4_ ^ 0x80000000;
                    auVar142._12_4_ = auVar252._12_4_ ^ 0x80000000;
                    auVar252 = vcmpss_avx(auVar252,ZEXT416(0xc2b0c0a5),1);
                    auVar190._8_4_ = 0x42b0c0a5;
                    auVar190._0_8_ = 0x42b0c0a542b0c0a5;
                    auVar190._12_4_ = 0x42b0c0a5;
                    auVar252 = vblendvps_avx(auVar142,auVar190,auVar252);
                    fVar89 = expf(auVar252._0_4_);
                    fVar88 = 1.0 / (fVar89 + 1.0);
                    break;
                  case 5:
                    fVar88 = expf(fVar89);
                    fVar88 = logf(fVar88 + 1.0);
                    fVar88 = tanhf(fVar88);
                    fVar88 = fVar88 * fVar89;
                    break;
                  case 6:
                    fVar518 = *pfVar85;
                    fVar250 = -pfVar85[1] / fVar518;
                    fVar88 = 0.0;
                    if ((fVar250 <= fVar89) && (fVar88 = fVar89, fVar89 <= fVar250 + 1.0 / fVar518))
                    {
                      auVar252 = vfmadd213ss_fma(ZEXT416((uint)fVar518),auVar252,
                                                 ZEXT416((uint)pfVar85[1]));
                      fVar88 = auVar252._0_4_ * fVar89;
                    }
                  }
                  *(float *)&local_230->_vptr_Allocator = fVar88;
                  local_230 = (Allocator *)((long)&local_230->_vptr_Allocator + 4);
                  uVar62 = uVar62 + 1;
                  iVar70 = iVar70 + 1;
                } while (uVar62 != iVar66);
              }
              iVar76 = iVar76 + 1;
            } while (iVar76 != iVar63);
          }
          local_278 = local_278 + 1;
        } while (local_278 != local_148);
      }
    }
    else {
      local_138._0_4_ = uVar55 ^ 4;
      if (((uint)local_150 == 4 && uVar55 == 4) && (0 < (long)local_1a8.c)) {
        p_Var61 = pp_Var18[-3];
        iVar14 = *(int *)(&this->field_0xdc + (long)p_Var61);
        iVar15 = *(int *)(&this->field_0xe0 + (long)p_Var61);
        iVar65 = *(int *)(&this->field_0xe4 + (long)p_Var61);
        iVar84 = *(int *)(&this->field_0xe8 + (long)p_Var61);
        uVar17 = *(undefined4 *)(&this->field_0x114 + (long)p_Var61);
        lVar79 = *(long *)(&this->field_0x1a8 + (long)p_Var61);
        uVar50 = *(uint *)(&this->field_0xd4 + (long)p_Var61);
        uVar16 = *(uint *)(&this->field_0xd8 + (long)p_Var61);
        local_278 = 0;
        auVar416 = ZEXT1664(ZEXT816(0) << 0x40);
        auVar360._8_4_ = 0x3f000000;
        auVar360._0_8_ = 0x3f0000003f000000;
        auVar360._12_4_ = 0x3f000000;
        auVar364 = ZEXT1664(CONCAT412(0x3f800000,CONCAT48(0x3f800000,0x3f8000003f800000)));
        auVar487._8_4_ = 0x3ab743ce;
        auVar487._0_8_ = 0x3ab743ce3ab743ce;
        auVar487._12_4_ = 0x3ab743ce;
        auVar257._8_4_ = 0x3c088908;
        auVar257._0_8_ = 0x3c0889083c088908;
        auVar257._12_4_ = 0x3c088908;
        do {
          if (0 < local_1a8.h) {
            iVar75 = bottom_blob->w;
            iVar77 = bottom_blob->h;
            pAVar72 = (Allocator *)
                      ((long)(_func_int ***)local_1a8.data +
                      local_1a8.cstep * local_278 * local_1a8.elemsize);
            uVar62 = bottom_blob->c;
            iVar70 = 0;
            do {
              if (0 < local_1a8.w) {
                uVar78 = 0;
                iVar53 = (1 - uVar50) * iVar14;
                do {
                  if (lVar79 == 0) {
                    auVar143 = ZEXT816(0) << 0x40;
                  }
                  else {
                    auVar143 = *(undefined1 (*) [16])(lVar79 + local_278 * 0x10);
                  }
                  auVar426 = ZEXT1664(auVar143);
                  if (0 < (int)uVar62) {
                    pvVar87 = (void *)((this->weight_data_tm).cstep * local_278 *
                                       (this->weight_data_tm).elemsize +
                                      (long)(this->weight_data_tm).data);
                    pvVar86 = bottom_blob->data;
                    uVar64 = 0;
                    do {
                      if (0 < (int)uVar16) {
                        uVar67 = 0;
                        uVar83 = 0;
                        do {
                          iVar51 = (((int)uVar83 - uVar16) + 1) * iVar15 + iVar70;
                          if ((((-1 < iVar51) && (iVar52 = iVar51 / iVar84, iVar51 % iVar84 == 0))
                              && (0 < (int)uVar50)) && (iVar52 < iVar77)) {
                            lVar82 = (long)iVar52 * (long)bottom_blob->w * bottom_blob->elemsize +
                                     bottom_blob->cstep * bottom_blob->elemsize * uVar64;
                            uVar71 = (ulong)uVar50;
                            uVar80 = uVar67;
                            iVar51 = iVar53;
                            do {
                              if (((-1 < iVar51) && (iVar52 = iVar51 / iVar65, iVar51 % iVar65 == 0)
                                  ) && (iVar52 < iVar75)) {
                                lVar59 = (long)(iVar52 << 2);
                                uVar2 = *(undefined4 *)((long)pvVar86 + lVar59 * 4 + lVar82);
                                auVar192._4_4_ = uVar2;
                                auVar192._0_4_ = uVar2;
                                auVar192._8_4_ = uVar2;
                                auVar192._12_4_ = uVar2;
                                uVar2 = *(undefined4 *)((long)pvVar86 + lVar59 * 4 + lVar82 + 4);
                                auVar307._4_4_ = uVar2;
                                auVar307._0_4_ = uVar2;
                                auVar307._8_4_ = uVar2;
                                auVar307._12_4_ = uVar2;
                                uVar2 = *(undefined4 *)((long)pvVar86 + lVar59 * 4 + lVar82 + 8);
                                auVar385._4_4_ = uVar2;
                                auVar385._0_4_ = uVar2;
                                auVar385._8_4_ = uVar2;
                                auVar385._12_4_ = uVar2;
                                uVar2 = *(undefined4 *)((long)pvVar86 + lVar59 * 4 + lVar82 + 0xc);
                                auVar421._4_4_ = uVar2;
                                auVar421._0_4_ = uVar2;
                                auVar421._8_4_ = uVar2;
                                auVar421._12_4_ = uVar2;
                                uVar60 = uVar80 & 0xffffffff;
                                auVar252 = vfmadd231ps_fma(auVar426._0_16_,auVar192,
                                                           *(undefined1 (*) [16])
                                                            ((long)pvVar87 + uVar60 * 4));
                                auVar252 = vfmadd231ps_fma(auVar252,auVar307,
                                                           *(undefined1 (*) [16])
                                                            ((long)pvVar87 + uVar60 * 4 + 0x10));
                                auVar252 = vfmadd231ps_fma(auVar252,auVar385,
                                                           *(undefined1 (*) [16])
                                                            ((long)pvVar87 + uVar60 * 4 + 0x20));
                                auVar252 = vfmadd231ps_fma(auVar252,auVar421,
                                                           *(undefined1 (*) [16])
                                                            ((long)pvVar87 + uVar60 * 4 + 0x30));
                                auVar426 = ZEXT1664(auVar252);
                              }
                              uVar80 = uVar80 + 0x10;
                              iVar51 = iVar51 + iVar14;
                              uVar71 = uVar71 - 1;
                            } while (uVar71 != 0);
                          }
                          uVar83 = uVar83 + 1;
                          uVar67 = uVar67 + (ulong)uVar50 * 0x10;
                        } while (uVar83 != uVar16);
                      }
                      auVar143 = auVar426._0_16_;
                      pvVar87 = (void *)((long)pvVar87 + (long)(int)(uVar50 * uVar16 * 0x10) * 4);
                      uVar64 = uVar64 + 1;
                    } while (uVar64 != uVar62);
                  }
                  auVar427 = auVar416._0_16_;
                  auVar252 = auVar364._0_16_;
                  fVar89 = auVar364._0_4_;
                  fVar88 = auVar364._4_4_;
                  fVar518 = auVar364._8_4_;
                  fVar250 = auVar364._12_4_;
                  fVar176 = auVar143._4_4_;
                  fVar251 = auVar143._8_4_;
                  fVar28 = auVar143._12_4_;
                  switch(uVar17) {
                  case 1:
                    auVar143 = vmaxps_avx(auVar427,auVar143);
                    break;
                  case 2:
                    auVar252 = vmaxps_avx(auVar427,auVar143);
                    auVar427 = vminps_avx(auVar427,auVar143);
                    uVar2 = **(undefined4 **)(&this->field_0x118 + (long)p_Var61);
                    auVar146._4_4_ = uVar2;
                    auVar146._0_4_ = uVar2;
                    auVar146._8_4_ = uVar2;
                    auVar146._12_4_ = uVar2;
                    auVar143 = vfmadd213ps_fma(auVar146,auVar427,auVar252);
                    break;
                  case 3:
                    uVar2 = **(undefined4 **)(&this->field_0x118 + (long)p_Var61);
                    auVar390._4_4_ = uVar2;
                    auVar390._0_4_ = uVar2;
                    auVar390._8_4_ = uVar2;
                    auVar390._12_4_ = uVar2;
                    uVar2 = (*(undefined4 **)(&this->field_0x118 + (long)p_Var61))[1];
                    auVar501._4_4_ = uVar2;
                    auVar501._0_4_ = uVar2;
                    auVar501._8_4_ = uVar2;
                    auVar501._12_4_ = uVar2;
                    auVar252 = vmaxps_avx(auVar390,auVar143);
                    auVar143 = vminps_avx(auVar501,auVar252);
                    break;
                  case 4:
                    auVar144._0_8_ = auVar143._0_8_ ^ 0x8000000080000000;
                    auVar144._8_4_ = -fVar251;
                    auVar144._12_4_ = -fVar28;
                    auVar198._8_4_ = 0x42b0c0a5;
                    auVar198._0_8_ = 0x42b0c0a542b0c0a5;
                    auVar198._12_4_ = 0x42b0c0a5;
                    auVar427 = vminps_avx(auVar144,auVar198);
                    auVar199._8_4_ = 0xc2b0c0a5;
                    auVar199._0_8_ = 0xc2b0c0a5c2b0c0a5;
                    auVar199._12_4_ = 0xc2b0c0a5;
                    auVar149 = vmaxps_avx(auVar427,auVar199);
                    auVar391._8_4_ = 0x3fb8aa3b;
                    auVar391._0_8_ = 0x3fb8aa3b3fb8aa3b;
                    auVar391._12_4_ = 0x3fb8aa3b;
                    auVar427 = vfmadd213ps_fma(auVar391,auVar149,auVar360);
                    auVar502._0_4_ = (int)auVar427._0_4_;
                    auVar502._4_4_ = (int)auVar427._4_4_;
                    auVar502._8_4_ = (int)auVar427._8_4_;
                    auVar502._12_4_ = (int)auVar427._12_4_;
                    auVar377 = vcvtdq2ps_avx(auVar502);
                    auVar427 = vcmpps_avx(auVar427,auVar377,1);
                    auVar427 = vandps_avx(auVar427,auVar252);
                    auVar427 = vsubps_avx(auVar377,auVar427);
                    auVar102._8_4_ = 0x3f318000;
                    auVar102._0_8_ = 0x3f3180003f318000;
                    auVar102._12_4_ = 0x3f318000;
                    auVar377 = vfmsub231ps_fma(auVar149,auVar427,auVar102);
                    auVar200._8_4_ = 0x395e8083;
                    auVar200._0_8_ = 0x395e8083395e8083;
                    auVar200._12_4_ = 0x395e8083;
                    auVar149 = vfmsub231ps_fma(auVar377,auVar427,auVar200);
                    auVar503._0_4_ = auVar149._0_4_ * auVar149._0_4_;
                    auVar503._4_4_ = auVar149._4_4_ * auVar149._4_4_;
                    auVar503._8_4_ = auVar149._8_4_ * auVar149._8_4_;
                    auVar503._12_4_ = auVar149._12_4_ * auVar149._12_4_;
                    auVar435._8_4_ = 0x39506967;
                    auVar435._0_8_ = 0x3950696739506967;
                    auVar435._12_4_ = 0x39506967;
                    auVar201._8_4_ = 0x3ab743ce;
                    auVar201._0_8_ = 0x3ab743ce3ab743ce;
                    auVar201._12_4_ = 0x3ab743ce;
                    auVar377 = vfmadd213ps_fma(auVar435,auVar149,auVar201);
                    auVar202._8_4_ = 0x3c088908;
                    auVar202._0_8_ = 0x3c0889083c088908;
                    auVar202._12_4_ = 0x3c088908;
                    auVar377 = vfmadd213ps_fma(auVar377,auVar149,auVar202);
                    auVar103._8_4_ = 0x3d2aa9c1;
                    auVar103._0_8_ = 0x3d2aa9c13d2aa9c1;
                    auVar103._12_4_ = 0x3d2aa9c1;
                    auVar377 = vfmadd213ps_fma(auVar377,auVar149,auVar103);
                    auVar104._8_4_ = 0x3e2aaaaa;
                    auVar104._0_8_ = 0x3e2aaaaa3e2aaaaa;
                    auVar104._12_4_ = 0x3e2aaaaa;
                    auVar377 = vfmadd213ps_fma(auVar377,auVar149,auVar104);
                    auVar377 = vfmadd213ps_fma(auVar377,auVar149,auVar360);
                    auVar377 = vfmadd213ps_fma(auVar377,auVar503,auVar149);
                    auVar436._0_4_ = auVar377._0_4_ + fVar89;
                    auVar436._4_4_ = auVar377._4_4_ + fVar88;
                    auVar436._8_4_ = auVar377._8_4_ + fVar518;
                    auVar436._12_4_ = auVar377._12_4_ + fVar250;
                    auVar145._0_4_ = (int)auVar427._0_4_;
                    auVar145._4_4_ = (int)auVar427._4_4_;
                    auVar145._8_4_ = (int)auVar427._8_4_;
                    auVar145._12_4_ = (int)auVar427._12_4_;
                    auVar427 = vpslld_avx(auVar145,0x17);
                    auVar427 = vpaddd_avx(auVar427,auVar252);
                    auVar377 = vfmadd213ps_fma(auVar427,auVar436,auVar252);
                    auVar416 = ZEXT464(0) << 0x20;
                    auVar427 = vrcpps_avx(auVar377);
                    auVar252 = vfmsub213ps_fma(auVar377,auVar427,auVar252);
                    auVar143 = vfnmadd132ps_fma(auVar252,auVar427,auVar427);
                    break;
                  case 5:
                    auVar457._8_4_ = 0x42b0c0a5;
                    auVar457._0_8_ = 0x42b0c0a542b0c0a5;
                    auVar457._12_4_ = 0x42b0c0a5;
                    auVar427 = vminps_avx(auVar457,auVar143);
                    auVar475._8_4_ = 0xc2b0c0a5;
                    auVar475._0_8_ = 0xc2b0c0a5c2b0c0a5;
                    auVar475._12_4_ = 0xc2b0c0a5;
                    auVar149 = vmaxps_avx(auVar427,auVar475);
                    auVar481._8_4_ = 0x3fb8aa3b;
                    auVar481._0_8_ = 0x3fb8aa3b3fb8aa3b;
                    auVar481._12_4_ = 0x3fb8aa3b;
                    auVar427 = vfmadd213ps_fma(auVar481,auVar149,auVar360);
                    auVar499._0_4_ = (int)auVar427._0_4_;
                    auVar499._4_4_ = (int)auVar427._4_4_;
                    auVar499._8_4_ = (int)auVar427._8_4_;
                    auVar499._12_4_ = (int)auVar427._12_4_;
                    auVar377 = vcvtdq2ps_avx(auVar499);
                    auVar427 = vcmpps_avx(auVar427,auVar377,1);
                    auVar427 = vandps_avx(auVar427,auVar252);
                    auVar427 = vsubps_avx(auVar377,auVar427);
                    auVar458._8_4_ = 0x3f318000;
                    auVar458._0_8_ = 0x3f3180003f318000;
                    auVar458._12_4_ = 0x3f318000;
                    auVar377 = vfmsub231ps_fma(auVar149,auVar427,auVar458);
                    auVar476._8_4_ = 0xb95e8083;
                    auVar476._0_8_ = 0xb95e8083b95e8083;
                    auVar476._12_4_ = 0xb95e8083;
                    auVar149 = vfnmsub231ps_fma(auVar377,auVar427,auVar476);
                    auVar500._0_4_ = auVar149._0_4_ * auVar149._0_4_;
                    auVar500._4_4_ = auVar149._4_4_ * auVar149._4_4_;
                    auVar500._8_4_ = auVar149._8_4_ * auVar149._8_4_;
                    auVar500._12_4_ = auVar149._12_4_ * auVar149._12_4_;
                    auVar369._8_4_ = 0x39506967;
                    auVar369._0_8_ = 0x3950696739506967;
                    auVar369._12_4_ = 0x39506967;
                    auVar377 = vfmadd213ps_fma(auVar369,auVar149,auVar487);
                    auVar377 = vfmadd213ps_fma(auVar377,auVar149,auVar257);
                    auVar349._8_4_ = 0x3d2aa9c1;
                    auVar349._0_8_ = 0x3d2aa9c13d2aa9c1;
                    auVar349._12_4_ = 0x3d2aa9c1;
                    auVar377 = vfmadd213ps_fma(auVar377,auVar149,auVar349);
                    auVar308._8_4_ = 0x3e2aaaaa;
                    auVar308._0_8_ = 0x3e2aaaaa3e2aaaaa;
                    auVar308._12_4_ = 0x3e2aaaaa;
                    auVar377 = vfmadd213ps_fma(auVar377,auVar149,auVar308);
                    auVar377 = vfmadd213ps_fma(auVar377,auVar149,auVar360);
                    auVar377 = vfmadd213ps_fma(auVar377,auVar500,auVar149);
                    auVar193._0_4_ = auVar377._0_4_ + fVar89;
                    auVar193._4_4_ = auVar377._4_4_ + fVar88;
                    auVar193._8_4_ = auVar377._8_4_ + fVar518;
                    auVar193._12_4_ = auVar377._12_4_ + fVar250;
                    auVar386._0_4_ = (int)auVar427._0_4_;
                    auVar386._4_4_ = (int)auVar427._4_4_;
                    auVar386._8_4_ = (int)auVar427._8_4_;
                    auVar386._12_4_ = (int)auVar427._12_4_;
                    auVar427 = vpslld_avx(auVar386,0x17);
                    auVar427 = vpaddd_avx(auVar427,auVar252);
                    auVar90 = vfmadd213ps_fma(auVar427,auVar193,auVar252);
                    auVar194._8_4_ = 0x800000;
                    auVar194._0_8_ = 0x80000000800000;
                    auVar194._12_4_ = 0x800000;
                    auVar427 = vmaxps_avx(auVar90,auVar194);
                    auVar377 = vpsrld_avx(auVar427,0x17);
                    auVar309._8_4_ = 0xffffff82;
                    auVar309._0_8_ = 0xffffff82ffffff82;
                    auVar309._12_4_ = 0xffffff82;
                    auVar377 = vpaddd_avx(auVar377,auVar309);
                    auVar310._8_4_ = 0x807fffff;
                    auVar310._0_8_ = 0x807fffff807fffff;
                    auVar310._12_4_ = 0x807fffff;
                    auVar427 = vandps_avx(auVar427,auVar310);
                    auVar451 = vorps_avx(auVar427,auVar360);
                    auVar149 = vcvtdq2ps_avx(auVar377);
                    auVar311._8_4_ = 0x3f3504f3;
                    auVar311._0_8_ = 0x3f3504f33f3504f3;
                    auVar311._12_4_ = 0x3f3504f3;
                    auVar377 = vcmpps_avx(auVar451,auVar311,1);
                    auVar427 = vandps_avx(auVar377,auVar451);
                    auVar195._0_4_ = auVar427._0_4_ + auVar451._0_4_ + -1.0;
                    auVar195._4_4_ = auVar427._4_4_ + auVar451._4_4_ + -1.0;
                    auVar195._8_4_ = auVar427._8_4_ + auVar451._8_4_ + -1.0;
                    auVar195._12_4_ = auVar427._12_4_ + auVar451._12_4_ + -1.0;
                    auVar427 = vandps_avx(auVar377,auVar252);
                    auVar377 = vsubps_avx(auVar149,auVar427);
                    auVar422._0_4_ = auVar195._0_4_ * auVar195._0_4_;
                    auVar422._4_4_ = auVar195._4_4_ * auVar195._4_4_;
                    auVar422._8_4_ = auVar195._8_4_ * auVar195._8_4_;
                    auVar422._12_4_ = auVar195._12_4_ * auVar195._12_4_;
                    auVar434._8_4_ = 0x3d9021bb;
                    auVar434._0_8_ = 0x3d9021bb3d9021bb;
                    auVar434._12_4_ = 0x3d9021bb;
                    auVar312._8_4_ = 0xbdebd1b8;
                    auVar312._0_8_ = 0xbdebd1b8bdebd1b8;
                    auVar312._12_4_ = 0xbdebd1b8;
                    auVar427 = vfmadd213ps_fma(auVar434,auVar195,auVar312);
                    auVar313._8_4_ = 0x3def251a;
                    auVar313._0_8_ = 0x3def251a3def251a;
                    auVar313._12_4_ = 0x3def251a;
                    auVar427 = vfmadd213ps_fma(auVar427,auVar195,auVar313);
                    auVar314._8_4_ = 0xbdfe5d4f;
                    auVar314._0_8_ = 0xbdfe5d4fbdfe5d4f;
                    auVar314._12_4_ = 0xbdfe5d4f;
                    auVar427 = vfmadd213ps_fma(auVar427,auVar195,auVar314);
                    auVar315._8_4_ = 0x3e11e9bf;
                    auVar315._0_8_ = 0x3e11e9bf3e11e9bf;
                    auVar315._12_4_ = 0x3e11e9bf;
                    auVar427 = vfmadd213ps_fma(auVar427,auVar195,auVar315);
                    auVar316._8_4_ = 0xbe2aae50;
                    auVar316._0_8_ = 0xbe2aae50be2aae50;
                    auVar316._12_4_ = 0xbe2aae50;
                    auVar427 = vfmadd213ps_fma(auVar427,auVar195,auVar316);
                    auVar317._8_4_ = 0x3e4cceac;
                    auVar317._0_8_ = 0x3e4cceac3e4cceac;
                    auVar317._12_4_ = 0x3e4cceac;
                    auVar427 = vfmadd213ps_fma(auVar427,auVar195,auVar317);
                    auVar318._8_4_ = 0xbe7ffffc;
                    auVar318._0_8_ = 0xbe7ffffcbe7ffffc;
                    auVar318._12_4_ = 0xbe7ffffc;
                    auVar427 = vfmadd213ps_fma(auVar427,auVar195,auVar318);
                    auVar319._8_4_ = 0x3eaaaaaa;
                    auVar319._0_8_ = 0x3eaaaaaa3eaaaaaa;
                    auVar319._12_4_ = 0x3eaaaaaa;
                    auVar427 = vfmadd213ps_fma(auVar427,auVar195,auVar319);
                    auVar320._0_4_ = auVar427._0_4_ * auVar422._0_4_ * auVar195._0_4_;
                    auVar320._4_4_ = auVar427._4_4_ * auVar422._4_4_ * auVar195._4_4_;
                    auVar320._8_4_ = auVar427._8_4_ * auVar422._8_4_ * auVar195._8_4_;
                    auVar320._12_4_ = auVar427._12_4_ * auVar422._12_4_ * auVar195._12_4_;
                    auVar416 = ZEXT864(0) << 0x20;
                    auVar427 = vfmadd231ps_fma(auVar320,auVar377,auVar476);
                    auVar149 = vfmsub231ps_fma(auVar427,auVar360,auVar422);
                    auVar427 = vcmpps_avx(auVar90,ZEXT816(0) << 0x20,2);
                    auVar149 = vsubps_avx(auVar149,auVar195);
                    auVar377 = vfnmadd231ps_fma(auVar149,auVar458,auVar377);
                    auVar196._0_4_ = auVar377._0_4_ + auVar377._0_4_;
                    auVar196._4_4_ = auVar377._4_4_ + auVar377._4_4_;
                    auVar196._8_4_ = auVar377._8_4_ + auVar377._8_4_;
                    auVar196._12_4_ = auVar377._12_4_ + auVar377._12_4_;
                    auVar321._8_4_ = 0x7fffffff;
                    auVar321._0_8_ = 0x7fffffff7fffffff;
                    auVar321._12_4_ = 0x7fffffff;
                    auVar427 = vblendvps_avx(auVar196,auVar321,auVar427);
                    auVar322._8_4_ = 0x42b0c0a5;
                    auVar322._0_8_ = 0x42b0c0a542b0c0a5;
                    auVar322._12_4_ = 0x42b0c0a5;
                    auVar427 = vminps_avx(auVar427,auVar322);
                    auVar323._8_4_ = 0xc2b0c0a5;
                    auVar323._0_8_ = 0xc2b0c0a5c2b0c0a5;
                    auVar323._12_4_ = 0xc2b0c0a5;
                    auVar149 = vmaxps_avx(auVar427,auVar323);
                    auVar427 = vfmadd213ps_fma(auVar481,auVar149,auVar360);
                    auVar387._0_4_ = (int)auVar427._0_4_;
                    auVar387._4_4_ = (int)auVar427._4_4_;
                    auVar387._8_4_ = (int)auVar427._8_4_;
                    auVar387._12_4_ = (int)auVar427._12_4_;
                    auVar377 = vcvtdq2ps_avx(auVar387);
                    auVar427 = vcmpps_avx(auVar427,auVar377,1);
                    auVar427 = vandps_avx(auVar427,auVar252);
                    auVar427 = vsubps_avx(auVar377,auVar427);
                    auVar377 = vfmsub231ps_fma(auVar149,auVar427,auVar458);
                    auVar149 = vfnmsub231ps_fma(auVar377,auVar427,auVar476);
                    auVar388._0_4_ = auVar149._0_4_ * auVar149._0_4_;
                    auVar388._4_4_ = auVar149._4_4_ * auVar149._4_4_;
                    auVar388._8_4_ = auVar149._8_4_ * auVar149._8_4_;
                    auVar388._12_4_ = auVar149._12_4_ * auVar149._12_4_;
                    auVar377 = vfmadd213ps_fma(auVar369,auVar149,auVar487);
                    auVar377 = vfmadd213ps_fma(auVar377,auVar149,auVar257);
                    auVar377 = vfmadd213ps_fma(auVar377,auVar149,auVar349);
                    auVar364 = ZEXT1664(auVar252);
                    auVar100._8_4_ = 0x3e2aaaaa;
                    auVar100._0_8_ = 0x3e2aaaaa3e2aaaaa;
                    auVar100._12_4_ = 0x3e2aaaaa;
                    auVar377 = vfmadd213ps_fma(auVar377,auVar149,auVar100);
                    auVar377 = vfmadd213ps_fma(auVar377,auVar149,auVar360);
                    auVar377 = vfmadd213ps_fma(auVar377,auVar388,auVar149);
                    auVar197._0_4_ = auVar377._0_4_ + fVar89;
                    auVar197._4_4_ = auVar377._4_4_ + fVar88;
                    auVar197._8_4_ = auVar377._8_4_ + fVar518;
                    auVar197._12_4_ = auVar377._12_4_ + fVar250;
                    auVar324._0_4_ = (int)auVar427._0_4_;
                    auVar324._4_4_ = (int)auVar427._4_4_;
                    auVar324._8_4_ = (int)auVar427._8_4_;
                    auVar324._12_4_ = (int)auVar427._12_4_;
                    auVar427 = vpslld_avx(auVar324,0x17);
                    auVar427 = vpaddd_avx(auVar427,auVar252);
                    auVar427 = vfmadd213ps_fma(auVar427,auVar197,auVar252);
                    auVar252 = vrcpps_avx(auVar427);
                    auVar389._0_4_ = auVar252._0_4_ + auVar252._0_4_;
                    auVar389._4_4_ = auVar252._4_4_ + auVar252._4_4_;
                    auVar389._8_4_ = auVar252._8_4_ + auVar252._8_4_;
                    auVar389._12_4_ = auVar252._12_4_ + auVar252._12_4_;
                    auVar101._8_4_ = 0x40000000;
                    auVar101._0_8_ = 0x4000000040000000;
                    auVar101._12_4_ = 0x40000000;
                    auVar427 = vfmsub213ps_fma(auVar427,auVar389,auVar101);
                    auVar252 = vfnmadd213ps_fma(auVar427,auVar252,auVar389);
                    auVar143 = vfmsub231ps_fma(auVar143,auVar143,auVar252);
                    break;
                  case 6:
                    uVar2 = **(undefined4 **)(&this->field_0x118 + (long)p_Var61);
                    auVar203._4_4_ = uVar2;
                    auVar203._0_4_ = uVar2;
                    auVar203._8_4_ = uVar2;
                    auVar203._12_4_ = uVar2;
                    uVar2 = (*(undefined4 **)(&this->field_0x118 + (long)p_Var61))[1];
                    auVar325._4_4_ = uVar2;
                    auVar325._0_4_ = uVar2;
                    auVar325._8_4_ = uVar2;
                    auVar325._12_4_ = uVar2;
                    auVar377 = vfmadd231ps_fma(auVar325,auVar143,auVar203);
                    auVar427 = vmaxps_avx(auVar427,auVar377);
                    auVar252 = vminps_avx(auVar427,auVar252);
                    auVar143._0_4_ = auVar252._0_4_ * auVar143._0_4_;
                    auVar143._4_4_ = auVar252._4_4_ * fVar176;
                    auVar143._8_4_ = auVar252._8_4_ * fVar251;
                    auVar143._12_4_ = auVar252._12_4_ * fVar28;
                  }
                  *(undefined1 (*) [16])pAVar72 = auVar143;
                  pAVar72 = pAVar72 + 2;
                  uVar78 = uVar78 + 1;
                  iVar53 = iVar53 + 1;
                } while (uVar78 != local_1a8.w);
              }
              iVar70 = iVar70 + 1;
            } while (iVar70 != local_1a8.h);
          }
          local_278 = local_278 + 1;
        } while (local_278 != (long)local_1a8.c);
      }
      local_138._0_4_ = (uint)local_138 | (uint)local_150 ^ 1;
      if (((uint)local_138 == 0) && (0 < (long)local_1a8.c)) {
        p_Var61 = pp_Var18[-3];
        iVar14 = *(int *)(&this->field_0xdc + (long)p_Var61);
        iVar15 = *(int *)(&this->field_0xe0 + (long)p_Var61);
        iVar65 = *(int *)(&this->field_0xe4 + (long)p_Var61);
        iVar84 = *(int *)(&this->field_0xe8 + (long)p_Var61);
        uVar17 = *(undefined4 *)(&this->field_0x114 + (long)p_Var61);
        lVar79 = *(long *)(&this->field_0x1a8 + (long)p_Var61);
        uVar50 = *(uint *)(&this->field_0xd4 + (long)p_Var61);
        uVar16 = *(uint *)(&this->field_0xd8 + (long)p_Var61);
        local_278 = 0;
        auVar174 = ZEXT1664(ZEXT816(0) << 0x40);
        auVar491 = ZEXT1664(CONCAT412(0xc2b0c0a5,CONCAT48(0xc2b0c0a5,0xc2b0c0a5c2b0c0a5)));
        auVar175 = ZEXT1664(CONCAT412(0x3fb8aa3b,CONCAT48(0x3fb8aa3b,0x3fb8aa3b3fb8aa3b)));
        auVar416 = ZEXT1664(CONCAT412(0x3f000000,CONCAT48(0x3f000000,0x3f0000003f000000)));
        auVar361._8_4_ = 0x3f800000;
        auVar361._0_8_ = 0x3f8000003f800000;
        auVar361._12_4_ = 0x3f800000;
        auVar426 = ZEXT1664(CONCAT412(0x3f318000,CONCAT48(0x3f318000,0x3f3180003f318000)));
        auVar485 = ZEXT1664(CONCAT412(0x3ab743ce,CONCAT48(0x3ab743ce,0x3ab743ce3ab743ce)));
        auVar364 = ZEXT1664(CONCAT412(0x39506967,CONCAT48(0x39506967,0x3950696739506967)));
        auVar492 = ZEXT1664(CONCAT412(0x3c088908,CONCAT48(0x3c088908,0x3c0889083c088908)));
        do {
          if (0 < local_1a8.h) {
            iVar75 = bottom_blob->w;
            iVar77 = bottom_blob->h;
            pAVar72 = (Allocator *)
                      ((long)(_func_int ***)local_1a8.data +
                      local_1a8.cstep * local_278 * local_1a8.elemsize);
            uVar62 = bottom_blob->c;
            iVar70 = 0;
            do {
              if (0 < local_1a8.w) {
                uVar78 = 0;
                iVar53 = (1 - uVar50) * iVar14;
                do {
                  if (lVar79 == 0) {
                    auVar504 = ZEXT816(0) << 0x40;
                  }
                  else {
                    auVar504 = *(undefined1 (*) [16])(lVar79 + local_278 * 0x10);
                  }
                  auVar517 = ZEXT1664(auVar504);
                  if (0 < (int)uVar62) {
                    pvVar87 = (void *)((this->weight_data_tm).cstep * local_278 *
                                       (this->weight_data_tm).elemsize +
                                      (long)(this->weight_data_tm).data);
                    uVar64 = 0;
                    do {
                      if (0 < (int)uVar16) {
                        uVar83 = 0;
                        uVar67 = 0;
                        do {
                          iVar51 = (((int)uVar67 - uVar16) + 1) * iVar15 + iVar70;
                          if ((((-1 < iVar51) && (iVar52 = iVar51 / iVar84, iVar51 % iVar84 == 0))
                              && (iVar52 < iVar77)) && (0 < (int)uVar50)) {
                            uVar71 = uVar83;
                            uVar80 = (ulong)uVar50;
                            iVar51 = iVar53;
                            do {
                              if (((-1 < iVar51) && (iVar54 = iVar51 / iVar65, iVar51 % iVar65 == 0)
                                  ) && (iVar54 < iVar75)) {
                                uVar2 = *(undefined4 *)
                                         ((long)bottom_blob->data +
                                         (long)iVar54 * 4 +
                                         (long)iVar52 * (long)bottom_blob->w * bottom_blob->elemsize
                                         + bottom_blob->cstep * bottom_blob->elemsize * uVar64);
                                auVar147._4_4_ = uVar2;
                                auVar147._0_4_ = uVar2;
                                auVar147._8_4_ = uVar2;
                                auVar147._12_4_ = uVar2;
                                auVar252 = vfmadd231ps_fma(auVar517._0_16_,auVar147,
                                                           *(undefined1 (*) [16])
                                                            ((long)pvVar87 +
                                                            (uVar71 & 0xffffffff) * 4));
                                auVar517 = ZEXT1664(auVar252);
                              }
                              uVar71 = uVar71 + 4;
                              iVar51 = iVar51 + iVar14;
                              uVar80 = uVar80 - 1;
                            } while (uVar80 != 0);
                          }
                          uVar67 = uVar67 + 1;
                          uVar83 = uVar83 + (ulong)uVar50 * 4;
                        } while (uVar67 != uVar16);
                      }
                      auVar504 = auVar517._0_16_;
                      pvVar87 = (void *)((long)pvVar87 + (long)(int)(uVar50 * uVar16 * 4) * 4);
                      uVar64 = uVar64 + 1;
                    } while (uVar64 != uVar62);
                  }
                  auVar149 = auVar174._0_16_;
                  auVar427 = auVar416._0_16_;
                  auVar377 = auVar426._0_16_;
                  auVar252 = auVar364._0_16_;
                  auVar91 = auVar492._0_16_;
                  auVar133 = auVar485._0_16_;
                  auVar90 = auVar175._0_16_;
                  auVar451 = auVar491._0_16_;
                  fVar89 = auVar504._4_4_;
                  fVar88 = auVar504._8_4_;
                  fVar518 = auVar504._12_4_;
                  switch(uVar17) {
                  case 1:
                    auVar504 = vmaxps_avx(auVar504,auVar149);
                    break;
                  case 2:
                    auVar252 = vmaxps_avx(auVar504,auVar149);
                    auVar427 = vminps_avx(auVar504,auVar149);
                    uVar2 = **(undefined4 **)(&this->field_0x118 + (long)p_Var61);
                    auVar507._4_4_ = uVar2;
                    auVar507._0_4_ = uVar2;
                    auVar507._8_4_ = uVar2;
                    auVar507._12_4_ = uVar2;
                    auVar504 = vfmadd213ps_fma(auVar507,auVar427,auVar252);
                    break;
                  case 3:
                    uVar2 = **(undefined4 **)(&this->field_0x118 + (long)p_Var61);
                    auVar151._4_4_ = uVar2;
                    auVar151._0_4_ = uVar2;
                    auVar151._8_4_ = uVar2;
                    auVar151._12_4_ = uVar2;
                    uVar2 = (*(undefined4 **)(&this->field_0x118 + (long)p_Var61))[1];
                    auVar393._4_4_ = uVar2;
                    auVar393._0_4_ = uVar2;
                    auVar393._8_4_ = uVar2;
                    auVar393._12_4_ = uVar2;
                    auVar252 = vmaxps_avx(auVar504,auVar151);
                    auVar504 = vminps_avx(auVar393,auVar252);
                    break;
                  case 4:
                    auVar152._0_8_ = auVar504._0_8_ ^ 0x8000000080000000;
                    auVar152._8_4_ = -fVar88;
                    auVar152._12_4_ = -fVar518;
                    auVar108._8_4_ = 0x42b0c0a5;
                    auVar108._0_8_ = 0x42b0c0a542b0c0a5;
                    auVar108._12_4_ = 0x42b0c0a5;
                    auVar149 = vminps_avx(auVar152,auVar108);
                    auVar392 = vmaxps_avx(auVar451,auVar149);
                    auVar149 = vfmadd213ps_fma(auVar90,auVar392,auVar427);
                    auVar505._0_4_ = (int)auVar149._0_4_;
                    auVar505._4_4_ = (int)auVar149._4_4_;
                    auVar505._8_4_ = (int)auVar149._8_4_;
                    auVar505._12_4_ = (int)auVar149._12_4_;
                    auVar451 = vcvtdq2ps_avx(auVar505);
                    auVar149 = vcmpps_avx(auVar149,auVar451,1);
                    auVar149 = vandps_avx(auVar149,auVar361);
                    auVar149 = vsubps_avx(auVar451,auVar149);
                    auVar377 = vfmsub231ps_fma(auVar392,auVar149,auVar377);
                    auVar209._8_4_ = 0x395e8083;
                    auVar209._0_8_ = 0x395e8083395e8083;
                    auVar209._12_4_ = 0x395e8083;
                    auVar377 = vfmsub231ps_fma(auVar377,auVar149,auVar209);
                    auVar506._0_4_ = auVar377._0_4_ * auVar377._0_4_;
                    auVar506._4_4_ = auVar377._4_4_ * auVar377._4_4_;
                    auVar506._8_4_ = auVar377._8_4_ * auVar377._8_4_;
                    auVar506._12_4_ = auVar377._12_4_ * auVar377._12_4_;
                    auVar252 = vfmadd213ps_fma(auVar252,auVar377,auVar133);
                    auVar252 = vfmadd213ps_fma(auVar252,auVar377,auVar91);
                    auVar210._8_4_ = 0x3d2aa9c1;
                    auVar210._0_8_ = 0x3d2aa9c13d2aa9c1;
                    auVar210._12_4_ = 0x3d2aa9c1;
                    auVar252 = vfmadd213ps_fma(auVar252,auVar377,auVar210);
                    auVar109._8_4_ = 0x3e2aaaaa;
                    auVar109._0_8_ = 0x3e2aaaaa3e2aaaaa;
                    auVar109._12_4_ = 0x3e2aaaaa;
                    auVar252 = vfmadd213ps_fma(auVar252,auVar377,auVar109);
                    auVar252 = vfmadd213ps_fma(auVar252,auVar377,auVar427);
                    auVar252 = vfmadd213ps_fma(auVar252,auVar506,auVar377);
                    auVar153._0_4_ = auVar252._0_4_ + 1.0;
                    auVar153._4_4_ = auVar252._4_4_ + 1.0;
                    auVar153._8_4_ = auVar252._8_4_ + 1.0;
                    auVar153._12_4_ = auVar252._12_4_ + 1.0;
                    auVar394._0_4_ = (int)auVar149._0_4_;
                    auVar394._4_4_ = (int)auVar149._4_4_;
                    auVar394._8_4_ = (int)auVar149._8_4_;
                    auVar394._12_4_ = (int)auVar149._12_4_;
                    auVar252 = vpslld_avx(auVar394,0x17);
                    auVar252 = vpaddd_avx(auVar252,auVar361);
                    auVar427 = vfmadd213ps_fma(auVar252,auVar153,auVar361);
                    auVar252 = vrcpps_avx(auVar427);
                    auVar427 = vfmsub213ps_fma(auVar427,auVar252,auVar361);
                    auVar504 = vfnmadd132ps_fma(auVar427,auVar252,auVar252);
                    break;
                  case 5:
                    auVar326._8_4_ = 0x42b0c0a5;
                    auVar326._0_8_ = 0x42b0c0a542b0c0a5;
                    auVar326._12_4_ = 0x42b0c0a5;
                    auVar149 = vminps_avx(auVar504,auVar326);
                    auVar374 = vmaxps_avx(auVar451,auVar149);
                    auVar149 = vfmadd213ps_fma(auVar90,auVar374,auVar427);
                    auVar437._0_4_ = (int)auVar149._0_4_;
                    auVar437._4_4_ = (int)auVar149._4_4_;
                    auVar437._8_4_ = (int)auVar149._8_4_;
                    auVar437._12_4_ = (int)auVar149._12_4_;
                    auVar392 = vcvtdq2ps_avx(auVar437);
                    auVar149 = vcmpps_avx(auVar149,auVar392,1);
                    auVar149 = vandps_avx(auVar149,auVar361);
                    auVar149 = vsubps_avx(auVar392,auVar149);
                    auVar392 = vfmsub231ps_fma(auVar374,auVar149,auVar377);
                    auVar105._8_4_ = 0xb95e8083;
                    auVar105._0_8_ = 0xb95e8083b95e8083;
                    auVar105._12_4_ = 0xb95e8083;
                    auVar374 = vfnmsub231ps_fma(auVar392,auVar149,auVar105);
                    auVar438._0_4_ = auVar374._0_4_ * auVar374._0_4_;
                    auVar438._4_4_ = auVar374._4_4_ * auVar374._4_4_;
                    auVar438._8_4_ = auVar374._8_4_ * auVar374._8_4_;
                    auVar438._12_4_ = auVar374._12_4_ * auVar374._12_4_;
                    auVar392 = vfmadd213ps_fma(auVar252,auVar374,auVar133);
                    auVar392 = vfmadd213ps_fma(auVar392,auVar374,auVar91);
                    auVar350._8_4_ = 0x3d2aa9c1;
                    auVar350._0_8_ = 0x3d2aa9c13d2aa9c1;
                    auVar350._12_4_ = 0x3d2aa9c1;
                    auVar392 = vfmadd213ps_fma(auVar392,auVar374,auVar350);
                    auVar351._8_4_ = 0x3e2aaaaa;
                    auVar351._0_8_ = 0x3e2aaaaa3e2aaaaa;
                    auVar351._12_4_ = 0x3e2aaaaa;
                    auVar392 = vfmadd213ps_fma(auVar392,auVar374,auVar351);
                    auVar392 = vfmadd213ps_fma(auVar392,auVar374,auVar427);
                    auVar392 = vfmadd213ps_fma(auVar392,auVar438,auVar374);
                    auVar204._0_4_ = auVar392._0_4_ + 1.0;
                    auVar204._4_4_ = auVar392._4_4_ + 1.0;
                    auVar204._8_4_ = auVar392._8_4_ + 1.0;
                    auVar204._12_4_ = auVar392._12_4_ + 1.0;
                    auVar148._0_4_ = (int)auVar149._0_4_;
                    auVar148._4_4_ = (int)auVar149._4_4_;
                    auVar148._8_4_ = (int)auVar149._8_4_;
                    auVar148._12_4_ = (int)auVar149._12_4_;
                    auVar149 = vpslld_avx(auVar148,0x17);
                    auVar149 = vpaddd_avx(auVar149,auVar361);
                    auVar92 = vfmadd213ps_fma(auVar149,auVar204,auVar361);
                    auVar205._8_4_ = 0x800000;
                    auVar205._0_8_ = 0x80000000800000;
                    auVar205._12_4_ = 0x800000;
                    auVar149 = vmaxps_avx(auVar92,auVar205);
                    auVar392 = vpsrld_avx(auVar149,0x17);
                    auVar352._8_4_ = 0xffffff82;
                    auVar352._0_8_ = 0xffffff82ffffff82;
                    auVar352._12_4_ = 0xffffff82;
                    auVar392 = vpaddd_avx(auVar392,auVar352);
                    auVar353._8_4_ = 0x807fffff;
                    auVar353._0_8_ = 0x807fffff807fffff;
                    auVar353._12_4_ = 0x807fffff;
                    auVar149 = vandps_avx(auVar149,auVar353);
                    auVar452 = vorps_avx(auVar149,auVar427);
                    auVar374 = vcvtdq2ps_avx(auVar392);
                    auVar354._8_4_ = 0x3f3504f3;
                    auVar354._0_8_ = 0x3f3504f33f3504f3;
                    auVar354._12_4_ = 0x3f3504f3;
                    auVar392 = vcmpps_avx(auVar452,auVar354,1);
                    auVar149 = vandps_avx(auVar392,auVar452);
                    auVar206._0_4_ = auVar149._0_4_ + auVar452._0_4_ + -1.0;
                    auVar206._4_4_ = auVar149._4_4_ + auVar452._4_4_ + -1.0;
                    auVar206._8_4_ = auVar149._8_4_ + auVar452._8_4_ + -1.0;
                    auVar206._12_4_ = auVar149._12_4_ + auVar452._12_4_ + -1.0;
                    auVar149 = vandps_avx(auVar392,auVar361);
                    auVar392 = vsubps_avx(auVar374,auVar149);
                    auVar423._0_4_ = auVar206._0_4_ * auVar206._0_4_;
                    auVar423._4_4_ = auVar206._4_4_ * auVar206._4_4_;
                    auVar423._8_4_ = auVar206._8_4_ * auVar206._8_4_;
                    auVar423._12_4_ = auVar206._12_4_ * auVar206._12_4_;
                    auVar439._8_4_ = 0x3d9021bb;
                    auVar439._0_8_ = 0x3d9021bb3d9021bb;
                    auVar439._12_4_ = 0x3d9021bb;
                    auVar327._8_4_ = 0xbdebd1b8;
                    auVar327._0_8_ = 0xbdebd1b8bdebd1b8;
                    auVar327._12_4_ = 0xbdebd1b8;
                    auVar149 = vfmadd213ps_fma(auVar439,auVar206,auVar327);
                    auVar328._8_4_ = 0x3def251a;
                    auVar328._0_8_ = 0x3def251a3def251a;
                    auVar328._12_4_ = 0x3def251a;
                    auVar149 = vfmadd213ps_fma(auVar149,auVar206,auVar328);
                    auVar329._8_4_ = 0xbdfe5d4f;
                    auVar329._0_8_ = 0xbdfe5d4fbdfe5d4f;
                    auVar329._12_4_ = 0xbdfe5d4f;
                    auVar149 = vfmadd213ps_fma(auVar149,auVar206,auVar329);
                    auVar330._8_4_ = 0x3e11e9bf;
                    auVar330._0_8_ = 0x3e11e9bf3e11e9bf;
                    auVar330._12_4_ = 0x3e11e9bf;
                    auVar149 = vfmadd213ps_fma(auVar149,auVar206,auVar330);
                    auVar331._8_4_ = 0xbe2aae50;
                    auVar331._0_8_ = 0xbe2aae50be2aae50;
                    auVar331._12_4_ = 0xbe2aae50;
                    auVar149 = vfmadd213ps_fma(auVar149,auVar206,auVar331);
                    auVar332._8_4_ = 0x3e4cceac;
                    auVar332._0_8_ = 0x3e4cceac3e4cceac;
                    auVar332._12_4_ = 0x3e4cceac;
                    auVar149 = vfmadd213ps_fma(auVar149,auVar206,auVar332);
                    auVar333._8_4_ = 0xbe7ffffc;
                    auVar333._0_8_ = 0xbe7ffffcbe7ffffc;
                    auVar333._12_4_ = 0xbe7ffffc;
                    auVar149 = vfmadd213ps_fma(auVar149,auVar206,auVar333);
                    auVar334._8_4_ = 0x3eaaaaaa;
                    auVar334._0_8_ = 0x3eaaaaaa3eaaaaaa;
                    auVar334._12_4_ = 0x3eaaaaaa;
                    auVar149 = vfmadd213ps_fma(auVar149,auVar206,auVar334);
                    auVar335._0_4_ = auVar149._0_4_ * auVar423._0_4_ * auVar206._0_4_;
                    auVar335._4_4_ = auVar149._4_4_ * auVar423._4_4_ * auVar206._4_4_;
                    auVar335._8_4_ = auVar149._8_4_ * auVar423._8_4_ * auVar206._8_4_;
                    auVar335._12_4_ = auVar149._12_4_ * auVar423._12_4_ * auVar206._12_4_;
                    auVar440._8_4_ = 0xb95e8083;
                    auVar440._0_8_ = 0xb95e8083b95e8083;
                    auVar440._12_4_ = 0xb95e8083;
                    auVar149 = vfmadd231ps_fma(auVar335,auVar392,auVar440);
                    auVar374 = vfmsub231ps_fma(auVar149,auVar427,auVar423);
                    auVar491 = ZEXT1664(auVar451);
                    auVar175 = ZEXT1664(auVar90);
                    auVar485 = ZEXT1664(auVar133);
                    auVar492 = ZEXT1664(auVar91);
                    auVar364 = ZEXT1664(auVar252);
                    auVar426 = ZEXT1664(auVar377);
                    auVar42._12_4_ = 0;
                    auVar42._0_12_ = ZEXT412(0);
                    auVar174 = ZEXT1264(ZEXT412(0)) << 0x20;
                    auVar149 = vcmpps_avx(auVar92,auVar42 << 0x20,2);
                    auVar374 = vsubps_avx(auVar374,auVar206);
                    auVar392 = vfnmadd231ps_fma(auVar374,auVar377,auVar392);
                    auVar207._0_4_ = auVar392._0_4_ + auVar392._0_4_;
                    auVar207._4_4_ = auVar392._4_4_ + auVar392._4_4_;
                    auVar207._8_4_ = auVar392._8_4_ + auVar392._8_4_;
                    auVar207._12_4_ = auVar392._12_4_ + auVar392._12_4_;
                    auVar336._8_4_ = 0x7fffffff;
                    auVar336._0_8_ = 0x7fffffff7fffffff;
                    auVar336._12_4_ = 0x7fffffff;
                    auVar149 = vblendvps_avx(auVar207,auVar336,auVar149);
                    auVar149 = vminps_avx(auVar326,auVar149);
                    auVar392 = vmaxps_avx(auVar451,auVar149);
                    auVar149 = vfmadd213ps_fma(auVar90,auVar392,auVar427);
                    auVar337._0_4_ = (int)auVar149._0_4_;
                    auVar337._4_4_ = (int)auVar149._4_4_;
                    auVar337._8_4_ = (int)auVar149._8_4_;
                    auVar337._12_4_ = (int)auVar149._12_4_;
                    auVar451 = vcvtdq2ps_avx(auVar337);
                    auVar149 = vcmpps_avx(auVar149,auVar451,1);
                    auVar149 = vandps_avx(auVar149,auVar361);
                    auVar149 = vsubps_avx(auVar451,auVar149);
                    auVar377 = vfmsub231ps_fma(auVar392,auVar149,auVar377);
                    auVar338._8_4_ = 0xb95e8083;
                    auVar338._0_8_ = 0xb95e8083b95e8083;
                    auVar338._12_4_ = 0xb95e8083;
                    auVar377 = vfnmsub231ps_fma(auVar377,auVar149,auVar338);
                    auVar339._0_4_ = auVar377._0_4_ * auVar377._0_4_;
                    auVar339._4_4_ = auVar377._4_4_ * auVar377._4_4_;
                    auVar339._8_4_ = auVar377._8_4_ * auVar377._8_4_;
                    auVar339._12_4_ = auVar377._12_4_ * auVar377._12_4_;
                    auVar252 = vfmadd213ps_fma(auVar252,auVar377,auVar133);
                    auVar252 = vfmadd213ps_fma(auVar252,auVar377,auVar91);
                    auVar355._8_4_ = 0x3d2aa9c1;
                    auVar355._0_8_ = 0x3d2aa9c13d2aa9c1;
                    auVar355._12_4_ = 0x3d2aa9c1;
                    auVar252 = vfmadd213ps_fma(auVar252,auVar377,auVar355);
                    auVar416 = ZEXT1664(auVar427);
                    auVar106._8_4_ = 0x3e2aaaaa;
                    auVar106._0_8_ = 0x3e2aaaaa3e2aaaaa;
                    auVar106._12_4_ = 0x3e2aaaaa;
                    auVar252 = vfmadd213ps_fma(auVar252,auVar377,auVar106);
                    auVar252 = vfmadd213ps_fma(auVar252,auVar377,auVar427);
                    auVar252 = vfmadd213ps_fma(auVar252,auVar339,auVar377);
                    auVar150._0_4_ = auVar252._0_4_ + 1.0;
                    auVar150._4_4_ = auVar252._4_4_ + 1.0;
                    auVar150._8_4_ = auVar252._8_4_ + 1.0;
                    auVar150._12_4_ = auVar252._12_4_ + 1.0;
                    auVar208._0_4_ = (int)auVar149._0_4_;
                    auVar208._4_4_ = (int)auVar149._4_4_;
                    auVar208._8_4_ = (int)auVar149._8_4_;
                    auVar208._12_4_ = (int)auVar149._12_4_;
                    auVar252 = vpslld_avx(auVar208,0x17);
                    auVar252 = vpaddd_avx(auVar252,auVar361);
                    auVar427 = vfmadd213ps_fma(auVar252,auVar150,auVar361);
                    auVar252 = vrcpps_avx(auVar427);
                    auVar340._0_4_ = auVar252._0_4_ + auVar252._0_4_;
                    auVar340._4_4_ = auVar252._4_4_ + auVar252._4_4_;
                    auVar340._8_4_ = auVar252._8_4_ + auVar252._8_4_;
                    auVar340._12_4_ = auVar252._12_4_ + auVar252._12_4_;
                    auVar107._8_4_ = 0x40000000;
                    auVar107._0_8_ = 0x4000000040000000;
                    auVar107._12_4_ = 0x40000000;
                    auVar427 = vfmsub213ps_fma(auVar427,auVar340,auVar107);
                    auVar252 = vfnmadd213ps_fma(auVar427,auVar252,auVar340);
                    auVar504 = vfmsub231ps_fma(auVar504,auVar504,auVar252);
                    break;
                  case 6:
                    uVar2 = **(undefined4 **)(&this->field_0x118 + (long)p_Var61);
                    auVar154._4_4_ = uVar2;
                    auVar154._0_4_ = uVar2;
                    auVar154._8_4_ = uVar2;
                    auVar154._12_4_ = uVar2;
                    uVar2 = (*(undefined4 **)(&this->field_0x118 + (long)p_Var61))[1];
                    auVar211._4_4_ = uVar2;
                    auVar211._0_4_ = uVar2;
                    auVar211._8_4_ = uVar2;
                    auVar211._12_4_ = uVar2;
                    auVar252 = vfmadd231ps_fma(auVar211,auVar504,auVar154);
                    auVar252 = vmaxps_avx(auVar149,auVar252);
                    auVar252 = vminps_avx(auVar252,auVar361);
                    auVar504._0_4_ = auVar504._0_4_ * auVar252._0_4_;
                    auVar504._4_4_ = fVar89 * auVar252._4_4_;
                    auVar504._8_4_ = fVar88 * auVar252._8_4_;
                    auVar504._12_4_ = fVar518 * auVar252._12_4_;
                  }
                  *(undefined1 (*) [16])pAVar72 = auVar504;
                  pAVar72 = pAVar72 + 2;
                  uVar78 = uVar78 + 1;
                  iVar53 = iVar53 + 1;
                } while (uVar78 != local_1a8.w);
              }
              iVar70 = iVar70 + 1;
            } while (iVar70 != local_1a8.h);
          }
          local_278 = local_278 + 1;
        } while (local_278 != (long)local_1a8.c);
      }
      if (((uint)local_150 == 4 && uVar55 == 1) && (local_138 = (long)local_1a8.c, 0 < local_138)) {
        p_Var61 = pp_Var18[-3];
        iVar14 = *(int *)(&this->field_0xdc + (long)p_Var61);
        iVar15 = *(int *)(&this->field_0xe0 + (long)p_Var61);
        iVar65 = *(int *)(&this->field_0xe4 + (long)p_Var61);
        iVar84 = *(int *)(&this->field_0xe8 + (long)p_Var61);
        iVar75 = *(int *)(&this->field_0x114 + (long)p_Var61);
        lVar79 = *(long *)(&this->field_0x1a8 + (long)p_Var61);
        uVar50 = *(uint *)(&this->field_0xd4 + (long)p_Var61);
        uVar16 = *(uint *)(&this->field_0xd8 + (long)p_Var61);
        local_158 = (_func_int **)(local_1a8.elemsize * local_1a8.cstep);
        local_120 = (Allocator *)local_1a8.data;
        iVar77 = bottom_blob->w;
        iVar70 = bottom_blob->h;
        uVar62 = bottom_blob->c;
        local_278 = 0;
        do {
          if (0 < iVar63) {
            sVar20 = (this->weight_data_tm).cstep;
            sVar21 = (this->weight_data_tm).elemsize;
            local_230 = (Allocator *)
                        ((long)&local_120->_vptr_Allocator + (long)local_158 * local_278);
            pvVar87 = (this->weight_data_tm).data;
            iVar53 = 0;
            do {
              if (0 < iVar66) {
                iVar52 = bottom_blob->w;
                pvVar86 = bottom_blob->data;
                sVar22 = bottom_blob->elemsize;
                sVar23 = bottom_blob->cstep;
                pfVar85 = *(float **)(&this->field_0x118 + (long)p_Var61);
                uVar78 = 0;
                iVar51 = (1 - uVar50) * iVar14;
                do {
                  if (lVar79 == 0) {
                    fVar89 = 0.0;
                  }
                  else {
                    fVar89 = *(float *)(lVar79 + local_278 * 4);
                  }
                  if ((int)uVar62 < 1) {
                    auVar252 = SUB6416(ZEXT864(0),0);
                  }
                  else {
                    auVar364 = ZEXT864(0);
                    uVar64 = 0;
                    pvVar74 = (void *)(sVar20 * local_278 * sVar21 + (long)pvVar87);
                    do {
                      if (0 < (int)uVar16) {
                        uVar83 = 0;
                        uVar67 = 0;
                        do {
                          iVar54 = (((int)uVar67 - uVar16) + 1) * iVar15 + iVar53;
                          if ((((-1 < iVar54) && (iVar56 = iVar54 / iVar84, iVar54 % iVar84 == 0))
                              && (0 < (int)uVar50)) && (iVar56 < iVar70)) {
                            uVar71 = (ulong)uVar50;
                            uVar80 = uVar83;
                            iVar54 = iVar51;
                            do {
                              if (((-1 < iVar54) && (iVar57 = iVar54 / iVar65, iVar54 % iVar65 == 0)
                                  ) && (iVar57 < iVar77)) {
                                auVar252 = vfmadd231ps_fma(auVar364._0_16_,
                                                           *(undefined1 (*) [16])
                                                            ((long)pvVar86 +
                                                            (long)(iVar57 << 2) * 4 +
                                                            (long)iVar56 * (long)iVar52 * sVar22 +
                                                            sVar23 * sVar22 * uVar64),
                                                           *(undefined1 (*) [16])
                                                            ((long)pvVar74 +
                                                            (uVar80 & 0xffffffff) * 4));
                                auVar364 = ZEXT1664(auVar252);
                              }
                              uVar80 = uVar80 + 4;
                              iVar54 = iVar54 + iVar14;
                              uVar71 = uVar71 - 1;
                            } while (uVar71 != 0);
                          }
                          uVar67 = uVar67 + 1;
                          uVar83 = uVar83 + (ulong)uVar50 * 4;
                        } while (uVar67 != uVar16);
                      }
                      auVar252 = auVar364._0_16_;
                      pvVar74 = (void *)((long)pvVar74 + (long)(int)(uVar50 * uVar16 * 4) * 4);
                      uVar64 = uVar64 + 1;
                    } while (uVar64 != uVar62);
                  }
                  auVar427 = vshufpd_avx(auVar252,auVar252,1);
                  auVar155._0_4_ = auVar427._0_4_ + auVar252._0_4_;
                  auVar155._4_4_ = auVar427._4_4_ + auVar252._4_4_;
                  auVar155._8_4_ = auVar427._8_4_ + auVar252._8_4_;
                  auVar155._12_4_ = auVar427._12_4_ + auVar252._12_4_;
                  auVar252 = vmovshdup_avx(auVar155);
                  fVar89 = auVar252._0_4_ + fVar89 + auVar155._0_4_;
                  auVar252 = ZEXT416((uint)fVar89);
                  fVar88 = fVar89;
                  if (iVar75 - 1U < 6) {
                    switch(iVar75) {
                    case 1:
                      auVar252 = vmaxss_avx(ZEXT416((uint)fVar89),ZEXT416(0));
                      fVar88 = auVar252._0_4_;
                      break;
                    case 2:
                      auVar110._0_12_ = ZEXT812(0);
                      auVar110._12_4_ = 0;
                      auVar252 = vcmpss_avx(auVar110,ZEXT416((uint)fVar89),1);
                      auVar213._8_4_ = 0x3f800000;
                      auVar213._0_8_ = 0x3f8000003f800000;
                      auVar213._12_4_ = 0x3f800000;
                      auVar252 = vblendvps_avx(ZEXT416((uint)*pfVar85),auVar213,auVar252);
                      fVar88 = auVar252._0_4_ * fVar89;
                      break;
                    case 3:
                      auVar252 = vmaxss_avx(auVar252,ZEXT416((uint)*pfVar85));
                      fVar88 = auVar252._0_4_;
                      if (pfVar85[1] < auVar252._0_4_) {
                        fVar88 = pfVar85[1];
                      }
                      break;
                    case 4:
                      auVar252 = vminss_avx(auVar252,ZEXT416(0x42b0c0a5));
                      auVar156._0_8_ = auVar252._0_8_ ^ 0x8000000080000000;
                      auVar156._8_4_ = auVar252._8_4_ ^ 0x80000000;
                      auVar156._12_4_ = auVar252._12_4_ ^ 0x80000000;
                      auVar252 = vcmpss_avx(auVar252,ZEXT416(0xc2b0c0a5),1);
                      auVar212._8_4_ = 0x42b0c0a5;
                      auVar212._0_8_ = 0x42b0c0a542b0c0a5;
                      auVar212._12_4_ = 0x42b0c0a5;
                      auVar252 = vblendvps_avx(auVar156,auVar212,auVar252);
                      fVar89 = expf(auVar252._0_4_);
                      fVar88 = 1.0 / (fVar89 + 1.0);
                      break;
                    case 5:
                      fVar88 = expf(fVar89);
                      fVar88 = logf(fVar88 + 1.0);
                      fVar88 = tanhf(fVar88);
                      fVar88 = fVar88 * fVar89;
                      break;
                    case 6:
                      fVar518 = *pfVar85;
                      fVar250 = -pfVar85[1] / fVar518;
                      fVar88 = 0.0;
                      if ((fVar250 <= fVar89) &&
                         (fVar88 = fVar89, fVar89 <= fVar250 + 1.0 / fVar518)) {
                        auVar252 = vfmadd213ss_fma(ZEXT416((uint)fVar518),auVar252,
                                                   ZEXT416((uint)pfVar85[1]));
                        fVar88 = auVar252._0_4_ * fVar89;
                      }
                    }
                  }
                  *(float *)&local_230->_vptr_Allocator = fVar88;
                  local_230 = (Allocator *)((long)&local_230->_vptr_Allocator + 4);
                  uVar78 = uVar78 + 1;
                  iVar51 = iVar51 + 1;
                } while (uVar78 != iVar66);
              }
              iVar53 = iVar53 + 1;
            } while (iVar53 != iVar63);
          }
          local_278 = local_278 + 1;
        } while (local_278 != local_138);
      }
      iVar15 = local_1a8.h;
      iVar14 = local_1a8.w;
      pvVar87 = local_1a8.data;
      if (uVar55 == 1 && (int)local_150 == 1) {
        pp_Var18 = this->_vptr_Deconvolution_x86_fma;
        p_Var61 = pp_Var18[-3];
        if (0 < *(int *)(&this->field_0xd0 + (long)p_Var61)) {
          lVar79 = local_1a8.cstep * local_1a8.elemsize;
          iVar66 = bottom_blob->w;
          iVar63 = bottom_blob->h;
          uVar50 = bottom_blob->c;
          uVar64 = (ulong)(uint)local_1a8.w;
          lVar59 = (long)local_124;
          lVar82 = (long)local_1a8.w;
          local_148 = CONCAT44(local_148._4_4_,-(int)local_148);
          local_238 = 0;
          do {
            if (0 < iVar15) {
              local_270 = (Allocator *)((long)(_func_int ***)pvVar87 + lVar79 * local_238);
              pp_Var25 = this->_vptr_Deconvolution_x86_fma;
              sVar20 = (this->weight_data_tm).cstep;
              sVar21 = (this->weight_data_tm).elemsize;
              pvVar86 = (this->weight_data_tm).data;
              iVar65 = 0;
              do {
                if (0 < iVar14) {
                  iVar84 = bottom_blob->w;
                  pvVar74 = bottom_blob->data;
                  sVar22 = bottom_blob->elemsize;
                  sVar23 = bottom_blob->cstep;
                  pp_Var26 = this->_vptr_Deconvolution_x86_fma;
                  local_220 = local_148 & 0xffffffff;
                  uVar67 = 0;
                  do {
                    p_Var61 = pp_Var25[-3];
                    if (*(int *)(&this->field_0x10c + (long)p_Var61) == 0) {
                      auVar364 = ZEXT1664(ZEXT816(0) << 0x40);
                    }
                    else {
                      auVar364 = ZEXT464(*(uint *)(*(long *)(&this->field_0x1a8 + (long)p_Var61) +
                                                  local_238 * 4));
                    }
                    auVar252 = auVar364._0_16_;
                    if (0 < (int)uVar50) {
                      p_Var27 = pp_Var26[-3];
                      uVar83 = 0;
                      local_258 = (void *)(sVar20 * sVar21 * local_238 + (long)pvVar86);
                      do {
                        if (0 < *(int *)(&this->field_0xd8 + (long)p_Var27)) {
                          iVar75 = 0;
                          do {
                            iVar77 = *(int *)(&this->field_0xe0 + (long)p_Var27) * iVar75 +
                                     (iVar65 - iVar76);
                            if (((-1 < iVar77) &&
                                (iVar70 = iVar77 / *(int *)(&this->field_0xe8 + (long)p_Var27),
                                iVar77 % *(int *)(&this->field_0xe8 + (long)p_Var27) == 0)) &&
                               (iVar70 < iVar63)) {
                              iVar77 = *(int *)(&this->field_0xd4 + (long)p_Var27);
                              if (0 < (long)iVar77) {
                                lVar81 = 0;
                                iVar53 = (int)local_220;
                                do {
                                  if (((-1 < iVar53) &&
                                      (iVar51 = iVar53 / *(int *)(&this->field_0xe4 + (long)p_Var27)
                                      , iVar53 % *(int *)(&this->field_0xe4 + (long)p_Var27) == 0))
                                     && (iVar51 < iVar66)) {
                                    auVar252 = vfmadd231ss_fma(auVar364._0_16_,
                                                               ZEXT416(*(uint *)((long)local_258 +
                                                                                lVar81 * 4 +
                                                                                (ulong)(uint)(iVar77
                                                                                             * 
                                                  iVar75) * 4)),
                                                  ZEXT416(*(uint *)((long)pvVar74 +
                                                                   (long)iVar51 * 4 +
                                                                   (long)iVar70 *
                                                                   (long)iVar84 * sVar22 +
                                                                   sVar23 * sVar22 * uVar83)));
                                    auVar364 = ZEXT1664(auVar252);
                                  }
                                  lVar81 = lVar81 + 1;
                                  iVar53 = iVar53 + *(int *)(&this->field_0xdc + (long)p_Var27);
                                } while (iVar77 != lVar81);
                              }
                            }
                            iVar75 = iVar75 + 1;
                          } while (iVar75 != *(int *)(&this->field_0xd8 + (long)p_Var27));
                        }
                        auVar252 = auVar364._0_16_;
                        uVar83 = uVar83 + 1;
                        local_258 = (void *)((long)local_258 + lVar59 * 4);
                      } while (uVar83 != uVar50);
                    }
                    fVar88 = auVar252._0_4_;
                    fVar89 = fVar88;
                    switch(*(undefined4 *)(&this->field_0x114 + (long)p_Var61)) {
                    case 1:
                      auVar252 = vmaxss_avx(auVar252,ZEXT416(0));
                      fVar89 = auVar252._0_4_;
                      break;
                    case 2:
                      auVar252 = vcmpss_avx(ZEXT816(0) << 0x40,auVar252,1);
                      auVar215._8_4_ = 0x3f800000;
                      auVar215._0_8_ = 0x3f8000003f800000;
                      auVar215._12_4_ = 0x3f800000;
                      auVar252 = vblendvps_avx(ZEXT416(**(uint **)(&this->field_0x118 +
                                                                  (long)p_Var61)),auVar215,auVar252)
                      ;
                      fVar89 = auVar252._0_4_ * fVar88;
                      break;
                    case 3:
                      fVar88 = (float)(*(uint **)(&this->field_0x118 + (long)p_Var61))[1];
                      auVar252 = vmaxss_avx(auVar252,ZEXT416(**(uint **)(&this->field_0x118 +
                                                                        (long)p_Var61)));
                      fVar89 = auVar252._0_4_;
                      if (fVar88 < auVar252._0_4_) {
                        fVar89 = fVar88;
                      }
                      break;
                    case 4:
                      auVar252 = vminss_avx(auVar252,ZEXT416(0x42b0c0a5));
                      auVar157._0_8_ = auVar252._0_8_ ^ 0x8000000080000000;
                      auVar157._8_4_ = auVar252._8_4_ ^ 0x80000000;
                      auVar157._12_4_ = auVar252._12_4_ ^ 0x80000000;
                      auVar252 = vcmpss_avx(auVar252,ZEXT416(0xc2b0c0a5),1);
                      auVar214._8_4_ = 0x42b0c0a5;
                      auVar214._0_8_ = 0x42b0c0a542b0c0a5;
                      auVar214._12_4_ = 0x42b0c0a5;
                      auVar252 = vblendvps_avx(auVar157,auVar214,auVar252);
                      fVar89 = expf(auVar252._0_4_);
                      fVar89 = 1.0 / (fVar89 + 1.0);
                      break;
                    case 5:
                      fVar89 = expf(fVar88);
                      fVar89 = logf(fVar89 + 1.0);
                      fVar89 = tanhf(fVar89);
                      fVar89 = fVar89 * fVar88;
                      break;
                    case 6:
                      fVar518 = **(float **)(&this->field_0x118 + (long)p_Var61);
                      fVar250 = (*(float **)(&this->field_0x118 + (long)p_Var61))[1];
                      fVar251 = -fVar250 / fVar518;
                      fVar89 = 0.0;
                      if ((fVar251 <= fVar88) &&
                         (fVar89 = fVar88, fVar88 <= fVar251 + 1.0 / fVar518)) {
                        auVar252 = vfmadd213ss_fma(ZEXT416((uint)fVar518),auVar252,
                                                   ZEXT416((uint)fVar250));
                        fVar89 = auVar252._0_4_ * fVar88;
                      }
                    }
                    *(float *)((long)&local_270->_vptr_Allocator + uVar67 * 4) = fVar89;
                    uVar67 = uVar67 + 1;
                    local_220 = (ulong)((int)local_220 + 1);
                  } while (uVar67 != uVar64);
                }
                local_270 = (Allocator *)((long)&local_270->_vptr_Allocator + lVar82 * 4);
                iVar65 = iVar65 + 1;
              } while (iVar65 != iVar15);
              p_Var61 = pp_Var18[-3];
            }
            local_238 = local_238 + 1;
          } while (local_238 < *(int *)(&this->field_0xd0 + (long)p_Var61));
        }
      }
    }
  }
LAB_002851c2:
  pMVar49 = local_130;
  Deconvolution::cut_padding
            ((Deconvolution *)
             ((long)&this->_vptr_Deconvolution_x86_fma + (long)this->_vptr_Deconvolution_x86_fma[-3]
             ),&local_1a8,local_130,local_140);
  if ((pMVar49->data == (void *)0x0) || (iVar84 = 0, (long)pMVar49->c * pMVar49->cstep == 0)) {
    iVar84 = -100;
  }
LAB_0028520c:
  piVar19 = (int *)CONCAT44(local_1a8.refcount._4_4_,(int)local_1a8.refcount);
  if (piVar19 != (int *)0x0) {
    LOCK();
    *piVar19 = *piVar19 + -1;
    UNLOCK();
    if (*piVar19 == 0) {
      if (local_1a8.allocator == (Allocator *)0x0) {
        if ((Allocator *)local_1a8.data != (Allocator *)0x0) {
          free(local_1a8.data);
        }
      }
      else {
        (*(local_1a8.allocator)->_vptr_Allocator[3])();
      }
    }
  }
  return iVar84;
}

Assistant:

int Deconvolution_x86_fma::forward(const Mat& bottom_blob, Mat& top_blob, const Option& opt) const
{
    // deconvolv with NxN kernel
    // value = value + bias

    int w = bottom_blob.w;
    int h = bottom_blob.h;
    size_t elemsize = bottom_blob.elemsize;
    int elempack = bottom_blob.elempack;

    //     NCNN_LOGE("Deconvolution input %d x %d  pad = %d %d  ksize=%d %d  stride=%d %d", w, h, pad_w, pad_h, kernel_w, kernel_h, stride_w, stride_h);

    const int kernel_extent_w = dilation_w * (kernel_w - 1) + 1;
    const int kernel_extent_h = dilation_h * (kernel_h - 1) + 1;

    int outw = (w - 1) * stride_w + kernel_extent_w + output_pad_right;
    int outh = (h - 1) * stride_h + kernel_extent_h + output_pad_bottom;
    int out_elempack = 1;
#if __SSE2__
    if (opt.use_packing_layout)
    {
#if __AVX512F__
        out_elempack = num_output % 16 == 0 ? 16 : num_output % 8 == 0 ? 8 : num_output % 4 == 0 ? 4 : 1;
#elif __AVX__
        out_elempack = num_output % 8 == 0 ? 8 : num_output % 4 == 0 ? 4 : 1;
#else
        out_elempack = num_output % 4 == 0 ? 4 : 1;
#endif
    }
#endif // __SSE2__
    size_t out_elemsize = elemsize / elempack * out_elempack;

    int out_channels = num_output / out_elempack;

    Mat top_blob_bordered;
    if (pad_left > 0 || pad_right > 0 || pad_top > 0 || pad_bottom > 0 || (output_w > 0 && output_h > 0))
    {
        top_blob_bordered.create(outw, outh, out_channels, out_elemsize, out_elempack, opt.workspace_allocator);
    }
    else
    {
        top_blob_bordered = top_blob;
        top_blob_bordered.create(outw, outh, out_channels, out_elemsize, out_elempack, opt.blob_allocator);
    }
    if (top_blob_bordered.empty())
        return -100;

    const int maxk = kernel_w * kernel_h;

    if (opt.use_sgemm_convolution)
    {
        // sgemm
        Mat bottom_blob_2 = bottom_blob;
        {
            bottom_blob_2.w = bottom_blob.w * bottom_blob.h;
            bottom_blob_2.h = 1;
        }
        Mat top_col2im;
        Option opt_b = opt;
        opt_b.blob_allocator = top_blob_bordered.allocator;
        gemm->forward(bottom_blob_2, top_col2im, opt_b);

        {
            // col2im
            const int gap = (outw * stride_h - w * stride_w) * out_elempack;

#if __SSE2__
#if __AVX__
#if __AVX512F__
            if (out_elempack == 16)
            {
                #pragma omp parallel for num_threads(opt.num_threads)
                for (int p = 0; p < out_channels; p++)
                {
                    const float* sptr = top_col2im.row(p * maxk);
                    Mat outm = top_blob_bordered.channel(p);

                    if (bias_data.empty())
                    {
                        outm.fill(_mm512_setzero_ps());
                    }
                    else
                    {
                        outm.fill(_mm512_load_ps((const float*)bias_data + p * 16));
                    }

                    for (int u = 0; u < kernel_h; u++)
                    {
                        for (int v = 0; v < kernel_w; v++)
                        {
                            float* ptr = outm.row(dilation_h * u) + dilation_w * v * 16;

                            for (int i = 0; i < h; i++)
                            {
                                for (int j = 0; j < w; j++)
                                {
                                    __m512 _val = _mm512_load_ps(ptr);
                                    __m512 _s = _mm512_load_ps(sptr);
                                    _val = _mm512_add_ps(_val, _s);
                                    _mm512_store_ps(ptr, _val);

                                    ptr += stride_w * 16;
                                    sptr += 16;
                                }

                                ptr += gap;
                            }
                        }
                    }
                }
            }
#endif // __AVX512F__

            if (out_elempack == 8)
            {
                #pragma omp parallel for num_threads(opt.num_threads)
                for (int p = 0; p < out_channels; p++)
                {
                    const float* sptr = top_col2im.row(p * maxk);
                    Mat outm = top_blob_bordered.channel(p);

                    if (bias_data.empty())
                    {
                        outm.fill(_mm256_setzero_ps());
                    }
                    else
                    {
                        outm.fill(_mm256_load_ps((const float*)bias_data + p * 8));
                    }

                    for (int u = 0; u < kernel_h; u++)
                    {
                        for (int v = 0; v < kernel_w; v++)
                        {
                            float* ptr = outm.row(dilation_h * u) + dilation_w * v * 8;

                            for (int i = 0; i < h; i++)
                            {
                                for (int j = 0; j < w; j++)
                                {
                                    __m256 _val = _mm256_load_ps(ptr);
                                    __m256 _s = _mm256_load_ps(sptr);
                                    _val = _mm256_add_ps(_val, _s);
                                    _mm256_store_ps(ptr, _val);

                                    ptr += stride_w * 8;
                                    sptr += 8;
                                }

                                ptr += gap;
                            }
                        }
                    }
                }
            }
#endif // __AVX__

            if (out_elempack == 4)
            {
                #pragma omp parallel for num_threads(opt.num_threads)
                for (int p = 0; p < out_channels; p++)
                {
                    const float* sptr = top_col2im.row(p * maxk);
                    Mat outm = top_blob_bordered.channel(p);

                    if (bias_data.empty())
                    {
                        outm.fill(_mm_setzero_ps());
                    }
                    else
                    {
                        outm.fill(_mm_load_ps((const float*)bias_data + p * 4));
                    }

                    for (int u = 0; u < kernel_h; u++)
                    {
                        for (int v = 0; v < kernel_w; v++)
                        {
                            float* ptr = outm.row(dilation_h * u) + dilation_w * v * 4;

                            for (int i = 0; i < h; i++)
                            {
                                for (int j = 0; j < w; j++)
                                {
                                    __m128 _val = _mm_load_ps(ptr);
                                    __m128 _s = _mm_load_ps(sptr);
                                    _val = _mm_add_ps(_val, _s);
                                    _mm_store_ps(ptr, _val);

                                    ptr += stride_w * 4;
                                    sptr += 4;
                                }

                                ptr += gap;
                            }
                        }
                    }
                }
            }
#endif // __SSE2__

            if (out_elempack == 1)
            {
                #pragma omp parallel for num_threads(opt.num_threads)
                for (int p = 0; p < out_channels; p++)
                {
                    const float* sptr = top_col2im.row(p * maxk);
                    Mat outm = top_blob_bordered.channel(p);

                    const float bias = bias_data.empty() ? 0.f : bias_data[p];
                    outm.fill(bias);

                    for (int u = 0; u < kernel_h; u++)
                    {
                        for (int v = 0; v < kernel_w; v++)
                        {
                            float* ptr = outm.row(dilation_h * u) + dilation_w * v;

                            for (int i = 0; i < h; i++)
                            {
                                for (int j = 0; j < w; j++)
                                {
                                    ptr[0] += sptr[0];

                                    ptr += stride_w;
                                    sptr += 1;
                                }

                                ptr += gap;
                            }
                        }
                    }
                }
            }
        }

        if (activation)
        {
            activation->forward_inplace(top_blob_bordered, opt);
        }
    }
    else
    {
#if __SSE2__
#if __AVX__
#if __AVX512F__
        if (elempack == 16 && out_elempack == 16)
        {
            deconvolution_pack16_avx512(bottom_blob, top_blob_bordered, weight_data_tm, bias_data, kernel_w, kernel_h, dilation_w, dilation_h, stride_w, stride_h, activation_type, activation_params, opt);
        }

        if (elempack == 8 && out_elempack == 16)
        {
            deconvolution_pack8to16_avx512(bottom_blob, top_blob_bordered, weight_data_tm, bias_data, kernel_w, kernel_h, dilation_w, dilation_h, stride_w, stride_h, activation_type, activation_params, opt);
        }

        if (elempack == 16 && out_elempack == 8)
        {
            deconvolution_pack16to8_avx512(bottom_blob, top_blob_bordered, weight_data_tm, bias_data, kernel_w, kernel_h, dilation_w, dilation_h, stride_w, stride_h, activation_type, activation_params, opt);
        }

        if (elempack == 4 && out_elempack == 16)
        {
            deconvolution_pack4to16_avx512(bottom_blob, top_blob_bordered, weight_data_tm, bias_data, kernel_w, kernel_h, dilation_w, dilation_h, stride_w, stride_h, activation_type, activation_params, opt);
        }

        if (elempack == 16 && out_elempack == 4)
        {
            deconvolution_pack16to4_avx512(bottom_blob, top_blob_bordered, weight_data_tm, bias_data, kernel_w, kernel_h, dilation_w, dilation_h, stride_w, stride_h, activation_type, activation_params, opt);
        }

        if (elempack == 1 && out_elempack == 16)
        {
            deconvolution_pack1to16_avx512(bottom_blob, top_blob_bordered, weight_data_tm, bias_data, kernel_w, kernel_h, dilation_w, dilation_h, stride_w, stride_h, activation_type, activation_params, opt);
        }

        if (elempack == 16 && out_elempack == 1)
        {
            deconvolution_pack16to1_avx512(bottom_blob, top_blob_bordered, weight_data_tm, bias_data, kernel_w, kernel_h, dilation_w, dilation_h, stride_w, stride_h, activation_type, activation_params, opt);
        }
#endif // __AVX512F__

        if (elempack == 8 && out_elempack == 8)
        {
            deconvolution_pack8_avx(bottom_blob, top_blob_bordered, weight_data_tm, bias_data, kernel_w, kernel_h, dilation_w, dilation_h, stride_w, stride_h, activation_type, activation_params, opt);
        }

        if (elempack == 4 && out_elempack == 8)
        {
            deconvolution_pack4to8_avx(bottom_blob, top_blob_bordered, weight_data_tm, bias_data, kernel_w, kernel_h, dilation_w, dilation_h, stride_w, stride_h, activation_type, activation_params, opt);
        }

        if (elempack == 8 && out_elempack == 4)
        {
            deconvolution_pack8to4_avx(bottom_blob, top_blob_bordered, weight_data_tm, bias_data, kernel_w, kernel_h, dilation_w, dilation_h, stride_w, stride_h, activation_type, activation_params, opt);
        }

        if (elempack == 1 && out_elempack == 8)
        {
            deconvolution_pack1to8_avx(bottom_blob, top_blob_bordered, weight_data_tm, bias_data, kernel_w, kernel_h, dilation_w, dilation_h, stride_w, stride_h, activation_type, activation_params, opt);
        }

        if (elempack == 8 && out_elempack == 1)
        {
            deconvolution_pack8to1_avx(bottom_blob, top_blob_bordered, weight_data_tm, bias_data, kernel_w, kernel_h, dilation_w, dilation_h, stride_w, stride_h, activation_type, activation_params, opt);
        }
#endif // __AVX__

        if (elempack == 4 && out_elempack == 4)
        {
            deconvolution_pack4_sse(bottom_blob, top_blob_bordered, weight_data_tm, bias_data, kernel_w, kernel_h, dilation_w, dilation_h, stride_w, stride_h, activation_type, activation_params, opt);
        }

        if (elempack == 1 && out_elempack == 4)
        {
            deconvolution_pack1to4_sse(bottom_blob, top_blob_bordered, weight_data_tm, bias_data, kernel_w, kernel_h, dilation_w, dilation_h, stride_w, stride_h, activation_type, activation_params, opt);
        }

        if (elempack == 4 && out_elempack == 1)
        {
            deconvolution_pack4to1_sse(bottom_blob, top_blob_bordered, weight_data_tm, bias_data, kernel_w, kernel_h, dilation_w, dilation_h, stride_w, stride_h, activation_type, activation_params, opt);
        }
#endif // __SSE2__

        if (elempack == 1 && out_elempack == 1)
        {
            // num_output
            #pragma omp parallel for num_threads(opt.num_threads)
            for (int p = 0; p < num_output; p++)
            {
                float* outptr = top_blob_bordered.channel(p);

                // shadowed variable for less openmp task args
                const int w = bottom_blob.w;
                const int h = bottom_blob.h;
                const int channels = bottom_blob.c;
                const int outw = top_blob_bordered.w;
                const int outh = top_blob_bordered.h;

                for (int i = 0; i < outh; i++)
                {
                    for (int j = 0; j < outw; j++)
                    {
                        float sum = 0.f;

                        if (bias_term)
                        {
                            sum = bias_data[p];
                        }

                        const float* kptr = (const float*)weight_data_tm.channel(p);

                        // channels
                        for (int q = 0; q < channels; q++)
                        {
                            const Mat m = bottom_blob.channel(q);

                            for (int y = 0; y < kernel_h; y++)
                            {
                                int sys = (i + y * dilation_h - (kernel_extent_h - 1));
                                if (sys < 0 || sys % stride_h != 0)
                                    continue;

                                int sy = sys / stride_h;
                                if (sy >= h)
                                    continue;

                                const float* sptr = m.row(sy);

                                for (int x = 0; x < kernel_w; x++)
                                {
                                    int sxs = (j + x * dilation_w - (kernel_extent_w - 1));
                                    if (sxs < 0 || sxs % stride_w != 0)
                                        continue;

                                    int sx = sxs / stride_w;
                                    if (sx >= w)
                                        continue;

                                    float val = sptr[sx];

                                    int k = y * kernel_w + x;

                                    float w = kptr[k];

                                    sum += val * w;
                                }
                            }

                            kptr += maxk;
                        }

                        sum = activation_ss(sum, activation_type, activation_params);

                        outptr[j] = sum;
                    }

                    outptr += outw;
                }
            }
        }
    }

    cut_padding(top_blob_bordered, top_blob, opt);
    if (top_blob.empty())
        return -100;

    return 0;
}